

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [28];
  undefined1 auVar122 [12];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  uint uVar125;
  int iVar126;
  RTCIntersectArguments *pRVar127;
  ulong uVar128;
  uint uVar129;
  long lVar130;
  bool bVar131;
  long lVar132;
  ulong uVar133;
  long lVar134;
  float fVar135;
  float fVar149;
  float fVar151;
  vint4 bi_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar141 [32];
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar158;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar176;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar177;
  float fVar188;
  float fVar190;
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [32];
  float fVar194;
  float fVar195;
  float fVar209;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar197 [16];
  float fVar214;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar196;
  float fVar210;
  float fVar216;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar217;
  float fVar219;
  float fVar221;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar218;
  float fVar220;
  float fVar222;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar223;
  float fVar224;
  float fVar234;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar225 [16];
  float fVar238;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar240;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar241;
  float fVar251;
  float fVar253;
  undefined1 auVar243 [16];
  float fVar242;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar258;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar259;
  float fVar260;
  float fVar269;
  float fVar271;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar273;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar270;
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar279;
  undefined1 auVar268 [32];
  vint4 ai;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined4 uVar289;
  float fVar294;
  float fVar295;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar293 [32];
  float fVar305;
  float fVar306;
  undefined1 auVar300 [16];
  float fVar307;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar308;
  float fVar309;
  float fVar315;
  float fVar317;
  undefined1 auVar310 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar325 [16];
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [32];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar339;
  float fVar343;
  float fVar344;
  undefined1 auVar340 [16];
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar348;
  float fVar349;
  float fVar353;
  float fVar355;
  float fVar357;
  undefined1 auVar350 [32];
  float fVar352;
  float fVar354;
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar351 [64];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_86d;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  ulong local_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  undefined1 auStack_7d8 [8];
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined8 *local_6a0;
  Precalculations *local_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  LinearSpace3fa *local_550;
  Primitive *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  RTCHitN local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar166 [24];
  
  PVar12 = prim[1];
  uVar128 = (ulong)(byte)PVar12;
  lVar19 = uVar128 * 0x25;
  auVar181 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar181 = vinsertps_avx(auVar181,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar200 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar200 = vinsertps_avx(auVar200,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar324 = *(float *)(prim + lVar19 + 0x12);
  auVar181 = vsubps_avx(auVar181,*(undefined1 (*) [16])(prim + lVar19 + 6));
  auVar159._0_4_ = fVar324 * auVar181._0_4_;
  auVar159._4_4_ = fVar324 * auVar181._4_4_;
  auVar159._8_4_ = fVar324 * auVar181._8_4_;
  auVar159._12_4_ = fVar324 * auVar181._12_4_;
  auVar280._0_4_ = fVar324 * auVar200._0_4_;
  auVar280._4_4_ = fVar324 * auVar200._4_4_;
  auVar280._8_4_ = fVar324 * auVar200._8_4_;
  auVar280._12_4_ = fVar324 * auVar200._12_4_;
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xf + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar128 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vshufps_avx(auVar280,auVar280,0);
  auVar27 = vshufps_avx(auVar280,auVar280,0x55);
  auVar28 = vshufps_avx(auVar280,auVar280,0xaa);
  fVar324 = auVar28._0_4_;
  fVar210 = auVar28._4_4_;
  fVar328 = auVar28._8_4_;
  fVar216 = auVar28._12_4_;
  fVar223 = auVar27._0_4_;
  fVar234 = auVar27._4_4_;
  fVar236 = auVar27._8_4_;
  fVar238 = auVar27._12_4_;
  fVar195 = auVar26._0_4_;
  fVar209 = auVar26._4_4_;
  fVar211 = auVar26._8_4_;
  fVar214 = auVar26._12_4_;
  auVar333._0_4_ = fVar195 * auVar181._0_4_ + fVar223 * auVar200._0_4_ + fVar324 * auVar201._0_4_;
  auVar333._4_4_ = fVar209 * auVar181._4_4_ + fVar234 * auVar200._4_4_ + fVar210 * auVar201._4_4_;
  auVar333._8_4_ = fVar211 * auVar181._8_4_ + fVar236 * auVar200._8_4_ + fVar328 * auVar201._8_4_;
  auVar333._12_4_ =
       fVar214 * auVar181._12_4_ + fVar238 * auVar200._12_4_ + fVar216 * auVar201._12_4_;
  auVar340._0_4_ = fVar195 * auVar202._0_4_ + fVar223 * auVar21._0_4_ + auVar22._0_4_ * fVar324;
  auVar340._4_4_ = fVar209 * auVar202._4_4_ + fVar234 * auVar21._4_4_ + auVar22._4_4_ * fVar210;
  auVar340._8_4_ = fVar211 * auVar202._8_4_ + fVar236 * auVar21._8_4_ + auVar22._8_4_ * fVar328;
  auVar340._12_4_ = fVar214 * auVar202._12_4_ + fVar238 * auVar21._12_4_ + auVar22._12_4_ * fVar216;
  auVar281._0_4_ = fVar195 * auVar23._0_4_ + fVar223 * auVar24._0_4_ + auVar25._0_4_ * fVar324;
  auVar281._4_4_ = fVar209 * auVar23._4_4_ + fVar234 * auVar24._4_4_ + auVar25._4_4_ * fVar210;
  auVar281._8_4_ = fVar211 * auVar23._8_4_ + fVar236 * auVar24._8_4_ + auVar25._8_4_ * fVar328;
  auVar281._12_4_ = fVar214 * auVar23._12_4_ + fVar238 * auVar24._12_4_ + auVar25._12_4_ * fVar216;
  auVar26 = vshufps_avx(auVar159,auVar159,0);
  auVar27 = vshufps_avx(auVar159,auVar159,0x55);
  auVar28 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar324 = auVar28._0_4_;
  fVar210 = auVar28._4_4_;
  fVar328 = auVar28._8_4_;
  fVar216 = auVar28._12_4_;
  fVar223 = auVar27._0_4_;
  fVar234 = auVar27._4_4_;
  fVar236 = auVar27._8_4_;
  fVar238 = auVar27._12_4_;
  fVar195 = auVar26._0_4_;
  fVar209 = auVar26._4_4_;
  fVar211 = auVar26._8_4_;
  fVar214 = auVar26._12_4_;
  auVar178._0_4_ = fVar195 * auVar181._0_4_ + fVar223 * auVar200._0_4_ + fVar324 * auVar201._0_4_;
  auVar178._4_4_ = fVar209 * auVar181._4_4_ + fVar234 * auVar200._4_4_ + fVar210 * auVar201._4_4_;
  auVar178._8_4_ = fVar211 * auVar181._8_4_ + fVar236 * auVar200._8_4_ + fVar328 * auVar201._8_4_;
  auVar178._12_4_ =
       fVar214 * auVar181._12_4_ + fVar238 * auVar200._12_4_ + fVar216 * auVar201._12_4_;
  auVar160._0_4_ = fVar195 * auVar202._0_4_ + auVar22._0_4_ * fVar324 + fVar223 * auVar21._0_4_;
  auVar160._4_4_ = fVar209 * auVar202._4_4_ + auVar22._4_4_ * fVar210 + fVar234 * auVar21._4_4_;
  auVar160._8_4_ = fVar211 * auVar202._8_4_ + auVar22._8_4_ * fVar328 + fVar236 * auVar21._8_4_;
  auVar160._12_4_ = fVar214 * auVar202._12_4_ + auVar22._12_4_ * fVar216 + fVar238 * auVar21._12_4_;
  auVar136._0_4_ = fVar195 * auVar23._0_4_ + fVar223 * auVar24._0_4_ + auVar25._0_4_ * fVar324;
  auVar136._4_4_ = fVar209 * auVar23._4_4_ + fVar234 * auVar24._4_4_ + auVar25._4_4_ * fVar210;
  auVar136._8_4_ = fVar211 * auVar23._8_4_ + fVar236 * auVar24._8_4_ + auVar25._8_4_ * fVar328;
  auVar136._12_4_ = fVar214 * auVar23._12_4_ + fVar238 * auVar24._12_4_ + auVar25._12_4_ * fVar216;
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar181 = vandps_avx(auVar333,auVar261);
  auVar225._8_4_ = 0x219392ef;
  auVar225._0_8_ = 0x219392ef219392ef;
  auVar225._12_4_ = 0x219392ef;
  auVar181 = vcmpps_avx(auVar181,auVar225,1);
  auVar200 = vblendvps_avx(auVar333,auVar225,auVar181);
  auVar181 = vandps_avx(auVar340,auVar261);
  auVar181 = vcmpps_avx(auVar181,auVar225,1);
  auVar201 = vblendvps_avx(auVar340,auVar225,auVar181);
  auVar181 = vandps_avx(auVar281,auVar261);
  auVar181 = vcmpps_avx(auVar181,auVar225,1);
  auVar181 = vblendvps_avx(auVar281,auVar225,auVar181);
  auVar202 = vrcpps_avx(auVar200);
  fVar195 = auVar202._0_4_;
  auVar197._0_4_ = fVar195 * auVar200._0_4_;
  fVar209 = auVar202._4_4_;
  auVar197._4_4_ = fVar209 * auVar200._4_4_;
  fVar211 = auVar202._8_4_;
  auVar197._8_4_ = fVar211 * auVar200._8_4_;
  fVar214 = auVar202._12_4_;
  auVar197._12_4_ = fVar214 * auVar200._12_4_;
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = &DAT_3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar200 = vsubps_avx(auVar282,auVar197);
  fVar195 = fVar195 + fVar195 * auVar200._0_4_;
  fVar209 = fVar209 + fVar209 * auVar200._4_4_;
  fVar211 = fVar211 + fVar211 * auVar200._8_4_;
  fVar214 = fVar214 + fVar214 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar201);
  fVar223 = auVar200._0_4_;
  auVar243._0_4_ = fVar223 * auVar201._0_4_;
  fVar234 = auVar200._4_4_;
  auVar243._4_4_ = fVar234 * auVar201._4_4_;
  fVar236 = auVar200._8_4_;
  auVar243._8_4_ = fVar236 * auVar201._8_4_;
  fVar238 = auVar200._12_4_;
  auVar243._12_4_ = fVar238 * auVar201._12_4_;
  auVar200 = vsubps_avx(auVar282,auVar243);
  fVar223 = fVar223 + fVar223 * auVar200._0_4_;
  fVar234 = fVar234 + fVar234 * auVar200._4_4_;
  fVar236 = fVar236 + fVar236 * auVar200._8_4_;
  fVar238 = fVar238 + fVar238 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar181);
  fVar241 = auVar200._0_4_;
  auVar262._0_4_ = fVar241 * auVar181._0_4_;
  fVar251 = auVar200._4_4_;
  auVar262._4_4_ = fVar251 * auVar181._4_4_;
  fVar253 = auVar200._8_4_;
  auVar262._8_4_ = fVar253 * auVar181._8_4_;
  fVar255 = auVar200._12_4_;
  auVar262._12_4_ = fVar255 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar282,auVar262);
  fVar241 = fVar241 + fVar241 * auVar181._0_4_;
  fVar251 = fVar251 + fVar251 * auVar181._4_4_;
  fVar253 = fVar253 + fVar253 * auVar181._8_4_;
  fVar255 = fVar255 + fVar255 * auVar181._12_4_;
  auVar181 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar19 + 0x16)) *
                           *(float *)(prim + lVar19 + 0x1a)));
  auVar201 = vshufps_avx(auVar181,auVar181,0);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar181 = vpmovsxwd_avx(auVar181);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar128 * 0xb + 6);
  auVar200 = vpmovsxwd_avx(auVar200);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar181);
  fVar324 = auVar201._0_4_;
  fVar210 = auVar201._4_4_;
  fVar328 = auVar201._8_4_;
  fVar216 = auVar201._12_4_;
  auVar283._0_4_ = auVar200._0_4_ * fVar324 + auVar181._0_4_;
  auVar283._4_4_ = auVar200._4_4_ * fVar210 + auVar181._4_4_;
  auVar283._8_4_ = auVar200._8_4_ * fVar328 + auVar181._8_4_;
  auVar283._12_4_ = auVar200._12_4_ * fVar216 + auVar181._12_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar181 = vpmovsxwd_avx(auVar201);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar128 * 0xd + 6);
  auVar200 = vpmovsxwd_avx(auVar202);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar181);
  auVar290._0_4_ = auVar200._0_4_ * fVar324 + auVar181._0_4_;
  auVar290._4_4_ = auVar200._4_4_ * fVar210 + auVar181._4_4_;
  auVar290._8_4_ = auVar200._8_4_ * fVar328 + auVar181._8_4_;
  auVar290._12_4_ = auVar200._12_4_ * fVar216 + auVar181._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar128 * 0x12 + 6);
  auVar181 = vpmovsxwd_avx(auVar21);
  auVar181 = vcvtdq2ps_avx(auVar181);
  uVar133 = (ulong)(uint)((int)(uVar128 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar128 * 2 + uVar133 + 6);
  auVar200 = vpmovsxwd_avx(auVar22);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar181);
  auVar300._0_4_ = auVar200._0_4_ * fVar324 + auVar181._0_4_;
  auVar300._4_4_ = auVar200._4_4_ * fVar210 + auVar181._4_4_;
  auVar300._8_4_ = auVar200._8_4_ * fVar328 + auVar181._8_4_;
  auVar300._12_4_ = auVar200._12_4_ * fVar216 + auVar181._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar133 + 6);
  auVar181 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar128 * 0x18 + 6);
  auVar200 = vpmovsxwd_avx(auVar24);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar181);
  auVar310._0_4_ = auVar200._0_4_ * fVar324 + auVar181._0_4_;
  auVar310._4_4_ = auVar200._4_4_ * fVar210 + auVar181._4_4_;
  auVar310._8_4_ = auVar200._8_4_ * fVar328 + auVar181._8_4_;
  auVar310._12_4_ = auVar200._12_4_ * fVar216 + auVar181._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar128 * 0x1d + 6);
  auVar181 = vpmovsxwd_avx(auVar25);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar128 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar200 = vpmovsxwd_avx(auVar26);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar201 = vsubps_avx(auVar200,auVar181);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar128) + 6);
  auVar200 = vpmovsxwd_avx(auVar27);
  auVar325._0_4_ = auVar201._0_4_ * fVar324 + auVar181._0_4_;
  auVar325._4_4_ = auVar201._4_4_ * fVar210 + auVar181._4_4_;
  auVar325._8_4_ = auVar201._8_4_ * fVar328 + auVar181._8_4_;
  auVar325._12_4_ = auVar201._12_4_ * fVar216 + auVar181._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar128 * 0x23 + 6);
  auVar201 = vpmovsxwd_avx(auVar28);
  auVar181 = vcvtdq2ps_avx(auVar200);
  auVar200 = vcvtdq2ps_avx(auVar201);
  auVar200 = vsubps_avx(auVar200,auVar181);
  auVar263._0_4_ = auVar181._0_4_ + auVar200._0_4_ * fVar324;
  auVar263._4_4_ = auVar181._4_4_ + auVar200._4_4_ * fVar210;
  auVar263._8_4_ = auVar181._8_4_ + auVar200._8_4_ * fVar328;
  auVar263._12_4_ = auVar181._12_4_ + auVar200._12_4_ * fVar216;
  auVar181 = vsubps_avx(auVar283,auVar178);
  auVar284._0_4_ = fVar195 * auVar181._0_4_;
  auVar284._4_4_ = fVar209 * auVar181._4_4_;
  auVar284._8_4_ = fVar211 * auVar181._8_4_;
  auVar284._12_4_ = fVar214 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar290,auVar178);
  auVar179._0_4_ = fVar195 * auVar181._0_4_;
  auVar179._4_4_ = fVar209 * auVar181._4_4_;
  auVar179._8_4_ = fVar211 * auVar181._8_4_;
  auVar179._12_4_ = fVar214 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar300,auVar160);
  auVar198._0_4_ = fVar223 * auVar181._0_4_;
  auVar198._4_4_ = fVar234 * auVar181._4_4_;
  auVar198._8_4_ = fVar236 * auVar181._8_4_;
  auVar198._12_4_ = fVar238 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar310,auVar160);
  auVar161._0_4_ = fVar223 * auVar181._0_4_;
  auVar161._4_4_ = fVar234 * auVar181._4_4_;
  auVar161._8_4_ = fVar236 * auVar181._8_4_;
  auVar161._12_4_ = fVar238 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar325,auVar136);
  auVar226._0_4_ = fVar241 * auVar181._0_4_;
  auVar226._4_4_ = fVar251 * auVar181._4_4_;
  auVar226._8_4_ = fVar253 * auVar181._8_4_;
  auVar226._12_4_ = fVar255 * auVar181._12_4_;
  auVar181 = vsubps_avx(auVar263,auVar136);
  auVar137._0_4_ = fVar241 * auVar181._0_4_;
  auVar137._4_4_ = fVar251 * auVar181._4_4_;
  auVar137._8_4_ = fVar253 * auVar181._8_4_;
  auVar137._12_4_ = fVar255 * auVar181._12_4_;
  auVar181 = vpminsd_avx(auVar284,auVar179);
  auVar200 = vpminsd_avx(auVar198,auVar161);
  auVar181 = vmaxps_avx(auVar181,auVar200);
  auVar200 = vpminsd_avx(auVar226,auVar137);
  uVar289 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._4_4_ = uVar289;
  auVar291._0_4_ = uVar289;
  auVar291._8_4_ = uVar289;
  auVar291._12_4_ = uVar289;
  auVar200 = vmaxps_avx(auVar200,auVar291);
  auVar181 = vmaxps_avx(auVar181,auVar200);
  local_2b0._0_4_ = auVar181._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar181._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar181._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar181._12_4_ * 0.99999964;
  auVar181 = vpmaxsd_avx(auVar284,auVar179);
  auVar200 = vpmaxsd_avx(auVar198,auVar161);
  auVar181 = vminps_avx(auVar181,auVar200);
  auVar200 = vpmaxsd_avx(auVar226,auVar137);
  uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar180._4_4_ = uVar289;
  auVar180._0_4_ = uVar289;
  auVar180._8_4_ = uVar289;
  auVar180._12_4_ = uVar289;
  auVar200 = vminps_avx(auVar200,auVar180);
  auVar181 = vminps_avx(auVar181,auVar200);
  auVar138._0_4_ = auVar181._0_4_ * 1.0000004;
  auVar138._4_4_ = auVar181._4_4_ * 1.0000004;
  auVar138._8_4_ = auVar181._8_4_ * 1.0000004;
  auVar138._12_4_ = auVar181._12_4_ * 1.0000004;
  auVar181 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar200 = vpcmpgtd_avx(auVar181,_DAT_01ff0cf0);
  auVar181 = vcmpps_avx(local_2b0,auVar138,2);
  auVar181 = vandps_avx(auVar181,auVar200);
  uVar125 = vmovmskps_avx(auVar181);
  local_86d = uVar125 != 0;
  if (local_86d) {
    uVar125 = uVar125 & 0xff;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_550 = pre->ray_space + k;
    local_6a0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_698 = pre;
    local_548 = prim;
    do {
      lVar19 = 0;
      if (uVar125 != 0) {
        for (; (uVar125 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      uVar129 = *(uint *)(local_548 + 2);
      local_828 = (ulong)uVar129;
      uVar13 = *(uint *)(local_548 + lVar19 * 4 + 6);
      pGVar15 = (context->scene->geometries).items[local_828].ptr;
      local_5d0._0_8_ = CONCAT44(0,uVar13);
      uVar128 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                CONCAT44(0,uVar13) *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar324 = (pGVar15->time_range).lower;
      fVar324 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar324) /
                ((pGVar15->time_range).upper - fVar324));
      auVar181 = vroundss_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),9);
      auVar181 = vminss_avx(auVar181,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar181 = vmaxss_avx(ZEXT816(0) << 0x20,auVar181);
      fVar324 = fVar324 - auVar181._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar130 = (long)(int)auVar181._0_4_ * 0x38;
      lVar19 = *(long *)(_Var16 + 0x10 + lVar130);
      lVar134 = *(long *)(_Var16 + 0x38 + lVar130);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar130);
      auVar181 = vshufps_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),0);
      pfVar1 = (float *)(lVar134 + uVar128 * lVar17);
      fVar210 = auVar181._0_4_;
      fVar328 = auVar181._4_4_;
      fVar216 = auVar181._8_4_;
      fVar195 = auVar181._12_4_;
      pfVar2 = (float *)(lVar134 + (uVar128 + 1) * lVar17);
      lVar132 = (uVar128 + 2) * lVar17;
      pfVar3 = (float *)(lVar134 + lVar132);
      pfVar4 = (float *)(lVar134 + lVar17 * (uVar128 + 3));
      lVar134 = *(long *)(_Var16 + lVar130);
      auVar181 = vshufps_avx(ZEXT416((uint)(1.0 - fVar324)),ZEXT416((uint)(1.0 - fVar324)),0);
      pfVar5 = (float *)(lVar134 + lVar19 * uVar128);
      fVar324 = auVar181._0_4_;
      fVar209 = auVar181._4_4_;
      fVar211 = auVar181._8_4_;
      fVar214 = auVar181._12_4_;
      pfVar6 = (float *)(lVar134 + lVar19 * (uVar128 + 1));
      pfVar7 = (float *)(lVar134 + lVar19 * (uVar128 + 2));
      pfVar8 = (float *)(lVar134 + lVar19 * (uVar128 + 3));
      uVar14 = (uint)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar19 = (long)(int)uVar14 * 0x44;
      local_6b0 = (undefined1  [8])
                  CONCAT44(fVar328 * pfVar1[1] + fVar209 * pfVar5[1],
                           fVar210 * *pfVar1 + fVar324 * *pfVar5);
      uStack_6a8._0_4_ = fVar216 * pfVar1[2] + fVar211 * pfVar5[2];
      uStack_6a8._4_4_ = fVar195 * pfVar1[3] + fVar214 * pfVar5[3];
      local_4b0._0_8_ =
           CONCAT44(fVar209 * pfVar6[1] + fVar328 * pfVar2[1],fVar324 * *pfVar6 + fVar210 * *pfVar2)
      ;
      local_4b0._8_4_ = fVar211 * pfVar6[2] + fVar216 * pfVar2[2];
      local_4b0._12_4_ = fVar214 * pfVar6[3] + fVar195 * pfVar2[3];
      local_820 = fVar324 * *pfVar7 + fVar210 * *pfVar3;
      fStack_81c = fVar209 * pfVar7[1] + fVar328 * pfVar3[1];
      auVar361._0_8_ = CONCAT44(fStack_81c,local_820);
      auVar361._8_4_ = fVar211 * pfVar7[2] + fVar216 * pfVar3[2];
      auVar361._12_4_ = fVar214 * pfVar7[3] + fVar195 * pfVar3[3];
      local_4d0._0_8_ =
           CONCAT44(fVar209 * pfVar8[1] + fVar328 * pfVar4[1],fVar324 * *pfVar8 + fVar210 * *pfVar4)
      ;
      local_4d0._8_4_ = fVar211 * pfVar8[2] + fVar216 * pfVar4[2];
      local_4d0._12_4_ = fVar214 * pfVar8[3] + fVar195 * pfVar4[3];
      auVar181 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar202 = vinsertps_avx(auVar181,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar201 = vsubps_avx(_local_6b0,auVar202);
      auVar181 = vshufps_avx(auVar201,auVar201,0);
      auVar200 = vshufps_avx(auVar201,auVar201,0x55);
      auVar201 = vshufps_avx(auVar201,auVar201,0xaa);
      fVar324 = (local_550->vx).field_0.m128[0];
      fVar210 = (local_550->vx).field_0.m128[1];
      fVar328 = (local_550->vx).field_0.m128[2];
      fVar216 = (local_550->vx).field_0.m128[3];
      fVar195 = (local_550->vy).field_0.m128[0];
      fVar209 = (local_550->vy).field_0.m128[1];
      fVar211 = (local_550->vy).field_0.m128[2];
      fVar214 = (local_550->vy).field_0.m128[3];
      fVar223 = (local_550->vz).field_0.m128[0];
      fVar234 = (local_550->vz).field_0.m128[1];
      fVar236 = (local_550->vz).field_0.m128[2];
      fVar238 = (local_550->vz).field_0.m128[3];
      auVar199._0_4_ =
           auVar181._0_4_ * fVar324 + auVar200._0_4_ * fVar195 + fVar223 * auVar201._0_4_;
      auVar199._4_4_ =
           auVar181._4_4_ * fVar210 + auVar200._4_4_ * fVar209 + fVar234 * auVar201._4_4_;
      auVar199._8_4_ =
           auVar181._8_4_ * fVar328 + auVar200._8_4_ * fVar211 + fVar236 * auVar201._8_4_;
      auVar199._12_4_ =
           auVar181._12_4_ * fVar216 + auVar200._12_4_ * fVar214 + fVar238 * auVar201._12_4_;
      auVar181 = vblendps_avx(auVar199,_local_6b0,8);
      auVar21 = vsubps_avx(local_4b0,auVar202);
      auVar200 = vshufps_avx(auVar21,auVar21,0);
      auVar201 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar285._0_4_ = auVar200._0_4_ * fVar324 + auVar201._0_4_ * fVar195 + fVar223 * auVar21._0_4_
      ;
      auVar285._4_4_ = auVar200._4_4_ * fVar210 + auVar201._4_4_ * fVar209 + fVar234 * auVar21._4_4_
      ;
      auVar285._8_4_ = auVar200._8_4_ * fVar328 + auVar201._8_4_ * fVar211 + fVar236 * auVar21._8_4_
      ;
      auVar285._12_4_ =
           auVar200._12_4_ * fVar216 + auVar201._12_4_ * fVar214 + fVar238 * auVar21._12_4_;
      auVar200 = vblendps_avx(auVar285,local_4b0,8);
      auVar22 = vsubps_avx(auVar361,auVar202);
      auVar201 = vshufps_avx(auVar22,auVar22,0);
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar292._0_4_ = auVar201._0_4_ * fVar324 + auVar21._0_4_ * fVar195 + auVar22._0_4_ * fVar223;
      auVar292._4_4_ = auVar201._4_4_ * fVar210 + auVar21._4_4_ * fVar209 + auVar22._4_4_ * fVar234;
      auVar292._8_4_ = auVar201._8_4_ * fVar328 + auVar21._8_4_ * fVar211 + auVar22._8_4_ * fVar236;
      auVar292._12_4_ =
           auVar201._12_4_ * fVar216 + auVar21._12_4_ * fVar214 + auVar22._12_4_ * fVar238;
      auVar201 = vblendps_avx(auVar292,auVar361,8);
      auVar22 = vsubps_avx(local_4d0,auVar202);
      auVar202 = vshufps_avx(auVar22,auVar22,0);
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar162._0_4_ = auVar202._0_4_ * fVar324 + auVar21._0_4_ * fVar195 + fVar223 * auVar22._0_4_;
      auVar162._4_4_ = auVar202._4_4_ * fVar210 + auVar21._4_4_ * fVar209 + fVar234 * auVar22._4_4_;
      auVar162._8_4_ = auVar202._8_4_ * fVar328 + auVar21._8_4_ * fVar211 + fVar236 * auVar22._8_4_;
      auVar162._12_4_ =
           auVar202._12_4_ * fVar216 + auVar21._12_4_ * fVar214 + fVar238 * auVar22._12_4_;
      auVar202 = vblendps_avx(auVar162,local_4d0,8);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar181 = vandps_avx(auVar181,auVar227);
      auVar200 = vandps_avx(auVar200,auVar227);
      auVar21 = vmaxps_avx(auVar181,auVar200);
      auVar181 = vandps_avx(auVar201,auVar227);
      auVar200 = vandps_avx(auVar202,auVar227);
      auVar181 = vmaxps_avx(auVar181,auVar200);
      auVar181 = vmaxps_avx(auVar21,auVar181);
      auVar200 = vmovshdup_avx(auVar181);
      auVar200 = vmaxss_avx(auVar200,auVar181);
      auVar181 = vshufpd_avx(auVar181,auVar181,1);
      auVar181 = vmaxss_avx(auVar181,auVar200);
      fVar214 = *(float *)(catmullrom_basis0 + lVar19 + 0x908);
      fVar223 = *(float *)(catmullrom_basis0 + lVar19 + 0x90c);
      fVar234 = *(float *)(catmullrom_basis0 + lVar19 + 0x910);
      fVar236 = *(float *)(catmullrom_basis0 + lVar19 + 0x914);
      fVar238 = *(float *)(catmullrom_basis0 + lVar19 + 0x918);
      fVar241 = *(float *)(catmullrom_basis0 + lVar19 + 0x91c);
      fVar251 = *(float *)(catmullrom_basis0 + lVar19 + 0x920);
      local_800._0_16_ = auVar292;
      auVar200 = vshufps_avx(auVar292,auVar292,0);
      register0x00001250 = auVar200;
      _local_600 = auVar200;
      auVar201 = vshufps_avx(auVar292,auVar292,0x55);
      register0x00001290 = auVar201;
      _local_620 = auVar201;
      fVar324 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0xd8c);
      fVar210 = *(float *)(catmullrom_basis0 + lVar19 + 0xd90);
      fVar328 = *(float *)(catmullrom_basis0 + lVar19 + 0xd94);
      fVar216 = *(float *)(catmullrom_basis0 + lVar19 + 0xd98);
      fVar195 = *(float *)(catmullrom_basis0 + lVar19 + 0xd9c);
      fVar209 = *(float *)(catmullrom_basis0 + lVar19 + 0xda0);
      fVar211 = *(float *)(catmullrom_basis0 + lVar19 + 0xda4);
      auVar121 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar19 + 0xd8c);
      auVar202 = vshufps_avx(auVar162,auVar162,0);
      register0x00001210 = auVar202;
      _local_520 = auVar202;
      fVar258 = auVar202._0_4_;
      fVar149 = auVar202._4_4_;
      fVar151 = auVar202._8_4_;
      fVar153 = auVar202._12_4_;
      fVar274 = auVar200._0_4_;
      fVar276 = auVar200._4_4_;
      fVar277 = auVar200._8_4_;
      fVar278 = auVar200._12_4_;
      auVar200 = vshufps_avx(auVar162,auVar162,0x55);
      register0x000014d0 = auVar200;
      _local_700 = auVar200;
      fVar323 = auVar200._0_4_;
      fVar327 = auVar200._4_4_;
      fVar329 = auVar200._8_4_;
      fVar330 = auVar200._12_4_;
      fVar279 = auVar201._0_4_;
      fVar188 = auVar201._4_4_;
      fVar190 = auVar201._8_4_;
      fVar192 = auVar201._12_4_;
      auVar200 = vshufps_avx(auVar361,auVar361,0xff);
      register0x00001450 = auVar200;
      _local_80 = auVar200;
      auVar201 = vshufps_avx(local_4d0,local_4d0,0xff);
      register0x00001390 = auVar201;
      _local_120 = auVar201;
      fVar259 = auVar201._0_4_;
      fVar269 = auVar201._4_4_;
      fVar271 = auVar201._8_4_;
      fVar273 = auVar201._12_4_;
      fVar174 = auVar200._0_4_;
      fVar305 = auVar200._4_4_;
      fVar306 = auVar200._8_4_;
      auVar201 = vshufps_avx(auVar285,auVar285,0);
      register0x00001310 = auVar201;
      _local_660 = auVar201;
      fVar253 = *(float *)(catmullrom_basis0 + lVar19 + 0x484);
      fVar255 = *(float *)(catmullrom_basis0 + lVar19 + 0x488);
      fVar346 = *(float *)(catmullrom_basis0 + lVar19 + 0x48c);
      fVar331 = *(float *)(catmullrom_basis0 + lVar19 + 0x490);
      fVar213 = *(float *)(catmullrom_basis0 + lVar19 + 0x494);
      fVar332 = *(float *)(catmullrom_basis0 + lVar19 + 0x498);
      fVar347 = *(float *)(catmullrom_basis0 + lVar19 + 0x49c);
      fVar224 = auVar201._0_4_;
      fVar235 = auVar201._4_4_;
      fVar237 = auVar201._8_4_;
      fVar239 = auVar201._12_4_;
      auVar201 = vshufps_avx(auVar285,auVar285,0x55);
      register0x000015d0 = auVar201;
      _local_6e0 = auVar201;
      fVar176 = auVar201._0_4_;
      fVar260 = auVar201._4_4_;
      fVar270 = auVar201._8_4_;
      fVar272 = auVar201._12_4_;
      auVar201 = vshufps_avx(local_4b0,local_4b0,0xff);
      register0x00001590 = auVar201;
      _local_140 = auVar201;
      fVar348 = auVar201._0_4_;
      fVar352 = auVar201._4_4_;
      fVar354 = auVar201._8_4_;
      fVar356 = auVar201._12_4_;
      auVar201 = vshufps_avx(auVar199,auVar199,0);
      register0x00001350 = auVar201;
      _local_440 = auVar201;
      pauVar9 = (undefined1 (*) [16])(catmullrom_basis0 + lVar19);
      fVar275 = *(float *)*pauVar9;
      fVar215 = *(float *)(catmullrom_basis0 + lVar19 + 4);
      fVar320 = *(float *)(catmullrom_basis0 + lVar19 + 8);
      auVar122 = *(undefined1 (*) [12])*pauVar9;
      fVar294 = *(float *)(catmullrom_basis0 + lVar19 + 0xc);
      fStack_2f0 = *(float *)(catmullrom_basis0 + lVar19 + 0x10);
      fStack_2ec = *(float *)(catmullrom_basis0 + lVar19 + 0x14);
      fStack_2e8 = *(float *)(catmullrom_basis0 + lVar19 + 0x18);
      uStack_2e4 = *(undefined4 *)(catmullrom_basis0 + lVar19 + 0x1c);
      fVar242 = auVar201._0_4_;
      fVar252 = auVar201._4_4_;
      fVar254 = auVar201._8_4_;
      fVar256 = auVar201._12_4_;
      auVar286._0_4_ = fVar242 * fVar275 + fVar224 * fVar253 + fVar274 * fVar214 + fVar258 * fVar324
      ;
      auVar286._4_4_ = fVar252 * fVar215 + fVar235 * fVar255 + fVar276 * fVar223 + fVar149 * fVar210
      ;
      auVar286._8_4_ = fVar254 * fVar320 + fVar237 * fVar346 + fVar277 * fVar234 + fVar151 * fVar328
      ;
      auVar286._12_4_ =
           fVar256 * fVar294 + fVar239 * fVar331 + fVar278 * fVar236 + fVar153 * fVar216;
      auVar286._16_4_ =
           fVar242 * fStack_2f0 + fVar224 * fVar213 + fVar274 * fVar238 + fVar258 * fVar195;
      auVar286._20_4_ =
           fVar252 * fStack_2ec + fVar235 * fVar332 + fVar276 * fVar241 + fVar149 * fVar209;
      auVar286._24_4_ =
           fVar254 * fStack_2e8 + fVar237 * fVar347 + fVar277 * fVar251 + fVar151 * fVar211;
      auVar286._28_4_ = fVar256 + fVar278 + fVar153 + 0.0;
      auVar201 = vshufps_avx(auVar199,auVar199,0x55);
      register0x00001290 = auVar201;
      _local_100 = auVar201;
      fVar177 = auVar201._0_4_;
      fVar189 = auVar201._4_4_;
      fVar191 = auVar201._8_4_;
      fVar193 = auVar201._12_4_;
      auVar334._0_4_ = fVar177 * fVar275 + fVar176 * fVar253 + fVar279 * fVar214 + fVar323 * fVar324
      ;
      auVar334._4_4_ = fVar189 * fVar215 + fVar260 * fVar255 + fVar188 * fVar223 + fVar327 * fVar210
      ;
      auVar334._8_4_ = fVar191 * fVar320 + fVar270 * fVar346 + fVar190 * fVar234 + fVar329 * fVar328
      ;
      auVar334._12_4_ =
           fVar193 * fVar294 + fVar272 * fVar331 + fVar192 * fVar236 + fVar330 * fVar216;
      auVar334._16_4_ =
           fVar177 * fStack_2f0 + fVar176 * fVar213 + fVar279 * fVar238 + fVar323 * fVar195;
      auVar334._20_4_ =
           fVar189 * fStack_2ec + fVar260 * fVar332 + fVar188 * fVar241 + fVar327 * fVar209;
      auVar334._24_4_ =
           fVar191 * fStack_2e8 + fVar270 * fVar347 + fVar190 * fVar251 + fVar329 * fVar211;
      auVar334._28_4_ = fVar192 + 0.0 + 0.0 + 0.0;
      auVar201 = vpermilps_avx(_local_6b0,0xff);
      register0x00001490 = auVar201;
      _local_a0 = auVar201;
      fVar308 = auVar201._0_4_;
      fVar315 = auVar201._4_4_;
      fVar317 = auVar201._8_4_;
      auVar141._0_4_ = fVar348 * fVar253 + fVar174 * fVar214 + fVar259 * fVar324 + fVar308 * fVar275
      ;
      auVar141._4_4_ = fVar352 * fVar255 + fVar305 * fVar223 + fVar269 * fVar210 + fVar315 * fVar215
      ;
      auVar141._8_4_ = fVar354 * fVar346 + fVar306 * fVar234 + fVar271 * fVar328 + fVar317 * fVar320
      ;
      auVar141._12_4_ =
           fVar356 * fVar331 + auVar200._12_4_ * fVar236 + fVar273 * fVar216 +
           auVar201._12_4_ * fVar294;
      auVar141._16_4_ =
           fVar348 * fVar213 + fVar174 * fVar238 + fVar259 * fVar195 + fVar308 * fStack_2f0;
      auVar141._20_4_ =
           fVar352 * fVar332 + fVar305 * fVar241 + fVar269 * fVar209 + fVar315 * fStack_2ec;
      auVar141._24_4_ =
           fVar354 * fVar347 + fVar306 * fVar251 + fVar271 * fVar211 + fVar317 * fStack_2e8;
      auVar141._28_4_ = 0;
      fVar275 = *(float *)(catmullrom_basis1 + lVar19 + 0x908);
      fVar215 = *(float *)(catmullrom_basis1 + lVar19 + 0x90c);
      fVar320 = *(float *)(catmullrom_basis1 + lVar19 + 0x910);
      fVar295 = *(float *)(catmullrom_basis1 + lVar19 + 0x914);
      fVar218 = *(float *)(catmullrom_basis1 + lVar19 + 0x918);
      fVar321 = *(float *)(catmullrom_basis1 + lVar19 + 0x91c);
      fVar296 = *(float *)(catmullrom_basis1 + lVar19 + 0x920);
      fVar297 = *(float *)(catmullrom_basis1 + lVar19 + 0xd8c);
      fVar220 = *(float *)(catmullrom_basis1 + lVar19 + 0xd90);
      fVar322 = *(float *)(catmullrom_basis1 + lVar19 + 0xd94);
      fVar298 = *(float *)(catmullrom_basis1 + lVar19 + 0xd98);
      fVar299 = *(float *)(catmullrom_basis1 + lVar19 + 0xd9c);
      fVar222 = *(float *)(catmullrom_basis1 + lVar19 + 0xda0);
      fVar175 = *(float *)(catmullrom_basis1 + lVar19 + 0xda4);
      fVar358 = *(float *)(catmullrom_basis1 + lVar19 + 0x484);
      fVar359 = *(float *)(catmullrom_basis1 + lVar19 + 0x488);
      fVar360 = *(float *)(catmullrom_basis1 + lVar19 + 0x48c);
      fVar155 = *(float *)(catmullrom_basis1 + lVar19 + 0x490);
      fVar156 = *(float *)(catmullrom_basis1 + lVar19 + 0x494);
      fVar157 = *(float *)(catmullrom_basis1 + lVar19 + 0x498);
      fVar194 = *(float *)(catmullrom_basis1 + lVar19 + 0x49c);
      fVar196 = *(float *)(catmullrom_basis1 + lVar19);
      fVar240 = *(float *)(catmullrom_basis1 + lVar19 + 4);
      fVar212 = *(float *)(catmullrom_basis1 + lVar19 + 8);
      fVar158 = *(float *)(catmullrom_basis1 + lVar19 + 0xc);
      fVar217 = *(float *)(catmullrom_basis1 + lVar19 + 0x10);
      fVar219 = *(float *)(catmullrom_basis1 + lVar19 + 0x14);
      fVar221 = *(float *)(catmullrom_basis1 + lVar19 + 0x18);
      auVar228._0_4_ = fVar242 * fVar196 + fVar224 * fVar358 + fVar275 * fVar274 + fVar297 * fVar258
      ;
      auVar228._4_4_ = fVar252 * fVar240 + fVar235 * fVar359 + fVar215 * fVar276 + fVar220 * fVar149
      ;
      auVar228._8_4_ = fVar254 * fVar212 + fVar237 * fVar360 + fVar320 * fVar277 + fVar322 * fVar151
      ;
      auVar228._12_4_ =
           fVar256 * fVar158 + fVar239 * fVar155 + fVar295 * fVar278 + fVar298 * fVar153;
      auVar228._16_4_ =
           fVar242 * fVar217 + fVar224 * fVar156 + fVar218 * fVar274 + fVar299 * fVar258;
      auVar228._20_4_ =
           fVar252 * fVar219 + fVar235 * fVar157 + fVar321 * fVar276 + fVar222 * fVar149;
      auVar228._24_4_ =
           fVar254 * fVar221 + fVar237 * fVar194 + fVar296 * fVar277 + fVar175 * fVar151;
      auVar228._28_4_ = fVar356 + fVar256 + 0.0 + 0.0;
      auVar203._0_4_ = fVar177 * fVar196 + fVar176 * fVar358 + fVar275 * fVar279 + fVar323 * fVar297
      ;
      auVar203._4_4_ = fVar189 * fVar240 + fVar260 * fVar359 + fVar215 * fVar188 + fVar327 * fVar220
      ;
      auVar203._8_4_ = fVar191 * fVar212 + fVar270 * fVar360 + fVar320 * fVar190 + fVar329 * fVar322
      ;
      auVar203._12_4_ =
           fVar193 * fVar158 + fVar272 * fVar155 + fVar295 * fVar192 + fVar330 * fVar298;
      auVar203._16_4_ =
           fVar177 * fVar217 + fVar176 * fVar156 + fVar218 * fVar279 + fVar323 * fVar299;
      auVar203._20_4_ =
           fVar189 * fVar219 + fVar260 * fVar157 + fVar321 * fVar188 + fVar327 * fVar222;
      auVar203._24_4_ =
           fVar191 * fVar221 + fVar270 * fVar194 + fVar296 * fVar190 + fVar329 * fVar175;
      auVar203._28_4_ = fVar193 + fVar256 + 0.0 + 0.0;
      local_7c0._0_4_ =
           fVar348 * fVar358 + fVar174 * fVar275 + fVar297 * fVar259 + fVar308 * fVar196;
      local_7c0._4_4_ =
           fVar352 * fVar359 + fVar305 * fVar215 + fVar220 * fVar269 + fVar315 * fVar240;
      local_7c0._8_4_ =
           fVar354 * fVar360 + fVar306 * fVar320 + fVar322 * fVar271 + fVar317 * fVar212;
      local_7c0._12_4_ =
           fVar356 * fVar155 + auVar200._12_4_ * fVar295 + fVar298 * fVar273 +
           auVar201._12_4_ * fVar158;
      local_7c0._16_4_ =
           fVar348 * fVar156 + fVar174 * fVar218 + fVar299 * fVar259 + fVar308 * fVar217;
      local_7c0._20_4_ =
           fVar352 * fVar157 + fVar305 * fVar321 + fVar222 * fVar269 + fVar315 * fVar219;
      local_7c0._24_4_ =
           fVar354 * fVar194 + fVar306 * fVar296 + fVar175 * fVar271 + fVar317 * fVar221;
      local_7c0._28_4_ = fVar273 + fVar256 + 0.0 + fVar193;
      local_340 = vsubps_avx(auVar228,auVar286);
      auVar29 = vsubps_avx(auVar203,auVar334);
      fVar324 = local_340._0_4_;
      fVar210 = local_340._4_4_;
      auVar172._4_4_ = auVar334._4_4_ * fVar210;
      auVar172._0_4_ = auVar334._0_4_ * fVar324;
      fVar328 = local_340._8_4_;
      auVar172._8_4_ = auVar334._8_4_ * fVar328;
      fVar216 = local_340._12_4_;
      auVar172._12_4_ = auVar334._12_4_ * fVar216;
      fVar195 = local_340._16_4_;
      auVar172._16_4_ = auVar334._16_4_ * fVar195;
      fVar209 = local_340._20_4_;
      auVar172._20_4_ = auVar334._20_4_ * fVar209;
      fVar211 = local_340._24_4_;
      auVar172._24_4_ = auVar334._24_4_ * fVar211;
      auVar172._28_4_ = fVar193;
      fVar259 = auVar29._0_4_;
      fVar269 = auVar29._4_4_;
      auVar30._4_4_ = fVar269 * auVar286._4_4_;
      auVar30._0_4_ = fVar259 * auVar286._0_4_;
      fVar271 = auVar29._8_4_;
      auVar30._8_4_ = fVar271 * auVar286._8_4_;
      fVar273 = auVar29._12_4_;
      auVar30._12_4_ = fVar273 * auVar286._12_4_;
      fVar174 = auVar29._16_4_;
      auVar30._16_4_ = fVar174 * auVar286._16_4_;
      fVar305 = auVar29._20_4_;
      auVar30._20_4_ = fVar305 * auVar286._20_4_;
      fVar306 = auVar29._24_4_;
      auVar30._24_4_ = fVar306 * auVar286._24_4_;
      auVar30._28_4_ = auVar203._28_4_;
      auVar30 = vsubps_avx(auVar172,auVar30);
      auVar172 = vmaxps_avx(auVar141,local_7c0);
      auVar248._4_4_ = auVar172._4_4_ * auVar172._4_4_ * (fVar210 * fVar210 + fVar269 * fVar269);
      auVar248._0_4_ = auVar172._0_4_ * auVar172._0_4_ * (fVar324 * fVar324 + fVar259 * fVar259);
      auVar248._8_4_ = auVar172._8_4_ * auVar172._8_4_ * (fVar328 * fVar328 + fVar271 * fVar271);
      auVar248._12_4_ = auVar172._12_4_ * auVar172._12_4_ * (fVar216 * fVar216 + fVar273 * fVar273);
      auVar248._16_4_ = auVar172._16_4_ * auVar172._16_4_ * (fVar195 * fVar195 + fVar174 * fVar174);
      auVar248._20_4_ = auVar172._20_4_ * auVar172._20_4_ * (fVar209 * fVar209 + fVar305 * fVar305);
      auVar248._24_4_ = auVar172._24_4_ * auVar172._24_4_ * (fVar211 * fVar211 + fVar306 * fVar306);
      auVar248._28_4_ = auVar228._28_4_ + auVar203._28_4_;
      auVar31._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar31._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar31._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar31._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      auVar31._16_4_ = auVar30._16_4_ * auVar30._16_4_;
      auVar31._20_4_ = auVar30._20_4_ * auVar30._20_4_;
      auVar31._24_4_ = auVar30._24_4_ * auVar30._24_4_;
      auVar31._28_4_ = auVar30._28_4_;
      auVar172 = vcmpps_avx(auVar31,auVar248,2);
      auVar200 = ZEXT416((uint)(float)(int)uVar14);
      local_460._0_16_ = auVar200;
      auVar200 = vshufps_avx(auVar200,auVar200,0);
      auVar204._16_16_ = auVar200;
      auVar204._0_16_ = auVar200;
      auVar30 = vcmpps_avx(_DAT_02020f40,auVar204,1);
      auVar208 = ZEXT3264(auVar30);
      auVar200 = vpermilps_avx(auVar199,0xaa);
      register0x00001490 = auVar200;
      _local_160 = auVar200;
      auVar201 = vpermilps_avx(auVar285,0xaa);
      register0x00001550 = auVar201;
      _local_2e0 = auVar201;
      auVar202 = vpermilps_avx(auVar292,0xaa);
      register0x00001590 = auVar202;
      _local_c0 = auVar202;
      auVar21 = vpermilps_avx(auVar162,0xaa);
      register0x00001310 = auVar21;
      _local_500 = auVar21;
      auVar248 = auVar30 & auVar172;
      _local_7e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
      auVar181 = ZEXT416((uint)(auVar181._0_4_ * 4.7683716e-07));
      fVar324 = fVar323;
      fVar210 = fVar327;
      fVar328 = fVar329;
      fVar216 = fVar330;
      fVar195 = fVar176;
      fVar209 = fVar260;
      fVar211 = fVar270;
      local_4c0 = auVar361;
      if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar248 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar248 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar248 >> 0x7f,0) == '\0') &&
            (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar248 >> 0xbf,0) == '\0') &&
          (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar248[0x1f]) {
        bVar131 = false;
        auVar351 = ZEXT3264(_local_660);
      }
      else {
        auVar172 = vandps_avx(auVar172,auVar30);
        fVar309 = auVar200._0_4_;
        fVar316 = auVar200._4_4_;
        fVar318 = auVar200._8_4_;
        fVar319 = auVar200._12_4_;
        fVar339 = auVar201._0_4_;
        fVar343 = auVar201._4_4_;
        fVar344 = auVar201._8_4_;
        fVar345 = auVar201._12_4_;
        fVar349 = auVar202._0_4_;
        fVar353 = auVar202._4_4_;
        fVar355 = auVar202._8_4_;
        fVar357 = auVar202._12_4_;
        fVar259 = auVar21._0_4_;
        fVar269 = auVar21._4_4_;
        fVar271 = auVar21._8_4_;
        fVar273 = auVar21._12_4_;
        fVar174 = auVar30._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar19 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar19 + 0x4a0);
        local_320._0_4_ =
             fVar309 * fVar196 + fVar339 * fVar358 + fVar349 * fVar275 + fVar297 * fVar259;
        local_320._4_4_ =
             fVar316 * fVar240 + fVar343 * fVar359 + fVar353 * fVar215 + fVar220 * fVar269;
        fStack_318 = fVar318 * fVar212 + fVar344 * fVar360 + fVar355 * fVar320 + fVar322 * fVar271;
        fStack_314 = fVar319 * fVar158 + fVar345 * fVar155 + fVar357 * fVar295 + fVar298 * fVar273;
        fStack_310 = fVar309 * fVar217 + fVar339 * fVar156 + fVar349 * fVar218 + fVar299 * fVar259;
        fStack_30c = fVar316 * fVar219 + fVar343 * fVar157 + fVar353 * fVar321 + fVar222 * fVar269;
        fStack_308 = fVar318 * fVar221 + fVar344 * fVar194 + fVar355 * fVar296 + fVar175 * fVar271;
        fStack_304 = auVar172._28_4_ + fVar174;
        local_300._0_4_ = auVar122._0_4_;
        local_300._4_4_ = auVar122._4_4_;
        fStack_2f8 = auVar122._8_4_;
        local_760._0_4_ = auVar121._0_4_;
        local_760._4_4_ = auVar121._4_4_;
        uStack_758._0_4_ = auVar121._8_4_;
        uStack_758._4_4_ = auVar121._12_4_;
        fStack_750 = auVar121._16_4_;
        fStack_74c = auVar121._20_4_;
        fStack_748 = auVar121._24_4_;
        fVar135 = fVar309 * (float)local_300._0_4_ +
                  fVar339 * fVar253 + fVar349 * fVar214 + fVar259 * (float)local_760._0_4_;
        fVar150 = fVar316 * (float)local_300._4_4_ +
                  fVar343 * fVar255 + fVar353 * fVar223 + fVar269 * (float)local_760._4_4_;
        fVar152 = fVar318 * fStack_2f8 +
                  fVar344 * fVar346 + fVar355 * fVar234 + fVar271 * (float)uStack_758;
        fVar154 = fVar319 * fVar294 +
                  fVar345 * fVar331 + fVar357 * fVar236 + fVar273 * uStack_758._4_4_;
        fStack_810 = fVar309 * fStack_2f0 +
                     fVar339 * fVar213 + fVar349 * fVar238 + fVar259 * fStack_750;
        fStack_80c = fVar316 * fStack_2ec +
                     fVar343 * fVar332 + fVar353 * fVar241 + fVar269 * fStack_74c;
        fStack_808 = fVar318 * fStack_2e8 +
                     fVar344 * fVar347 + fVar355 * fVar251 + fVar271 * fStack_748;
        fStack_804 = fStack_304 + fVar174 + auVar172._28_4_ + auVar30._28_4_;
        fVar214 = *(float *)(catmullrom_basis0 + lVar19 + 0x1210);
        fVar223 = *(float *)(catmullrom_basis0 + lVar19 + 0x1214);
        fVar234 = *(float *)(catmullrom_basis0 + lVar19 + 0x1218);
        fVar236 = *(float *)(catmullrom_basis0 + lVar19 + 0x121c);
        fVar238 = *(float *)(catmullrom_basis0 + lVar19 + 0x1220);
        fVar241 = *(float *)(catmullrom_basis0 + lVar19 + 0x1224);
        fVar251 = *(float *)(catmullrom_basis0 + lVar19 + 0x1228);
        fVar253 = *(float *)(catmullrom_basis0 + lVar19 + 0x1694);
        fVar255 = *(float *)(catmullrom_basis0 + lVar19 + 0x1698);
        fVar346 = *(float *)(catmullrom_basis0 + lVar19 + 0x169c);
        fVar331 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a0);
        fVar213 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a4);
        fVar332 = *(float *)(catmullrom_basis0 + lVar19 + 0x16a8);
        fVar347 = *(float *)(catmullrom_basis0 + lVar19 + 0x16ac);
        fVar275 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b18);
        fVar215 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b1c);
        fVar320 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b20);
        fVar294 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b24);
        fVar295 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b28);
        fVar218 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b2c);
        fVar321 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b30);
        fVar296 = *(float *)(catmullrom_basis0 + lVar19 + 0x1f9c);
        fVar297 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa0);
        fVar220 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa4);
        fVar322 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fa8);
        fVar298 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fac);
        fVar299 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fb0);
        fVar222 = *(float *)(catmullrom_basis0 + lVar19 + 0x1fb4);
        local_800._0_16_ = auVar181;
        fVar257 = *(float *)(catmullrom_basis1 + lVar19 + 0x4a0) + 0.0;
        fVar175 = *(float *)(catmullrom_basis0 + lVar19 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar19 + 0x1fb8);
        fVar307 = *(float *)(catmullrom_basis0 + lVar19 + 0x16b0) + fVar175;
        auVar167._0_4_ =
             fVar177 * fVar214 + fVar279 * fVar275 + fVar323 * fVar296 + fVar176 * fVar253;
        auVar167._4_4_ =
             fVar189 * fVar223 + fVar188 * fVar215 + fVar327 * fVar297 + fVar260 * fVar255;
        auVar167._8_4_ =
             fVar191 * fVar234 + fVar190 * fVar320 + fVar329 * fVar220 + fVar270 * fVar346;
        auVar167._12_4_ =
             fVar193 * fVar236 + fVar192 * fVar294 + fVar330 * fVar322 + fVar272 * fVar331;
        auVar167._16_4_ =
             fVar177 * fVar238 + fVar279 * fVar295 + fVar323 * fVar298 + fVar176 * fVar213;
        auVar167._20_4_ =
             fVar189 * fVar241 + fVar188 * fVar218 + fVar327 * fVar299 + fVar260 * fVar332;
        auVar167._24_4_ =
             fVar191 * fVar251 + fVar190 * fVar321 + fVar329 * fVar222 + fVar270 * fVar347;
        auVar167._28_4_ = fVar175 + *(float *)(catmullrom_basis1 + lVar19 + 0x1c) + 0.0 + fVar257;
        auVar244._0_4_ =
             fVar339 * fVar253 + fVar349 * fVar275 + fVar259 * fVar296 + fVar309 * fVar214;
        auVar244._4_4_ =
             fVar343 * fVar255 + fVar353 * fVar215 + fVar269 * fVar297 + fVar316 * fVar223;
        auVar244._8_4_ =
             fVar344 * fVar346 + fVar355 * fVar320 + fVar271 * fVar220 + fVar318 * fVar234;
        auVar244._12_4_ =
             fVar345 * fVar331 + fVar357 * fVar294 + fVar273 * fVar322 + fVar319 * fVar236;
        auVar244._16_4_ =
             fVar339 * fVar213 + fVar349 * fVar295 + fVar259 * fVar298 + fVar309 * fVar238;
        auVar244._20_4_ =
             fVar343 * fVar332 + fVar353 * fVar218 + fVar269 * fVar299 + fVar316 * fVar241;
        auVar244._24_4_ =
             fVar344 * fVar347 + fVar355 * fVar321 + fVar271 * fVar222 + fVar318 * fVar251;
        auVar244._28_4_ = fVar307 + *(float *)(catmullrom_basis0 + lVar19 + 0x122c);
        fVar175 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b18);
        fVar358 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b1c);
        fVar359 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b20);
        fVar360 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b24);
        fVar155 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b28);
        fVar156 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b2c);
        fVar157 = *(float *)(catmullrom_basis1 + lVar19 + 0x1b30);
        fVar194 = *(float *)(catmullrom_basis1 + lVar19 + 0x1f9c);
        fVar196 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa0);
        fVar240 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa4);
        fVar212 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fa8);
        fVar158 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fac);
        fVar217 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fb0);
        fVar219 = *(float *)(catmullrom_basis1 + lVar19 + 0x1fb4);
        fVar221 = *(float *)(catmullrom_basis1 + lVar19 + 0x1694);
        fVar174 = *(float *)(catmullrom_basis1 + lVar19 + 0x1698);
        fVar305 = *(float *)(catmullrom_basis1 + lVar19 + 0x169c);
        fVar306 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a0);
        fVar308 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a4);
        fVar315 = *(float *)(catmullrom_basis1 + lVar19 + 0x16a8);
        fVar317 = *(float *)(catmullrom_basis1 + lVar19 + 0x16ac);
        fVar348 = *(float *)(catmullrom_basis1 + lVar19 + 0x1210);
        fVar352 = *(float *)(catmullrom_basis1 + lVar19 + 0x1214);
        fVar354 = *(float *)(catmullrom_basis1 + lVar19 + 0x1218);
        fVar356 = *(float *)(catmullrom_basis1 + lVar19 + 0x121c);
        fVar109 = *(float *)(catmullrom_basis1 + lVar19 + 0x1220);
        fVar110 = *(float *)(catmullrom_basis1 + lVar19 + 0x1224);
        fVar111 = *(float *)(catmullrom_basis1 + lVar19 + 0x1228);
        auVar264._0_4_ =
             fVar242 * fVar348 + fVar224 * fVar221 + fVar274 * fVar175 + fVar258 * fVar194;
        auVar264._4_4_ =
             fVar252 * fVar352 + fVar235 * fVar174 + fVar276 * fVar358 + fVar149 * fVar196;
        auVar264._8_4_ =
             fVar254 * fVar354 + fVar237 * fVar305 + fVar277 * fVar359 + fVar151 * fVar240;
        auVar264._12_4_ =
             fVar256 * fVar356 + fVar239 * fVar306 + fVar278 * fVar360 + fVar153 * fVar212;
        auVar264._16_4_ =
             fVar242 * fVar109 + fVar224 * fVar308 + fVar274 * fVar155 + fVar258 * fVar158;
        auVar264._20_4_ =
             fVar252 * fVar110 + fVar235 * fVar315 + fVar276 * fVar156 + fVar149 * fVar217;
        auVar264._24_4_ =
             fVar254 * fVar111 + fVar237 * fVar317 + fVar277 * fVar157 + fVar151 * fVar219;
        auVar264._28_4_ = fVar319 + fVar319 + fVar307 + fVar153;
        auVar301._0_4_ =
             fVar177 * fVar348 + fVar176 * fVar221 + fVar279 * fVar175 + fVar323 * fVar194;
        auVar301._4_4_ =
             fVar189 * fVar352 + fVar260 * fVar174 + fVar188 * fVar358 + fVar327 * fVar196;
        auVar301._8_4_ =
             fVar191 * fVar354 + fVar270 * fVar305 + fVar190 * fVar359 + fVar329 * fVar240;
        auVar301._12_4_ =
             fVar193 * fVar356 + fVar272 * fVar306 + fVar192 * fVar360 + fVar330 * fVar212;
        auVar301._16_4_ =
             fVar177 * fVar109 + fVar176 * fVar308 + fVar279 * fVar155 + fVar323 * fVar158;
        auVar301._20_4_ =
             fVar189 * fVar110 + fVar260 * fVar315 + fVar188 * fVar156 + fVar327 * fVar217;
        auVar301._24_4_ =
             fVar191 * fVar111 + fVar270 * fVar317 + fVar190 * fVar157 + fVar329 * fVar219;
        auVar301._28_4_ = fVar319 + fVar319 + fVar319 + fVar307;
        auVar187._0_4_ =
             fVar309 * fVar348 + fVar339 * fVar221 + fVar349 * fVar175 + fVar194 * fVar259;
        auVar187._4_4_ =
             fVar316 * fVar352 + fVar343 * fVar174 + fVar353 * fVar358 + fVar196 * fVar269;
        auVar187._8_4_ =
             fVar318 * fVar354 + fVar344 * fVar305 + fVar355 * fVar359 + fVar240 * fVar271;
        auVar187._12_4_ =
             fVar319 * fVar356 + fVar345 * fVar306 + fVar357 * fVar360 + fVar212 * fVar273;
        auVar187._16_4_ =
             fVar309 * fVar109 + fVar339 * fVar308 + fVar349 * fVar155 + fVar158 * fVar259;
        auVar187._20_4_ =
             fVar316 * fVar110 + fVar343 * fVar315 + fVar353 * fVar156 + fVar217 * fVar269;
        auVar187._24_4_ =
             fVar318 * fVar111 + fVar344 * fVar317 + fVar355 * fVar157 + fVar219 * fVar271;
        auVar187._28_4_ =
             *(float *)(catmullrom_basis1 + lVar19 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar19 + 0x1fb8);
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar118._4_4_ =
             fVar252 * fVar223 + fVar235 * fVar255 + fVar276 * fVar215 + fVar149 * fVar297;
        auVar118._0_4_ =
             fVar242 * fVar214 + fVar224 * fVar253 + fVar274 * fVar275 + fVar258 * fVar296;
        auVar118._8_4_ =
             fVar254 * fVar234 + fVar237 * fVar346 + fVar277 * fVar320 + fVar151 * fVar220;
        auVar118._12_4_ =
             fVar256 * fVar236 + fVar239 * fVar331 + fVar278 * fVar294 + fVar153 * fVar322;
        auVar118._16_4_ =
             fVar242 * fVar238 + fVar224 * fVar213 + fVar274 * fVar295 + fVar258 * fVar298;
        auVar118._20_4_ =
             fVar252 * fVar241 + fVar235 * fVar332 + fVar276 * fVar218 + fVar149 * fVar299;
        auVar118._24_4_ =
             fVar254 * fVar251 + fVar237 * fVar347 + fVar277 * fVar321 + fVar151 * fVar222;
        auVar118._28_4_ =
             *(float *)(catmullrom_basis0 + lVar19 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar19 + 0x1fb8) + fVar257;
        auVar30 = vandps_avx(auVar118,auVar229);
        auVar248 = vandps_avx(auVar167,auVar229);
        auVar248 = vmaxps_avx(auVar30,auVar248);
        auVar30 = vandps_avx(auVar244,auVar229);
        auVar30 = vmaxps_avx(auVar248,auVar30);
        auVar181 = vpermilps_avx(auVar181,0);
        auVar245._16_16_ = auVar181;
        auVar245._0_16_ = auVar181;
        auVar30 = vcmpps_avx(auVar30,auVar245,1);
        auVar31 = vblendvps_avx(auVar118,local_340,auVar30);
        auVar204 = vblendvps_avx(auVar167,auVar29,auVar30);
        auVar30 = vandps_avx(auVar264,auVar229);
        auVar248 = vandps_avx(auVar301,auVar229);
        auVar20 = vmaxps_avx(auVar30,auVar248);
        auVar30 = vandps_avx(auVar187,auVar229);
        auVar30 = vmaxps_avx(auVar20,auVar30);
        auVar20 = vcmpps_avx(auVar30,auVar245,1);
        auVar30 = vblendvps_avx(auVar264,local_340,auVar20);
        auVar29 = vblendvps_avx(auVar301,auVar29,auVar20);
        fVar358 = auVar31._0_4_;
        fVar359 = auVar31._4_4_;
        fVar360 = auVar31._8_4_;
        fVar155 = auVar31._12_4_;
        fVar156 = auVar31._16_4_;
        fVar157 = auVar31._20_4_;
        fVar194 = auVar31._24_4_;
        fVar258 = -auVar31._28_4_;
        fVar196 = auVar30._0_4_;
        fVar240 = auVar30._4_4_;
        fVar212 = auVar30._8_4_;
        fVar158 = auVar30._12_4_;
        fVar217 = auVar30._16_4_;
        fVar219 = auVar30._20_4_;
        fVar221 = auVar30._24_4_;
        fVar214 = auVar204._0_4_;
        fVar238 = auVar204._4_4_;
        fVar255 = auVar204._8_4_;
        fVar332 = auVar204._12_4_;
        fVar320 = auVar204._16_4_;
        fVar321 = auVar204._20_4_;
        fVar322 = auVar204._24_4_;
        auVar142._0_4_ = fVar214 * fVar214 + fVar358 * fVar358;
        auVar142._4_4_ = fVar238 * fVar238 + fVar359 * fVar359;
        auVar142._8_4_ = fVar255 * fVar255 + fVar360 * fVar360;
        auVar142._12_4_ = fVar332 * fVar332 + fVar155 * fVar155;
        auVar142._16_4_ = fVar320 * fVar320 + fVar156 * fVar156;
        auVar142._20_4_ = fVar321 * fVar321 + fVar157 * fVar157;
        auVar142._24_4_ = fVar322 * fVar322 + fVar194 * fVar194;
        auVar142._28_4_ = auVar301._28_4_ + auVar31._28_4_;
        auVar31 = vrsqrtps_avx(auVar142);
        fVar223 = auVar31._0_4_;
        fVar234 = auVar31._4_4_;
        auVar20._4_4_ = fVar234 * 1.5;
        auVar20._0_4_ = fVar223 * 1.5;
        fVar236 = auVar31._8_4_;
        auVar20._8_4_ = fVar236 * 1.5;
        fVar241 = auVar31._12_4_;
        auVar20._12_4_ = fVar241 * 1.5;
        fVar251 = auVar31._16_4_;
        auVar20._16_4_ = fVar251 * 1.5;
        fVar253 = auVar31._20_4_;
        auVar20._20_4_ = fVar253 * 1.5;
        fVar346 = auVar31._24_4_;
        fVar175 = auVar248._28_4_;
        auVar20._24_4_ = fVar346 * 1.5;
        auVar20._28_4_ = fVar175;
        auVar32._4_4_ = fVar234 * fVar234 * fVar234 * auVar142._4_4_ * 0.5;
        auVar32._0_4_ = fVar223 * fVar223 * fVar223 * auVar142._0_4_ * 0.5;
        auVar32._8_4_ = fVar236 * fVar236 * fVar236 * auVar142._8_4_ * 0.5;
        auVar32._12_4_ = fVar241 * fVar241 * fVar241 * auVar142._12_4_ * 0.5;
        auVar32._16_4_ = fVar251 * fVar251 * fVar251 * auVar142._16_4_ * 0.5;
        auVar32._20_4_ = fVar253 * fVar253 * fVar253 * auVar142._20_4_ * 0.5;
        auVar32._24_4_ = fVar346 * fVar346 * fVar346 * auVar142._24_4_ * 0.5;
        auVar32._28_4_ = auVar142._28_4_;
        auVar248 = vsubps_avx(auVar20,auVar32);
        fVar223 = auVar248._0_4_;
        fVar241 = auVar248._4_4_;
        fVar346 = auVar248._8_4_;
        fVar347 = auVar248._12_4_;
        fVar294 = auVar248._16_4_;
        fVar296 = auVar248._20_4_;
        fVar298 = auVar248._24_4_;
        fVar234 = auVar29._0_4_;
        fVar251 = auVar29._4_4_;
        fVar331 = auVar29._8_4_;
        fVar275 = auVar29._12_4_;
        fVar295 = auVar29._16_4_;
        fVar297 = auVar29._20_4_;
        fVar299 = auVar29._24_4_;
        auVar143._0_4_ = fVar234 * fVar234 + fVar196 * fVar196;
        auVar143._4_4_ = fVar251 * fVar251 + fVar240 * fVar240;
        auVar143._8_4_ = fVar331 * fVar331 + fVar212 * fVar212;
        auVar143._12_4_ = fVar275 * fVar275 + fVar158 * fVar158;
        auVar143._16_4_ = fVar295 * fVar295 + fVar217 * fVar217;
        auVar143._20_4_ = fVar297 * fVar297 + fVar219 * fVar219;
        auVar143._24_4_ = fVar299 * fVar299 + fVar221 * fVar221;
        auVar143._28_4_ = auVar30._28_4_ + auVar248._28_4_;
        auVar30 = vrsqrtps_avx(auVar143);
        fVar236 = auVar30._0_4_;
        fVar253 = auVar30._4_4_;
        auVar33._4_4_ = fVar253 * 1.5;
        auVar33._0_4_ = fVar236 * 1.5;
        fVar213 = auVar30._8_4_;
        auVar33._8_4_ = fVar213 * 1.5;
        fVar215 = auVar30._12_4_;
        auVar33._12_4_ = fVar215 * 1.5;
        fVar218 = auVar30._16_4_;
        auVar33._16_4_ = fVar218 * 1.5;
        fVar220 = auVar30._20_4_;
        auVar33._20_4_ = fVar220 * 1.5;
        fVar222 = auVar30._24_4_;
        auVar33._24_4_ = fVar222 * 1.5;
        auVar33._28_4_ = fVar175;
        auVar34._4_4_ = fVar253 * fVar253 * fVar253 * auVar143._4_4_ * 0.5;
        auVar34._0_4_ = fVar236 * fVar236 * fVar236 * auVar143._0_4_ * 0.5;
        auVar34._8_4_ = fVar213 * fVar213 * fVar213 * auVar143._8_4_ * 0.5;
        auVar34._12_4_ = fVar215 * fVar215 * fVar215 * auVar143._12_4_ * 0.5;
        auVar34._16_4_ = fVar218 * fVar218 * fVar218 * auVar143._16_4_ * 0.5;
        auVar34._20_4_ = fVar220 * fVar220 * fVar220 * auVar143._20_4_ * 0.5;
        auVar34._24_4_ = fVar222 * fVar222 * fVar222 * auVar143._24_4_ * 0.5;
        auVar34._28_4_ = auVar143._28_4_;
        auVar30 = vsubps_avx(auVar33,auVar34);
        fVar236 = auVar30._0_4_;
        fVar253 = auVar30._4_4_;
        fVar213 = auVar30._8_4_;
        fVar215 = auVar30._12_4_;
        fVar218 = auVar30._16_4_;
        fVar220 = auVar30._20_4_;
        fVar222 = auVar30._24_4_;
        fVar214 = auVar141._0_4_ * fVar214 * fVar223;
        fVar238 = auVar141._4_4_ * fVar238 * fVar241;
        auVar35._4_4_ = fVar238;
        auVar35._0_4_ = fVar214;
        fVar255 = auVar141._8_4_ * fVar255 * fVar346;
        auVar35._8_4_ = fVar255;
        fVar332 = auVar141._12_4_ * fVar332 * fVar347;
        auVar35._12_4_ = fVar332;
        fVar320 = auVar141._16_4_ * fVar320 * fVar294;
        auVar35._16_4_ = fVar320;
        fVar321 = auVar141._20_4_ * fVar321 * fVar296;
        auVar35._20_4_ = fVar321;
        fVar322 = auVar141._24_4_ * fVar322 * fVar298;
        auVar35._24_4_ = fVar322;
        auVar35._28_4_ = fVar175;
        local_760._4_4_ = fVar238 + auVar286._4_4_;
        local_760._0_4_ = fVar214 + auVar286._0_4_;
        uStack_758._0_4_ = fVar255 + auVar286._8_4_;
        uStack_758._4_4_ = fVar332 + auVar286._12_4_;
        fStack_750 = fVar320 + auVar286._16_4_;
        fStack_74c = fVar321 + auVar286._20_4_;
        fStack_748 = fVar322 + auVar286._24_4_;
        fStack_744 = fVar175 + auVar286._28_4_;
        fVar332 = auVar141._0_4_ * fVar223 * -fVar358;
        fVar320 = auVar141._4_4_ * fVar241 * -fVar359;
        auVar36._4_4_ = fVar320;
        auVar36._0_4_ = fVar332;
        fVar321 = auVar141._8_4_ * fVar346 * -fVar360;
        auVar36._8_4_ = fVar321;
        fVar322 = auVar141._12_4_ * fVar347 * -fVar155;
        auVar36._12_4_ = fVar322;
        fStack_770 = auVar141._16_4_ * fVar294 * -fVar156;
        auVar36._16_4_ = fStack_770;
        fStack_76c = auVar141._20_4_ * fVar296 * -fVar157;
        auVar36._20_4_ = fStack_76c;
        fStack_768 = auVar141._24_4_ * fVar298 * -fVar194;
        auVar36._24_4_ = fStack_768;
        auVar36._28_4_ = fVar258;
        fStack_770 = auVar334._16_4_ + fStack_770;
        fStack_76c = auVar334._20_4_ + fStack_76c;
        fStack_768 = auVar334._24_4_ + fStack_768;
        fStack_764 = auVar334._28_4_ + fVar258;
        fVar214 = fVar223 * 0.0 * auVar141._0_4_;
        fVar223 = fVar241 * 0.0 * auVar141._4_4_;
        auVar37._4_4_ = fVar223;
        auVar37._0_4_ = fVar214;
        fVar238 = fVar346 * 0.0 * auVar141._8_4_;
        auVar37._8_4_ = fVar238;
        fVar241 = fVar347 * 0.0 * auVar141._12_4_;
        auVar37._12_4_ = fVar241;
        fVar255 = fVar294 * 0.0 * auVar141._16_4_;
        auVar37._16_4_ = fVar255;
        fVar346 = fVar296 * 0.0 * auVar141._20_4_;
        auVar37._20_4_ = fVar346;
        fVar347 = fVar298 * 0.0 * auVar141._24_4_;
        auVar37._24_4_ = fVar347;
        auVar37._28_4_ = fVar345;
        auVar116._4_4_ = fVar150;
        auVar116._0_4_ = fVar135;
        auVar116._8_4_ = fVar152;
        auVar116._12_4_ = fVar154;
        auVar116._16_4_ = fStack_810;
        auVar116._20_4_ = fStack_80c;
        auVar116._24_4_ = fStack_808;
        auVar116._28_4_ = fStack_804;
        auVar265._0_4_ = fVar135 + fVar214;
        auVar265._4_4_ = fVar150 + fVar223;
        auVar265._8_4_ = fVar152 + fVar238;
        auVar265._12_4_ = fVar154 + fVar241;
        auVar265._16_4_ = fStack_810 + fVar255;
        auVar265._20_4_ = fStack_80c + fVar346;
        auVar265._24_4_ = fStack_808 + fVar347;
        auVar265._28_4_ = fStack_804 + fVar345;
        fVar214 = local_7c0._0_4_ * fVar234 * fVar236;
        fVar223 = local_7c0._4_4_ * fVar251 * fVar253;
        auVar38._4_4_ = fVar223;
        auVar38._0_4_ = fVar214;
        fVar234 = local_7c0._8_4_ * fVar331 * fVar213;
        auVar38._8_4_ = fVar234;
        fVar238 = local_7c0._12_4_ * fVar275 * fVar215;
        auVar38._12_4_ = fVar238;
        fVar241 = local_7c0._16_4_ * fVar295 * fVar218;
        auVar38._16_4_ = fVar241;
        fVar251 = local_7c0._20_4_ * fVar297 * fVar220;
        auVar38._20_4_ = fVar251;
        fVar255 = local_7c0._24_4_ * fVar299 * fVar222;
        auVar38._24_4_ = fVar255;
        auVar38._28_4_ = auVar29._28_4_;
        auVar286 = vsubps_avx(auVar286,auVar35);
        auVar311._0_4_ = auVar228._0_4_ + fVar214;
        auVar311._4_4_ = auVar228._4_4_ + fVar223;
        auVar311._8_4_ = auVar228._8_4_ + fVar234;
        auVar311._12_4_ = auVar228._12_4_ + fVar238;
        auVar311._16_4_ = auVar228._16_4_ + fVar241;
        auVar311._20_4_ = auVar228._20_4_ + fVar251;
        auVar311._24_4_ = auVar228._24_4_ + fVar255;
        auVar311._28_4_ = auVar228._28_4_ + auVar29._28_4_;
        fVar214 = local_7c0._0_4_ * fVar236 * -fVar196;
        fVar223 = local_7c0._4_4_ * fVar253 * -fVar240;
        auVar29._4_4_ = fVar223;
        auVar29._0_4_ = fVar214;
        fVar234 = local_7c0._8_4_ * fVar213 * -fVar212;
        auVar29._8_4_ = fVar234;
        fVar238 = local_7c0._12_4_ * fVar215 * -fVar158;
        auVar29._12_4_ = fVar238;
        fVar241 = local_7c0._16_4_ * fVar218 * -fVar217;
        auVar29._16_4_ = fVar241;
        fVar251 = local_7c0._20_4_ * fVar220 * -fVar219;
        auVar29._20_4_ = fVar251;
        fVar255 = local_7c0._24_4_ * fVar222 * -fVar221;
        auVar29._24_4_ = fVar255;
        auVar29._28_4_ = fVar357;
        auVar32 = vsubps_avx(auVar334,auVar36);
        auVar326._0_4_ = fVar214 + auVar203._0_4_;
        auVar326._4_4_ = fVar223 + auVar203._4_4_;
        auVar326._8_4_ = fVar234 + auVar203._8_4_;
        auVar326._12_4_ = fVar238 + auVar203._12_4_;
        auVar326._16_4_ = fVar241 + auVar203._16_4_;
        auVar326._20_4_ = fVar251 + auVar203._20_4_;
        auVar326._24_4_ = fVar255 + auVar203._24_4_;
        auVar326._28_4_ = fVar357 + auVar203._28_4_;
        fVar214 = fVar236 * 0.0 * local_7c0._0_4_;
        fVar223 = fVar253 * 0.0 * local_7c0._4_4_;
        auVar39._4_4_ = fVar223;
        auVar39._0_4_ = fVar214;
        fVar234 = fVar213 * 0.0 * local_7c0._8_4_;
        auVar39._8_4_ = fVar234;
        fVar236 = fVar215 * 0.0 * local_7c0._12_4_;
        auVar39._12_4_ = fVar236;
        fVar238 = fVar218 * 0.0 * local_7c0._16_4_;
        auVar39._16_4_ = fVar238;
        fVar241 = fVar220 * 0.0 * local_7c0._20_4_;
        auVar39._20_4_ = fVar241;
        fVar251 = fVar222 * 0.0 * local_7c0._24_4_;
        auVar39._24_4_ = fVar251;
        auVar39._28_4_ = fVar258;
        auVar33 = vsubps_avx(auVar116,auVar37);
        auVar362._0_4_ = (float)local_320._0_4_ + fVar214;
        auVar362._4_4_ = (float)local_320._4_4_ + fVar223;
        auVar362._8_4_ = fStack_318 + fVar234;
        auVar362._12_4_ = fStack_314 + fVar236;
        auVar362._16_4_ = fStack_310 + fVar238;
        auVar362._20_4_ = fStack_30c + fVar241;
        auVar362._24_4_ = fStack_308 + fVar251;
        auVar362._28_4_ = fStack_304 + fVar258;
        auVar30 = vsubps_avx(auVar228,auVar38);
        auVar29 = vsubps_avx(auVar203,auVar29);
        auVar248 = vsubps_avx(_local_320,auVar39);
        auVar31 = vsubps_avx(auVar326,auVar32);
        auVar204 = vsubps_avx(auVar362,auVar33);
        auVar40._4_4_ = auVar33._4_4_ * auVar31._4_4_;
        auVar40._0_4_ = auVar33._0_4_ * auVar31._0_4_;
        auVar40._8_4_ = auVar33._8_4_ * auVar31._8_4_;
        auVar40._12_4_ = auVar33._12_4_ * auVar31._12_4_;
        auVar40._16_4_ = auVar33._16_4_ * auVar31._16_4_;
        auVar40._20_4_ = auVar33._20_4_ * auVar31._20_4_;
        auVar40._24_4_ = auVar33._24_4_ * auVar31._24_4_;
        auVar40._28_4_ = fVar357;
        auVar41._4_4_ = auVar32._4_4_ * auVar204._4_4_;
        auVar41._0_4_ = auVar32._0_4_ * auVar204._0_4_;
        auVar41._8_4_ = auVar32._8_4_ * auVar204._8_4_;
        auVar41._12_4_ = auVar32._12_4_ * auVar204._12_4_;
        auVar41._16_4_ = auVar32._16_4_ * auVar204._16_4_;
        auVar41._20_4_ = auVar32._20_4_ * auVar204._20_4_;
        auVar41._24_4_ = auVar32._24_4_ * auVar204._24_4_;
        auVar41._28_4_ = auVar203._28_4_;
        auVar20 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar286._4_4_ * auVar204._4_4_;
        auVar42._0_4_ = auVar286._0_4_ * auVar204._0_4_;
        auVar42._8_4_ = auVar286._8_4_ * auVar204._8_4_;
        auVar42._12_4_ = auVar286._12_4_ * auVar204._12_4_;
        auVar42._16_4_ = auVar286._16_4_ * auVar204._16_4_;
        auVar42._20_4_ = auVar286._20_4_ * auVar204._20_4_;
        auVar42._24_4_ = auVar286._24_4_ * auVar204._24_4_;
        auVar42._28_4_ = auVar204._28_4_;
        auVar34 = vsubps_avx(auVar311,auVar286);
        auVar43._4_4_ = auVar33._4_4_ * auVar34._4_4_;
        auVar43._0_4_ = auVar33._0_4_ * auVar34._0_4_;
        auVar43._8_4_ = auVar33._8_4_ * auVar34._8_4_;
        auVar43._12_4_ = auVar33._12_4_ * auVar34._12_4_;
        auVar43._16_4_ = auVar33._16_4_ * auVar34._16_4_;
        auVar43._20_4_ = auVar33._20_4_ * auVar34._20_4_;
        auVar43._24_4_ = auVar33._24_4_ * auVar34._24_4_;
        auVar43._28_4_ = auVar228._28_4_;
        auVar35 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar34._4_4_ * auVar32._4_4_;
        auVar44._0_4_ = auVar34._0_4_ * auVar32._0_4_;
        auVar44._8_4_ = auVar34._8_4_ * auVar32._8_4_;
        auVar44._12_4_ = auVar34._12_4_ * auVar32._12_4_;
        auVar44._16_4_ = auVar34._16_4_ * auVar32._16_4_;
        auVar44._20_4_ = auVar34._20_4_ * auVar32._20_4_;
        auVar44._24_4_ = auVar34._24_4_ * auVar32._24_4_;
        auVar44._28_4_ = auVar204._28_4_;
        auVar45._4_4_ = auVar286._4_4_ * auVar31._4_4_;
        auVar45._0_4_ = auVar286._0_4_ * auVar31._0_4_;
        auVar45._8_4_ = auVar286._8_4_ * auVar31._8_4_;
        auVar45._12_4_ = auVar286._12_4_ * auVar31._12_4_;
        auVar45._16_4_ = auVar286._16_4_ * auVar31._16_4_;
        auVar45._20_4_ = auVar286._20_4_ * auVar31._20_4_;
        auVar45._24_4_ = auVar286._24_4_ * auVar31._24_4_;
        auVar45._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar45,auVar44);
        auVar144._0_4_ = auVar20._0_4_ * 0.0 + auVar31._0_4_ + auVar35._0_4_ * 0.0;
        auVar144._4_4_ = auVar20._4_4_ * 0.0 + auVar31._4_4_ + auVar35._4_4_ * 0.0;
        auVar144._8_4_ = auVar20._8_4_ * 0.0 + auVar31._8_4_ + auVar35._8_4_ * 0.0;
        auVar144._12_4_ = auVar20._12_4_ * 0.0 + auVar31._12_4_ + auVar35._12_4_ * 0.0;
        auVar144._16_4_ = auVar20._16_4_ * 0.0 + auVar31._16_4_ + auVar35._16_4_ * 0.0;
        auVar144._20_4_ = auVar20._20_4_ * 0.0 + auVar31._20_4_ + auVar35._20_4_ * 0.0;
        auVar144._24_4_ = auVar20._24_4_ * 0.0 + auVar31._24_4_ + auVar35._24_4_ * 0.0;
        auVar144._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar35._28_4_;
        auVar20 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
        local_720 = vblendvps_avx(auVar30,_local_760,auVar20);
        auVar119._4_4_ = auVar334._4_4_ + fVar320;
        auVar119._0_4_ = auVar334._0_4_ + fVar332;
        auVar119._8_4_ = auVar334._8_4_ + fVar321;
        auVar119._12_4_ = auVar334._12_4_ + fVar322;
        auVar119._16_4_ = fStack_770;
        auVar119._20_4_ = fStack_76c;
        auVar119._24_4_ = fStack_768;
        auVar119._28_4_ = fStack_764;
        auVar30 = vblendvps_avx(auVar29,auVar119,auVar20);
        auVar29 = vblendvps_avx(auVar248,auVar265,auVar20);
        auVar248 = vblendvps_avx(auVar286,auVar311,auVar20);
        auVar31 = vblendvps_avx(auVar32,auVar326,auVar20);
        auVar204 = vblendvps_avx(auVar33,auVar362,auVar20);
        auVar286 = vblendvps_avx(auVar311,auVar286,auVar20);
        auVar334 = vblendvps_avx(auVar326,auVar32,auVar20);
        local_7a0._0_16_ = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
        local_7a0._16_16_ = auVar172._16_16_;
        auVar172 = vblendvps_avx(auVar362,auVar33,auVar20);
        auVar286 = vsubps_avx(auVar286,local_720);
        auVar32 = vsubps_avx(auVar334,auVar30);
        auVar33 = vsubps_avx(auVar172,auVar29);
        auVar172 = vsubps_avx(auVar30,auVar31);
        fVar214 = auVar32._0_4_;
        fVar194 = auVar29._0_4_;
        fVar241 = auVar32._4_4_;
        fVar196 = auVar29._4_4_;
        auVar46._4_4_ = fVar196 * fVar241;
        auVar46._0_4_ = fVar194 * fVar214;
        fVar331 = auVar32._8_4_;
        fVar240 = auVar29._8_4_;
        auVar46._8_4_ = fVar240 * fVar331;
        fVar215 = auVar32._12_4_;
        fVar212 = auVar29._12_4_;
        auVar46._12_4_ = fVar212 * fVar215;
        fVar321 = auVar32._16_4_;
        fVar158 = auVar29._16_4_;
        auVar46._16_4_ = fVar158 * fVar321;
        fVar298 = auVar32._20_4_;
        fVar217 = auVar29._20_4_;
        auVar46._20_4_ = fVar217 * fVar298;
        fVar359 = auVar32._24_4_;
        fVar219 = auVar29._24_4_;
        auVar46._24_4_ = fVar219 * fVar359;
        auVar46._28_4_ = auVar334._28_4_;
        fVar223 = auVar30._0_4_;
        fVar277 = auVar33._0_4_;
        fVar251 = auVar30._4_4_;
        fVar278 = auVar33._4_4_;
        auVar47._4_4_ = fVar278 * fVar251;
        auVar47._0_4_ = fVar277 * fVar223;
        fVar213 = auVar30._8_4_;
        fVar279 = auVar33._8_4_;
        auVar47._8_4_ = fVar279 * fVar213;
        fVar320 = auVar30._12_4_;
        fVar177 = auVar33._12_4_;
        auVar47._12_4_ = fVar177 * fVar320;
        fVar296 = auVar30._16_4_;
        fVar188 = auVar33._16_4_;
        auVar47._16_4_ = fVar188 * fVar296;
        fVar299 = auVar30._20_4_;
        fVar189 = auVar33._20_4_;
        auVar47._20_4_ = fVar189 * fVar299;
        fVar360 = auVar30._24_4_;
        fVar190 = auVar33._24_4_;
        auVar47._24_4_ = fVar190 * fVar360;
        auVar47._28_4_ = auVar326._28_4_;
        auVar334 = vsubps_avx(auVar47,auVar46);
        fVar234 = local_720._0_4_;
        fVar253 = local_720._4_4_;
        auVar48._4_4_ = fVar278 * fVar253;
        auVar48._0_4_ = fVar277 * fVar234;
        fVar332 = local_720._8_4_;
        auVar48._8_4_ = fVar279 * fVar332;
        fVar294 = local_720._12_4_;
        auVar48._12_4_ = fVar177 * fVar294;
        fVar297 = local_720._16_4_;
        auVar48._16_4_ = fVar188 * fVar297;
        fVar222 = local_720._20_4_;
        auVar48._20_4_ = fVar189 * fVar222;
        fVar155 = local_720._24_4_;
        auVar48._24_4_ = fVar190 * fVar155;
        auVar48._28_4_ = auVar326._28_4_;
        fVar236 = auVar286._0_4_;
        auVar350._0_4_ = fVar194 * fVar236;
        fVar255 = auVar286._4_4_;
        auVar350._4_4_ = fVar196 * fVar255;
        fVar347 = auVar286._8_4_;
        auVar350._8_4_ = fVar240 * fVar347;
        fVar295 = auVar286._12_4_;
        auVar350._12_4_ = fVar212 * fVar295;
        fVar220 = auVar286._16_4_;
        auVar350._16_4_ = fVar158 * fVar220;
        fVar175 = auVar286._20_4_;
        auVar350._20_4_ = fVar217 * fVar175;
        fVar156 = auVar286._24_4_;
        auVar350._24_4_ = fVar219 * fVar156;
        auVar350._28_4_ = 0;
        auVar34 = vsubps_avx(auVar350,auVar48);
        auVar49._4_4_ = fVar251 * fVar255;
        auVar49._0_4_ = fVar223 * fVar236;
        auVar49._8_4_ = fVar213 * fVar347;
        auVar49._12_4_ = fVar320 * fVar295;
        auVar49._16_4_ = fVar296 * fVar220;
        auVar49._20_4_ = fVar299 * fVar175;
        auVar49._24_4_ = fVar360 * fVar156;
        auVar49._28_4_ = auVar326._28_4_;
        auVar50._4_4_ = fVar253 * fVar241;
        auVar50._0_4_ = fVar234 * fVar214;
        auVar50._8_4_ = fVar332 * fVar331;
        auVar50._12_4_ = fVar294 * fVar215;
        auVar50._16_4_ = fVar297 * fVar321;
        auVar50._20_4_ = fVar222 * fVar298;
        auVar50._24_4_ = fVar155 * fVar359;
        auVar50._28_4_ = auVar362._28_4_;
        auVar35 = vsubps_avx(auVar50,auVar49);
        auVar36 = vsubps_avx(auVar29,auVar204);
        fVar238 = auVar35._28_4_ + auVar34._28_4_;
        auVar168._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.0 + auVar334._0_4_ * 0.0;
        auVar168._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.0 + auVar334._4_4_ * 0.0;
        auVar168._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.0 + auVar334._8_4_ * 0.0;
        auVar168._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.0 + auVar334._12_4_ * 0.0;
        auVar168._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.0 + auVar334._16_4_ * 0.0;
        auVar168._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.0 + auVar334._20_4_ * 0.0;
        auVar168._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.0 + auVar334._24_4_ * 0.0;
        auVar168._28_4_ = fVar238 + auVar334._28_4_;
        fVar221 = auVar172._0_4_;
        fVar258 = auVar172._4_4_;
        auVar51._4_4_ = fVar258 * auVar204._4_4_;
        auVar51._0_4_ = fVar221 * auVar204._0_4_;
        fVar149 = auVar172._8_4_;
        auVar51._8_4_ = fVar149 * auVar204._8_4_;
        fVar151 = auVar172._12_4_;
        auVar51._12_4_ = fVar151 * auVar204._12_4_;
        fVar153 = auVar172._16_4_;
        auVar51._16_4_ = fVar153 * auVar204._16_4_;
        fVar274 = auVar172._20_4_;
        auVar51._20_4_ = fVar274 * auVar204._20_4_;
        fVar276 = auVar172._24_4_;
        auVar51._24_4_ = fVar276 * auVar204._24_4_;
        auVar51._28_4_ = fVar238;
        fVar238 = auVar36._0_4_;
        fVar346 = auVar36._4_4_;
        auVar52._4_4_ = auVar31._4_4_ * fVar346;
        auVar52._0_4_ = auVar31._0_4_ * fVar238;
        fVar275 = auVar36._8_4_;
        auVar52._8_4_ = auVar31._8_4_ * fVar275;
        fVar218 = auVar36._12_4_;
        auVar52._12_4_ = auVar31._12_4_ * fVar218;
        fVar322 = auVar36._16_4_;
        auVar52._16_4_ = auVar31._16_4_ * fVar322;
        fVar358 = auVar36._20_4_;
        auVar52._20_4_ = auVar31._20_4_ * fVar358;
        fVar157 = auVar36._24_4_;
        auVar52._24_4_ = auVar31._24_4_ * fVar157;
        auVar52._28_4_ = auVar35._28_4_;
        auVar172 = vsubps_avx(auVar52,auVar51);
        auVar34 = vsubps_avx(local_720,auVar248);
        fVar191 = auVar34._0_4_;
        fVar192 = auVar34._4_4_;
        auVar53._4_4_ = fVar192 * auVar204._4_4_;
        auVar53._0_4_ = fVar191 * auVar204._0_4_;
        fVar193 = auVar34._8_4_;
        auVar53._8_4_ = fVar193 * auVar204._8_4_;
        fVar224 = auVar34._12_4_;
        auVar53._12_4_ = fVar224 * auVar204._12_4_;
        fVar235 = auVar34._16_4_;
        auVar53._16_4_ = fVar235 * auVar204._16_4_;
        fVar237 = auVar34._20_4_;
        auVar53._20_4_ = fVar237 * auVar204._20_4_;
        fVar239 = auVar34._24_4_;
        auVar53._24_4_ = fVar239 * auVar204._24_4_;
        auVar53._28_4_ = auVar204._28_4_;
        auVar54._4_4_ = auVar248._4_4_ * fVar346;
        auVar54._0_4_ = auVar248._0_4_ * fVar238;
        auVar54._8_4_ = auVar248._8_4_ * fVar275;
        auVar54._12_4_ = auVar248._12_4_ * fVar218;
        auVar54._16_4_ = auVar248._16_4_ * fVar322;
        auVar54._20_4_ = auVar248._20_4_ * fVar358;
        auVar54._24_4_ = auVar248._24_4_ * fVar157;
        auVar54._28_4_ = auVar334._28_4_;
        auVar334 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar31._4_4_ * fVar192;
        auVar55._0_4_ = auVar31._0_4_ * fVar191;
        auVar55._8_4_ = auVar31._8_4_ * fVar193;
        auVar55._12_4_ = auVar31._12_4_ * fVar224;
        auVar55._16_4_ = auVar31._16_4_ * fVar235;
        auVar55._20_4_ = auVar31._20_4_ * fVar237;
        auVar55._24_4_ = auVar31._24_4_ * fVar239;
        auVar55._28_4_ = auVar204._28_4_;
        auVar56._4_4_ = auVar248._4_4_ * fVar258;
        auVar56._0_4_ = auVar248._0_4_ * fVar221;
        auVar56._8_4_ = auVar248._8_4_ * fVar149;
        auVar56._12_4_ = auVar248._12_4_ * fVar151;
        auVar56._16_4_ = auVar248._16_4_ * fVar153;
        auVar56._20_4_ = auVar248._20_4_ * fVar274;
        auVar56._24_4_ = auVar248._24_4_ * fVar276;
        auVar56._28_4_ = auVar248._28_4_;
        auVar248 = vsubps_avx(auVar56,auVar55);
        auVar173 = ZEXT864(0) << 0x20;
        auVar230._0_4_ = auVar172._0_4_ * 0.0 + auVar248._0_4_ + auVar334._0_4_ * 0.0;
        auVar230._4_4_ = auVar172._4_4_ * 0.0 + auVar248._4_4_ + auVar334._4_4_ * 0.0;
        auVar230._8_4_ = auVar172._8_4_ * 0.0 + auVar248._8_4_ + auVar334._8_4_ * 0.0;
        auVar230._12_4_ = auVar172._12_4_ * 0.0 + auVar248._12_4_ + auVar334._12_4_ * 0.0;
        auVar230._16_4_ = auVar172._16_4_ * 0.0 + auVar248._16_4_ + auVar334._16_4_ * 0.0;
        auVar230._20_4_ = auVar172._20_4_ * 0.0 + auVar248._20_4_ + auVar334._20_4_ * 0.0;
        auVar230._24_4_ = auVar172._24_4_ * 0.0 + auVar248._24_4_ + auVar334._24_4_ * 0.0;
        auVar230._28_4_ = auVar248._28_4_ + auVar248._28_4_ + auVar334._28_4_;
        auVar172 = vmaxps_avx(auVar168,auVar230);
        auVar172 = vcmpps_avx(auVar172,ZEXT832(0) << 0x20,2);
        auVar181 = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
        auVar181 = vpand_avx(auVar181,local_7a0._0_16_);
        auVar200 = vpmovsxwd_avx(auVar181);
        auVar201 = vpunpckhwd_avx(auVar181,auVar181);
        auVar205._16_16_ = auVar201;
        auVar205._0_16_ = auVar200;
        if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar205 >> 0x7f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar201 >> 0x3f,0) == '\0') &&
            (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar201[0xf]) {
LAB_0108326b:
          auVar148 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar208 = ZEXT3264(auVar205);
          auVar314 = ZEXT3264(local_580);
          auVar304 = ZEXT3264(local_5a0);
        }
        else {
          auVar57._4_4_ = fVar346 * fVar241;
          auVar57._0_4_ = fVar238 * fVar214;
          auVar57._8_4_ = fVar275 * fVar331;
          auVar57._12_4_ = fVar218 * fVar215;
          auVar57._16_4_ = fVar322 * fVar321;
          auVar57._20_4_ = fVar358 * fVar298;
          auVar57._24_4_ = fVar157 * fVar359;
          auVar57._28_4_ = auVar201._12_4_;
          auVar335._0_4_ = fVar221 * fVar277;
          auVar335._4_4_ = fVar258 * fVar278;
          auVar335._8_4_ = fVar149 * fVar279;
          auVar335._12_4_ = fVar151 * fVar177;
          auVar335._16_4_ = fVar153 * fVar188;
          auVar335._20_4_ = fVar274 * fVar189;
          auVar335._24_4_ = fVar276 * fVar190;
          auVar335._28_4_ = 0;
          auVar172 = vsubps_avx(auVar335,auVar57);
          auVar58._4_4_ = fVar192 * fVar278;
          auVar58._0_4_ = fVar191 * fVar277;
          auVar58._8_4_ = fVar193 * fVar279;
          auVar58._12_4_ = fVar224 * fVar177;
          auVar58._16_4_ = fVar235 * fVar188;
          auVar58._20_4_ = fVar237 * fVar189;
          auVar58._24_4_ = fVar239 * fVar190;
          auVar58._28_4_ = auVar33._28_4_;
          auVar59._4_4_ = fVar346 * fVar255;
          auVar59._0_4_ = fVar238 * fVar236;
          auVar59._8_4_ = fVar275 * fVar347;
          auVar59._12_4_ = fVar218 * fVar295;
          auVar59._16_4_ = fVar322 * fVar220;
          auVar59._20_4_ = fVar358 * fVar175;
          auVar59._24_4_ = fVar157 * fVar156;
          auVar59._28_4_ = auVar36._28_4_;
          auVar31 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar258 * fVar255;
          auVar60._0_4_ = fVar221 * fVar236;
          auVar60._8_4_ = fVar149 * fVar347;
          auVar60._12_4_ = fVar151 * fVar295;
          auVar60._16_4_ = fVar153 * fVar220;
          auVar60._20_4_ = fVar274 * fVar175;
          auVar60._24_4_ = fVar276 * fVar156;
          auVar60._28_4_ = auVar168._28_4_;
          auVar61._4_4_ = fVar192 * fVar241;
          auVar61._0_4_ = fVar191 * fVar214;
          auVar61._8_4_ = fVar193 * fVar331;
          auVar61._12_4_ = fVar224 * fVar215;
          auVar61._16_4_ = fVar235 * fVar321;
          auVar61._20_4_ = fVar237 * fVar298;
          auVar61._24_4_ = fVar239 * fVar359;
          auVar61._28_4_ = auVar32._28_4_;
          auVar204 = vsubps_avx(auVar61,auVar60);
          auVar287._0_4_ = auVar172._0_4_ * 0.0 + auVar204._0_4_ + auVar31._0_4_ * 0.0;
          auVar287._4_4_ = auVar172._4_4_ * 0.0 + auVar204._4_4_ + auVar31._4_4_ * 0.0;
          auVar287._8_4_ = auVar172._8_4_ * 0.0 + auVar204._8_4_ + auVar31._8_4_ * 0.0;
          auVar287._12_4_ = auVar172._12_4_ * 0.0 + auVar204._12_4_ + auVar31._12_4_ * 0.0;
          auVar287._16_4_ = auVar172._16_4_ * 0.0 + auVar204._16_4_ + auVar31._16_4_ * 0.0;
          auVar287._20_4_ = auVar172._20_4_ * 0.0 + auVar204._20_4_ + auVar31._20_4_ * 0.0;
          auVar287._24_4_ = auVar172._24_4_ * 0.0 + auVar204._24_4_ + auVar31._24_4_ * 0.0;
          auVar287._28_4_ = auVar32._28_4_ + auVar204._28_4_ + auVar168._28_4_;
          auVar248 = vrcpps_avx(auVar287);
          fVar214 = auVar248._0_4_;
          fVar236 = auVar248._4_4_;
          auVar62._4_4_ = auVar287._4_4_ * fVar236;
          auVar62._0_4_ = auVar287._0_4_ * fVar214;
          fVar238 = auVar248._8_4_;
          auVar62._8_4_ = auVar287._8_4_ * fVar238;
          fVar241 = auVar248._12_4_;
          auVar62._12_4_ = auVar287._12_4_ * fVar241;
          fVar255 = auVar248._16_4_;
          auVar62._16_4_ = auVar287._16_4_ * fVar255;
          fVar346 = auVar248._20_4_;
          auVar62._20_4_ = auVar287._20_4_ * fVar346;
          fVar331 = auVar248._24_4_;
          auVar62._24_4_ = auVar287._24_4_ * fVar331;
          auVar62._28_4_ = auVar36._28_4_;
          auVar336._8_4_ = 0x3f800000;
          auVar336._0_8_ = &DAT_3f8000003f800000;
          auVar336._12_4_ = 0x3f800000;
          auVar336._16_4_ = 0x3f800000;
          auVar336._20_4_ = 0x3f800000;
          auVar336._24_4_ = 0x3f800000;
          auVar336._28_4_ = 0x3f800000;
          auVar334 = vsubps_avx(auVar336,auVar62);
          fVar214 = auVar334._0_4_ * fVar214 + fVar214;
          fVar236 = auVar334._4_4_ * fVar236 + fVar236;
          fVar238 = auVar334._8_4_ * fVar238 + fVar238;
          fVar241 = auVar334._12_4_ * fVar241 + fVar241;
          fVar255 = auVar334._16_4_ * fVar255 + fVar255;
          fVar346 = auVar334._20_4_ * fVar346 + fVar346;
          fVar331 = auVar334._24_4_ * fVar331 + fVar331;
          auVar63._4_4_ =
               (auVar172._4_4_ * fVar253 + auVar31._4_4_ * fVar251 + auVar204._4_4_ * fVar196) *
               fVar236;
          auVar63._0_4_ =
               (auVar172._0_4_ * fVar234 + auVar31._0_4_ * fVar223 + auVar204._0_4_ * fVar194) *
               fVar214;
          auVar63._8_4_ =
               (auVar172._8_4_ * fVar332 + auVar31._8_4_ * fVar213 + auVar204._8_4_ * fVar240) *
               fVar238;
          auVar63._12_4_ =
               (auVar172._12_4_ * fVar294 + auVar31._12_4_ * fVar320 + auVar204._12_4_ * fVar212) *
               fVar241;
          auVar63._16_4_ =
               (auVar172._16_4_ * fVar297 + auVar31._16_4_ * fVar296 + auVar204._16_4_ * fVar158) *
               fVar255;
          auVar63._20_4_ =
               (auVar172._20_4_ * fVar222 + auVar31._20_4_ * fVar299 + auVar204._20_4_ * fVar217) *
               fVar346;
          auVar63._24_4_ =
               (auVar172._24_4_ * fVar155 + auVar31._24_4_ * fVar360 + auVar204._24_4_ * fVar219) *
               fVar331;
          auVar63._28_4_ = local_720._28_4_ + auVar286._28_4_ + auVar29._28_4_;
          auVar200 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
          auVar206._16_16_ = auVar200;
          auVar206._0_16_ = auVar200;
          auVar172 = vcmpps_avx(auVar206,auVar63,2);
          uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar246._4_4_ = uVar289;
          auVar246._0_4_ = uVar289;
          auVar246._8_4_ = uVar289;
          auVar246._12_4_ = uVar289;
          auVar246._16_4_ = uVar289;
          auVar246._20_4_ = uVar289;
          auVar246._24_4_ = uVar289;
          auVar246._28_4_ = uVar289;
          auVar29 = vcmpps_avx(auVar63,auVar246,2);
          auVar172 = vandps_avx(auVar29,auVar172);
          auVar200 = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
          auVar181 = vpand_avx(auVar181,auVar200);
          auVar200 = vpmovsxwd_avx(auVar181);
          auVar201 = vpshufd_avx(auVar181,0xee);
          auVar201 = vpmovsxwd_avx(auVar201);
          auVar205._16_16_ = auVar201;
          auVar205._0_16_ = auVar200;
          if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar205 >> 0x7f,0) == '\0') &&
                (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar201 >> 0x3f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar201[0xf]) goto LAB_0108326b;
          auVar172 = vcmpps_avx(ZEXT832(0) << 0x20,auVar287,4);
          auVar200 = vpackssdw_avx(auVar172._0_16_,auVar172._16_16_);
          auVar181 = vpand_avx(auVar181,auVar200);
          auVar200 = vpmovsxwd_avx(auVar181);
          auVar181 = vpunpckhwd_avx(auVar181,auVar181);
          auVar208 = ZEXT1664(auVar181);
          auVar266._16_16_ = auVar181;
          auVar266._0_16_ = auVar200;
          auVar148 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar314 = ZEXT3264(local_580);
          auVar304 = ZEXT3264(local_5a0);
          if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar266 >> 0x7f,0) != '\0') ||
                (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar181 >> 0x3f,0) != '\0') ||
              (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar181[0xf] < '\0') {
            auVar207._0_4_ = auVar168._0_4_ * fVar214;
            auVar207._4_4_ = auVar168._4_4_ * fVar236;
            auVar207._8_4_ = auVar168._8_4_ * fVar238;
            auVar207._12_4_ = auVar168._12_4_ * fVar241;
            auVar207._16_4_ = auVar168._16_4_ * fVar255;
            auVar207._20_4_ = auVar168._20_4_ * fVar346;
            auVar207._24_4_ = auVar168._24_4_ * fVar331;
            auVar207._28_4_ = 0;
            auVar64._4_4_ = auVar230._4_4_ * fVar236;
            auVar64._0_4_ = auVar230._0_4_ * fVar214;
            auVar64._8_4_ = auVar230._8_4_ * fVar238;
            auVar64._12_4_ = auVar230._12_4_ * fVar241;
            auVar64._16_4_ = auVar230._16_4_ * fVar255;
            auVar64._20_4_ = auVar230._20_4_ * fVar346;
            auVar64._24_4_ = auVar230._24_4_ * fVar331;
            auVar64._28_4_ = auVar334._28_4_ + auVar248._28_4_;
            auVar247._8_4_ = 0x3f800000;
            auVar247._0_8_ = &DAT_3f8000003f800000;
            auVar247._12_4_ = 0x3f800000;
            auVar247._16_4_ = 0x3f800000;
            auVar247._20_4_ = 0x3f800000;
            auVar247._24_4_ = 0x3f800000;
            auVar247._28_4_ = 0x3f800000;
            auVar172 = vsubps_avx(auVar247,auVar207);
            auVar172 = vblendvps_avx(auVar172,auVar207,auVar20);
            auVar314 = ZEXT3264(auVar172);
            auVar172 = vsubps_avx(auVar247,auVar64);
            auVar208 = ZEXT3264(auVar172);
            _local_360 = vblendvps_avx(auVar172,auVar64,auVar20);
            auVar148 = ZEXT3264(auVar266);
            auVar304 = ZEXT3264(auVar63);
          }
        }
        auVar351 = ZEXT3264(_local_660);
        local_580 = auVar314._0_32_;
        local_5a0 = auVar304._0_32_;
        auVar248 = auVar148._0_32_;
        auVar172 = local_5a0;
        auVar29 = local_580;
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar248 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar248 >> 0x7f,0) == '\0') &&
              (auVar148 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar248 >> 0xbf,0) == '\0') &&
            (auVar148 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar148[0x1f]) {
          bVar131 = false;
        }
        else {
          auVar31 = vsubps_avx(local_7c0,auVar141);
          fVar223 = auVar141._0_4_ + auVar314._0_4_ * auVar31._0_4_;
          fVar234 = auVar141._4_4_ + auVar314._4_4_ * auVar31._4_4_;
          fVar236 = auVar141._8_4_ + auVar314._8_4_ * auVar31._8_4_;
          fVar238 = auVar141._12_4_ + auVar314._12_4_ * auVar31._12_4_;
          fVar241 = auVar141._16_4_ + auVar314._16_4_ * auVar31._16_4_;
          fVar251 = auVar141._20_4_ + auVar314._20_4_ * auVar31._20_4_;
          fVar253 = auVar141._24_4_ + auVar314._24_4_ * auVar31._24_4_;
          fVar255 = auVar31._28_4_ + 0.0;
          fVar214 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
          auVar65._4_4_ = (fVar234 + fVar234) * fVar214;
          auVar65._0_4_ = (fVar223 + fVar223) * fVar214;
          auVar65._8_4_ = (fVar236 + fVar236) * fVar214;
          auVar65._12_4_ = (fVar238 + fVar238) * fVar214;
          auVar65._16_4_ = (fVar241 + fVar241) * fVar214;
          auVar65._20_4_ = (fVar251 + fVar251) * fVar214;
          auVar65._24_4_ = (fVar253 + fVar253) * fVar214;
          auVar65._28_4_ = fVar255 + fVar255;
          auVar31 = vcmpps_avx(local_5a0,auVar65,6);
          auVar141 = auVar248 & auVar31;
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0x7f,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0xbf,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar141[0x1f] < '\0') {
            local_1e0 = vandps_avx(auVar31,auVar248);
            local_280._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_280._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_278 = (float)uStack_358 + (float)uStack_358 + -1.0;
            fStack_274 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            fStack_270 = (float)uStack_350 + (float)uStack_350 + -1.0;
            fStack_26c = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            fStack_268 = (float)uStack_348 + (float)uStack_348 + -1.0;
            fStack_264 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_240 = 0;
            uStack_228 = uStack_6a8;
            uStack_218 = local_4b0._8_8_;
            local_4c0._8_8_ = auVar361._8_8_;
            uStack_208 = local_4c0._8_8_;
            uStack_1f8 = local_4d0._8_8_;
            local_360._4_4_ = local_280._4_4_;
            local_360._0_4_ = local_280._0_4_;
            uStack_358._0_4_ = fStack_278;
            uStack_358._4_4_ = fStack_274;
            uStack_350._0_4_ = fStack_270;
            uStack_350._4_4_ = fStack_26c;
            auVar166 = _local_360;
            uStack_348._0_4_ = fStack_268;
            uStack_348._4_4_ = fStack_264;
            auVar248 = _local_360;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              _local_360 = auVar248;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar131 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar184._0_4_ = 1.0 / (float)(int)uVar14;
                auVar184._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar181 = vshufps_avx(auVar184,auVar184,0);
                local_1c0[0] = auVar181._0_4_ * (auVar314._0_4_ + 0.0);
                local_1c0[1] = auVar181._4_4_ * (auVar314._4_4_ + 1.0);
                local_1c0[2] = auVar181._8_4_ * (auVar314._8_4_ + 2.0);
                local_1c0[3] = auVar181._12_4_ * (auVar314._12_4_ + 3.0);
                fStack_1b0 = auVar181._0_4_ * (auVar314._16_4_ + 4.0);
                fStack_1ac = auVar181._4_4_ * (auVar314._20_4_ + 5.0);
                fStack_1a8 = auVar181._8_4_ * (auVar314._24_4_ + 6.0);
                fStack_1a4 = auVar314._28_4_ + 7.0;
                uStack_350 = auVar166._16_8_;
                uStack_348 = auVar248._24_8_;
                local_1a0 = local_360;
                uStack_198 = uStack_358;
                uStack_190 = uStack_350;
                uStack_188 = uStack_348;
                local_180 = local_5a0;
                iVar126 = vmovmskps_avx(local_1e0);
                uVar133 = CONCAT44((int)((ulong)lVar132 >> 0x20),iVar126);
                uVar128 = 0;
                if (uVar133 != 0) {
                  for (; (uVar133 >> uVar128 & 1) == 0; uVar128 = uVar128 + 1) {
                  }
                }
                bVar131 = iVar126 != 0;
                if (bVar131) {
                  _local_740 = vshufps_avx(ZEXT416(uVar129),ZEXT416(uVar129),0);
                  _auStack_730 = auVar30._16_16_;
                  _local_5c0 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
                  auStack_5b0 = auVar228._16_16_;
                  _auStack_630 = auVar203._16_16_;
                  uStack_638 = local_4b0._8_8_;
                  local_640 = (undefined1  [8])local_4b0._0_8_;
                  uStack_758 = local_4d0._8_8_;
                  local_760 = (undefined1  [8])local_4d0._0_8_;
                  local_780 = (float)*local_6a0;
                  fStack_77c = (float)((ulong)*local_6a0 >> 0x20);
                  fStack_778 = (float)local_6a0[1];
                  fStack_774 = (float)((ulong)local_6a0[1] >> 0x20);
                  fStack_818 = auVar361._8_4_;
                  fStack_814 = auVar361._12_4_;
                  _local_300 = *pauVar9;
                  local_2a0 = local_580;
                  local_260 = local_5a0;
                  local_23c = uVar14;
                  local_230 = local_6b0;
                  local_220 = local_4b0._0_8_;
                  local_210 = auVar361._0_8_;
                  local_200 = local_4d0._0_8_;
                  do {
                    uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3e0 = local_1c0[uVar128];
                    local_3d0 = *(undefined4 *)((long)&local_1a0 + uVar128 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar128 * 4);
                    fVar209 = 1.0 - local_3e0;
                    fVar195 = local_3e0 * 3.0;
                    auVar181 = ZEXT416((uint)((fVar209 * -2.0 * local_3e0 + local_3e0 * local_3e0) *
                                             0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar200 = ZEXT416((uint)(((fVar209 + fVar209) * (fVar195 + 2.0) +
                                              fVar209 * fVar209 * -3.0) * 0.5));
                    auVar200 = vshufps_avx(auVar200,auVar200,0);
                    auVar201 = ZEXT416((uint)(((local_3e0 + local_3e0) * (fVar195 + -5.0) +
                                              local_3e0 * fVar195) * 0.5));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    local_690.context = context->user;
                    auVar202 = ZEXT416((uint)((local_3e0 * (fVar209 + fVar209) - fVar209 * fVar209)
                                             * 0.5));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    auVar185._0_4_ =
                         auVar202._0_4_ * (float)local_6b0._0_4_ +
                         auVar201._0_4_ * (float)local_640._0_4_ +
                         auVar181._0_4_ * (float)local_760._0_4_ + auVar200._0_4_ * local_820;
                    auVar185._4_4_ =
                         auVar202._4_4_ * (float)local_6b0._4_4_ +
                         auVar201._4_4_ * (float)local_640._4_4_ +
                         auVar181._4_4_ * (float)local_760._4_4_ + auVar200._4_4_ * fStack_81c;
                    auVar185._8_4_ =
                         auVar202._8_4_ * (float)uStack_6a8 +
                         auVar201._8_4_ * (float)uStack_638 +
                         auVar181._8_4_ * (float)uStack_758 + auVar200._8_4_ * fStack_818;
                    auVar185._12_4_ =
                         auVar202._12_4_ * uStack_6a8._4_4_ +
                         auVar201._12_4_ * uStack_638._4_4_ +
                         auVar181._12_4_ * uStack_758._4_4_ + auVar200._12_4_ * fStack_814;
                    local_410 = (RTCHitN  [16])vshufps_avx(auVar185,auVar185,0);
                    local_400 = vshufps_avx(auVar185,auVar185,0x55);
                    auVar208 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar185,auVar185,0xaa);
                    local_3c0 = local_5c0;
                    uStack_3b8 = uStack_5b8;
                    local_3b0 = local_740;
                    uStack_3a8 = uStack_738;
                    vcmpps_avx(auVar173._0_32_,auVar173._0_32_,0xf);
                    uStack_39c = (local_690.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_690.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_840 = CONCAT44(fStack_77c,local_780);
                    uStack_838 = CONCAT44(fStack_774,fStack_778);
                    local_690.valid = (int *)&local_840;
                    local_690.geometryUserPtr = pGVar15->userPtr;
                    local_690.hit = local_410;
                    local_690.N = 4;
                    local_7a0._0_8_ = uVar133;
                    local_7c0._0_8_ = uVar128;
                    local_720._0_4_ = uVar289;
                    local_690.ray = (RTCRayN *)ray;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar208 = ZEXT1664(local_400);
                      (*pGVar15->occlusionFilterN)(&local_690);
                      auVar351 = ZEXT3264(_local_660);
                      auVar304 = ZEXT3264(local_5a0);
                      auVar314 = ZEXT3264(local_580);
                      auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar133 = local_7a0._0_8_;
                      uVar128 = local_7c0._0_8_;
                      uVar289 = local_720._0_4_;
                      fVar323 = (float)local_700._0_4_;
                      fVar327 = (float)local_700._4_4_;
                      fVar329 = fStack_6f8;
                      fVar330 = fStack_6f4;
                      fVar324 = fStack_6f0;
                      fVar210 = fStack_6ec;
                      fVar328 = fStack_6e8;
                      fVar216 = fStack_6e4;
                    }
                    auVar114._8_8_ = uStack_838;
                    auVar114._0_8_ = local_840;
                    if (auVar114 == (undefined1  [16])0x0) {
                      auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar181 = auVar181 ^ _DAT_01febe20;
                      fVar176 = (float)local_6e0._0_4_;
                      fVar260 = (float)local_6e0._4_4_;
                      fVar270 = fStack_6d8;
                      fVar272 = fStack_6d4;
                      fVar195 = fStack_6d0;
                      fVar209 = fStack_6cc;
                      fVar211 = fStack_6c8;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        (*p_Var18)(&local_690);
                        auVar351 = ZEXT3264(_local_660);
                        auVar304 = ZEXT3264(local_5a0);
                        auVar314 = ZEXT3264(local_580);
                        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar133 = local_7a0._0_8_;
                        uVar128 = local_7c0._0_8_;
                        uVar289 = local_720._0_4_;
                        fVar323 = (float)local_700._0_4_;
                        fVar327 = (float)local_700._4_4_;
                        fVar329 = fStack_6f8;
                        fVar330 = fStack_6f4;
                        fVar324 = fStack_6f0;
                        fVar210 = fStack_6ec;
                        fVar328 = fStack_6e8;
                        fVar216 = fStack_6e4;
                      }
                      auVar115._8_8_ = uStack_838;
                      auVar115._0_8_ = local_840;
                      auVar200 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                      auVar181 = auVar200 ^ _DAT_01febe20;
                      auVar186._8_4_ = 0xff800000;
                      auVar186._0_8_ = 0xff800000ff800000;
                      auVar186._12_4_ = 0xff800000;
                      auVar200 = vblendvps_avx(auVar186,*(undefined1 (*) [16])(local_690.ray + 0x80)
                                               ,auVar200);
                      *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar200;
                      fVar176 = (float)local_6e0._0_4_;
                      fVar260 = (float)local_6e0._4_4_;
                      fVar270 = fStack_6d8;
                      fVar272 = fStack_6d4;
                      fVar195 = fStack_6d0;
                      fVar209 = fStack_6cc;
                      fVar211 = fStack_6c8;
                    }
                    auVar165._8_8_ = 0x100000001;
                    auVar165._0_8_ = 0x100000001;
                    auVar172 = auVar304._0_32_;
                    auVar29 = auVar314._0_32_;
                    if ((auVar165 & auVar181) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar289;
                    uVar133 = uVar133 ^ 1L << (uVar128 & 0x3f);
                    uVar128 = 0;
                    if (uVar133 != 0) {
                      for (; (uVar133 >> uVar128 & 1) == 0; uVar128 = uVar128 + 1) {
                      }
                    }
                    bVar131 = uVar133 != 0;
                  } while (bVar131);
                }
              }
              goto LAB_0108233d;
            }
          }
          bVar131 = false;
        }
LAB_0108233d:
        local_580 = auVar29;
        local_5a0 = auVar172;
        auVar181 = local_800._0_16_;
      }
      auVar173 = ZEXT1664(auVar181);
      if (8 < (int)uVar14) {
        _local_300 = vpshufd_avx(ZEXT416(uVar14),0);
        auVar181 = vshufps_avx(auVar181,auVar181,0);
        register0x00001210 = auVar181;
        _local_320 = auVar181;
        auVar181 = vpermilps_avx(_local_7e0,0);
        local_340._16_16_ = auVar181;
        local_340._0_16_ = auVar181;
        auVar140._0_4_ = 1.0 / (float)local_460._0_4_;
        auVar140._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar181 = vshufps_avx(auVar140,auVar140,0);
        register0x00001210 = auVar181;
        _local_e0 = auVar181;
        local_2c0 = vshufps_avx(ZEXT416((uint)local_828),ZEXT416((uint)local_828),0);
        local_5d0 = vshufps_avx(ZEXT416((uint)local_5d0._0_4_),ZEXT416((uint)local_5d0._0_4_),0);
        auVar148 = ZEXT1664(local_5d0);
        lVar134 = 8;
        fVar214 = (float)local_620._0_4_;
        fVar223 = (float)local_620._4_4_;
        fVar234 = fStack_618;
        fVar236 = fStack_614;
        fVar238 = fStack_610;
        fVar241 = fStack_60c;
        fVar251 = fStack_608;
        do {
          pauVar10 = (undefined1 (*) [28])(catmullrom_basis0 + lVar134 * 4 + lVar19);
          fVar253 = *(float *)*pauVar10;
          fVar255 = *(float *)(*pauVar10 + 4);
          fVar346 = *(float *)(*pauVar10 + 8);
          fVar331 = *(float *)(*pauVar10 + 0xc);
          fVar213 = *(float *)(*pauVar10 + 0x10);
          fVar332 = *(float *)(*pauVar10 + 0x14);
          fVar347 = *(float *)(*pauVar10 + 0x18);
          auVar124 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar19 + 0x22307f0 + lVar134 * 4);
          fVar275 = *(float *)*pauVar10;
          fVar215 = *(float *)(*pauVar10 + 4);
          fVar320 = *(float *)(*pauVar10 + 8);
          fVar294 = *(float *)(*pauVar10 + 0xc);
          fVar295 = *(float *)(*pauVar10 + 0x10);
          fVar218 = *(float *)(*pauVar10 + 0x14);
          fVar321 = *(float *)(*pauVar10 + 0x18);
          auVar123 = *pauVar10;
          pfVar1 = (float *)(lVar19 + 0x2230c74 + lVar134 * 4);
          fVar296 = *pfVar1;
          fVar297 = pfVar1[1];
          fVar220 = pfVar1[2];
          fVar322 = pfVar1[3];
          fVar298 = pfVar1[4];
          fVar299 = pfVar1[5];
          fVar222 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar19 + 0x22310f8 + lVar134 * 4);
          fVar175 = *(float *)*pauVar10;
          fVar358 = *(float *)(*pauVar10 + 4);
          fVar359 = *(float *)(*pauVar10 + 8);
          fVar360 = *(float *)(*pauVar10 + 0xc);
          fVar155 = *(float *)(*pauVar10 + 0x10);
          fVar156 = *(float *)(*pauVar10 + 0x14);
          fVar157 = *(float *)(*pauVar10 + 0x18);
          auVar121 = *pauVar10;
          fVar196 = auVar208._28_4_;
          fVar194 = fVar196 + *(float *)pauVar10[1];
          fVar217 = auVar351._0_4_;
          fVar219 = auVar351._4_4_;
          fVar221 = auVar351._8_4_;
          fVar258 = auVar351._12_4_;
          fVar149 = auVar351._16_4_;
          fVar151 = auVar351._20_4_;
          fVar153 = auVar351._24_4_;
          fStack_844 = fVar196 + fVar196 + auVar148._28_4_;
          fVar240 = fVar196 + fVar194;
          local_7a0._0_4_ =
               (float)local_440._0_4_ * fVar253 +
               fVar217 * fVar275 +
               (float)local_600._0_4_ * fVar296 + (float)local_520._0_4_ * fVar175;
          local_7a0._4_4_ =
               (float)local_440._4_4_ * fVar255 +
               fVar219 * fVar215 +
               (float)local_600._4_4_ * fVar297 + (float)local_520._4_4_ * fVar358;
          local_7a0._8_4_ =
               fStack_438 * fVar346 +
               fVar221 * fVar320 + fStack_5f8 * fVar220 + fStack_518 * fVar359;
          local_7a0._12_4_ =
               fStack_434 * fVar331 +
               fVar258 * fVar294 + fStack_5f4 * fVar322 + fStack_514 * fVar360;
          local_7a0._16_4_ =
               fStack_430 * fVar213 +
               fVar149 * fVar295 + fStack_5f0 * fVar298 + fStack_510 * fVar155;
          local_7a0._20_4_ =
               fStack_42c * fVar332 +
               fVar151 * fVar218 + fStack_5ec * fVar299 + fStack_50c * fVar156;
          local_7a0._24_4_ =
               fStack_428 * fVar347 +
               fVar153 * fVar321 + fStack_5e8 * fVar222 + fStack_508 * fVar157;
          local_7a0._28_4_ = fVar194 + fStack_844;
          local_800._0_4_ =
               (float)local_100._0_4_ * fVar253 +
               fVar176 * fVar275 + fVar214 * fVar296 + fVar323 * fVar175;
          local_800._4_4_ =
               (float)local_100._4_4_ * fVar255 +
               fVar260 * fVar215 + fVar223 * fVar297 + fVar327 * fVar358;
          local_800._8_4_ =
               fStack_f8 * fVar346 + fVar270 * fVar320 + fVar234 * fVar220 + fVar329 * fVar359;
          local_800._12_4_ =
               fStack_f4 * fVar331 + fVar272 * fVar294 + fVar236 * fVar322 + fVar330 * fVar360;
          local_800._16_4_ =
               fStack_f0 * fVar213 + fVar195 * fVar295 + fVar238 * fVar298 + fVar324 * fVar155;
          local_800._20_4_ =
               fStack_ec * fVar332 + fVar209 * fVar218 + fVar241 * fVar299 + fVar210 * fVar156;
          local_800._24_4_ =
               fStack_e8 * fVar347 + fVar211 * fVar321 + fVar251 * fVar222 + fVar328 * fVar157;
          local_800._28_4_ = fStack_844 + fVar196 + fVar196 + auVar173._28_4_;
          local_860._0_4_ =
               (float)local_a0._0_4_ * fVar253 +
               fVar275 * (float)local_140._0_4_ +
               (float)local_80._0_4_ * fVar296 + fVar175 * (float)local_120._0_4_;
          local_860._4_4_ =
               (float)local_a0._4_4_ * fVar255 +
               fVar215 * (float)local_140._4_4_ +
               (float)local_80._4_4_ * fVar297 + fVar358 * (float)local_120._4_4_;
          fStack_858 = fStack_98 * fVar346 +
                       fVar320 * fStack_138 + fStack_78 * fVar220 + fVar359 * fStack_118;
          fStack_854 = fStack_94 * fVar331 +
                       fVar294 * fStack_134 + fStack_74 * fVar322 + fVar360 * fStack_114;
          fStack_850 = fStack_90 * fVar213 +
                       fVar295 * fStack_130 + fStack_70 * fVar298 + fVar155 * fStack_110;
          fStack_84c = fStack_8c * fVar332 +
                       fVar218 * fStack_12c + fStack_6c * fVar299 + fVar156 * fStack_10c;
          fStack_848 = fStack_88 * fVar347 +
                       fVar321 * fStack_128 + fStack_68 * fVar222 + fVar157 * fStack_108;
          fStack_844 = fStack_844 + fVar240;
          pauVar11 = (undefined1 (*) [32])(catmullrom_basis1 + lVar134 * 4 + lVar19);
          auVar166 = *(undefined1 (*) [24])*pauVar11;
          pfVar1 = (float *)(lVar19 + 0x2232c10 + lVar134 * 4);
          fVar275 = *pfVar1;
          fVar215 = pfVar1[1];
          fVar320 = pfVar1[2];
          fVar294 = pfVar1[3];
          fVar295 = pfVar1[4];
          fVar218 = pfVar1[5];
          fVar321 = pfVar1[6];
          auVar172 = *(undefined1 (*) [32])(lVar19 + 0x2233094 + lVar134 * 4);
          auVar148 = ZEXT3264(auVar172);
          pfVar2 = (float *)(lVar19 + 0x2233518 + lVar134 * 4);
          fVar175 = *pfVar2;
          fVar358 = pfVar2[1];
          fVar359 = pfVar2[2];
          fVar360 = pfVar2[3];
          fVar155 = pfVar2[4];
          fVar156 = pfVar2[5];
          fVar157 = pfVar2[6];
          fVar253 = auVar172._0_4_;
          fVar255 = auVar172._4_4_;
          fVar346 = auVar172._8_4_;
          fVar331 = auVar172._12_4_;
          fVar213 = auVar172._16_4_;
          fVar332 = auVar172._20_4_;
          fVar347 = auVar172._24_4_;
          fVar194 = fStack_5e4 + fStack_5e4 + fVar240;
          local_7e0._0_4_ = auVar166._0_4_;
          local_7e0._4_4_ = auVar166._4_4_;
          auStack_7d8._0_4_ = auVar166._8_4_;
          auStack_7d8._4_4_ = auVar166._12_4_;
          fStack_7d0 = auVar166._16_4_;
          fStack_7cc = auVar166._20_4_;
          fStack_7c8 = (float)*(undefined8 *)(*pauVar11 + 0x18);
          auVar267._0_4_ =
               (float)local_440._0_4_ * (float)local_7e0._0_4_ +
               fVar217 * fVar275 +
               (float)local_600._0_4_ * fVar253 + (float)local_520._0_4_ * fVar175;
          auVar267._4_4_ =
               (float)local_440._4_4_ * (float)local_7e0._4_4_ +
               fVar219 * fVar215 +
               (float)local_600._4_4_ * fVar255 + (float)local_520._4_4_ * fVar358;
          auVar267._8_4_ =
               fStack_438 * (float)auStack_7d8._0_4_ +
               fVar221 * fVar320 + fStack_5f8 * fVar346 + fStack_518 * fVar359;
          auVar267._12_4_ =
               fStack_434 * (float)auStack_7d8._4_4_ +
               fVar258 * fVar294 + fStack_5f4 * fVar331 + fStack_514 * fVar360;
          auVar267._16_4_ =
               fStack_430 * fStack_7d0 +
               fVar149 * fVar295 + fStack_5f0 * fVar213 + fStack_510 * fVar155;
          auVar267._20_4_ =
               fStack_42c * fStack_7cc +
               fVar151 * fVar218 + fStack_5ec * fVar332 + fStack_50c * fVar156;
          auVar267._24_4_ =
               fStack_428 * fStack_7c8 +
               fVar153 * fVar321 + fStack_5e8 * fVar347 + fStack_508 * fVar157;
          auVar267._28_4_ = fStack_5e4 + pfVar2[7] + fVar194;
          auVar249._0_4_ =
               (float)local_100._0_4_ * (float)local_7e0._0_4_ +
               fVar176 * fVar275 + fVar214 * fVar253 + fVar323 * fVar175;
          auVar249._4_4_ =
               (float)local_100._4_4_ * (float)local_7e0._4_4_ +
               fVar260 * fVar215 + fVar223 * fVar255 + fVar327 * fVar358;
          auVar249._8_4_ =
               fStack_f8 * (float)auStack_7d8._0_4_ +
               fVar270 * fVar320 + fVar234 * fVar346 + fVar329 * fVar359;
          auVar249._12_4_ =
               fStack_f4 * (float)auStack_7d8._4_4_ +
               fVar272 * fVar294 + fVar236 * fVar331 + fVar330 * fVar360;
          auVar249._16_4_ =
               fStack_f0 * fStack_7d0 + fVar195 * fVar295 + fVar238 * fVar213 + fVar324 * fVar155;
          auVar249._20_4_ =
               fStack_ec * fStack_7cc + fVar209 * fVar218 + fVar241 * fVar332 + fVar210 * fVar156;
          auVar249._24_4_ =
               fStack_e8 * fStack_7c8 + fVar211 * fVar321 + fVar251 * fVar347 + fVar328 * fVar157;
          auVar249._28_4_ = fVar194 + fStack_5e4 + fStack_5e4 + auVar351._28_4_;
          auVar288._0_4_ =
               fVar275 * (float)local_140._0_4_ +
               (float)local_80._0_4_ * fVar253 + fVar175 * (float)local_120._0_4_ +
               (float)local_7e0._0_4_ * (float)local_a0._0_4_;
          auVar288._4_4_ =
               fVar215 * (float)local_140._4_4_ +
               (float)local_80._4_4_ * fVar255 + fVar358 * (float)local_120._4_4_ +
               (float)local_7e0._4_4_ * (float)local_a0._4_4_;
          auVar288._8_4_ =
               fVar320 * fStack_138 + fStack_78 * fVar346 + fVar359 * fStack_118 +
               (float)auStack_7d8._0_4_ * fStack_98;
          auVar288._12_4_ =
               fVar294 * fStack_134 + fStack_74 * fVar331 + fVar360 * fStack_114 +
               (float)auStack_7d8._4_4_ * fStack_94;
          auVar288._16_4_ =
               fVar295 * fStack_130 + fStack_70 * fVar213 + fVar155 * fStack_110 +
               fStack_7d0 * fStack_90;
          auVar288._20_4_ =
               fVar218 * fStack_12c + fStack_6c * fVar332 + fVar156 * fStack_10c +
               fStack_7cc * fStack_8c;
          auVar288._24_4_ =
               fVar321 * fStack_128 + fStack_68 * fVar347 + fVar157 * fStack_108 +
               fStack_7c8 * fStack_88;
          auVar288._28_4_ = fStack_5e4 + fStack_5e4 + pfVar2[7] + fVar194;
          auVar29 = vsubps_avx(auVar267,local_7a0);
          auVar248 = vsubps_avx(auVar249,local_800);
          auVar208 = ZEXT3264(auVar248);
          fVar238 = auVar29._0_4_;
          fVar241 = auVar29._4_4_;
          auVar66._4_4_ = fVar241 * local_800._4_4_;
          auVar66._0_4_ = fVar238 * local_800._0_4_;
          fVar251 = auVar29._8_4_;
          auVar66._8_4_ = fVar251 * local_800._8_4_;
          fVar196 = auVar29._12_4_;
          auVar66._12_4_ = fVar196 * local_800._12_4_;
          fVar240 = auVar29._16_4_;
          auVar66._16_4_ = fVar240 * local_800._16_4_;
          fVar212 = auVar29._20_4_;
          auVar66._20_4_ = fVar212 * local_800._20_4_;
          fVar158 = auVar29._24_4_;
          auVar66._24_4_ = fVar158 * local_800._24_4_;
          auVar66._28_4_ = fVar194;
          fVar195 = auVar248._0_4_;
          fVar209 = auVar248._4_4_;
          auVar67._4_4_ = local_7a0._4_4_ * fVar209;
          auVar67._0_4_ = (float)local_7a0._0_4_ * fVar195;
          fVar211 = auVar248._8_4_;
          auVar67._8_4_ = local_7a0._8_4_ * fVar211;
          fVar214 = auVar248._12_4_;
          auVar67._12_4_ = local_7a0._12_4_ * fVar214;
          fVar223 = auVar248._16_4_;
          auVar67._16_4_ = local_7a0._16_4_ * fVar223;
          fVar234 = auVar248._20_4_;
          auVar67._20_4_ = local_7a0._20_4_ * fVar234;
          fVar236 = auVar248._24_4_;
          auVar67._24_4_ = local_7a0._24_4_ * fVar236;
          auVar67._28_4_ = auVar249._28_4_;
          auVar31 = vsubps_avx(auVar66,auVar67);
          auVar173 = ZEXT3264(_local_860);
          auVar30 = vmaxps_avx(_local_860,auVar288);
          auVar68._4_4_ = auVar30._4_4_ * auVar30._4_4_ * (fVar241 * fVar241 + fVar209 * fVar209);
          auVar68._0_4_ = auVar30._0_4_ * auVar30._0_4_ * (fVar238 * fVar238 + fVar195 * fVar195);
          auVar68._8_4_ = auVar30._8_4_ * auVar30._8_4_ * (fVar251 * fVar251 + fVar211 * fVar211);
          auVar68._12_4_ = auVar30._12_4_ * auVar30._12_4_ * (fVar196 * fVar196 + fVar214 * fVar214)
          ;
          auVar68._16_4_ = auVar30._16_4_ * auVar30._16_4_ * (fVar240 * fVar240 + fVar223 * fVar223)
          ;
          auVar68._20_4_ = auVar30._20_4_ * auVar30._20_4_ * (fVar212 * fVar212 + fVar234 * fVar234)
          ;
          auVar68._24_4_ = auVar30._24_4_ * auVar30._24_4_ * (fVar158 * fVar158 + fVar236 * fVar236)
          ;
          auVar68._28_4_ = auVar267._28_4_ + auVar249._28_4_;
          auVar69._4_4_ = auVar31._4_4_ * auVar31._4_4_;
          auVar69._0_4_ = auVar31._0_4_ * auVar31._0_4_;
          auVar69._8_4_ = auVar31._8_4_ * auVar31._8_4_;
          auVar69._12_4_ = auVar31._12_4_ * auVar31._12_4_;
          auVar69._16_4_ = auVar31._16_4_ * auVar31._16_4_;
          auVar69._20_4_ = auVar31._20_4_ * auVar31._20_4_;
          auVar69._24_4_ = auVar31._24_4_ * auVar31._24_4_;
          auVar69._28_4_ = auVar31._28_4_;
          auVar30 = vcmpps_avx(auVar69,auVar68,2);
          local_240 = (uint)lVar134;
          auVar200 = vpshufd_avx(ZEXT416(local_240),0);
          auVar181 = vpor_avx(auVar200,_DAT_01ff0cf0);
          auVar200 = vpor_avx(auVar200,_DAT_02020ea0);
          auVar181 = vpcmpgtd_avx(_local_300,auVar181);
          auVar200 = vpcmpgtd_avx(_local_300,auVar200);
          auVar231._16_16_ = auVar200;
          auVar231._0_16_ = auVar181;
          auVar31 = auVar231 & auVar30;
          fVar214 = (float)local_620._0_4_;
          fVar223 = (float)local_620._4_4_;
          fVar234 = fStack_618;
          fVar236 = fStack_614;
          fVar238 = fStack_610;
          fVar241 = fStack_60c;
          fVar251 = fStack_608;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
            auVar351 = ZEXT3264(auVar351._0_32_);
            _local_7e0 = *pauVar11;
          }
          else {
            local_780 = (float)local_7e0._0_4_ * (float)local_160._0_4_ +
                        fVar275 * (float)local_2e0._0_4_ +
                        (float)local_c0._0_4_ * fVar253 + (float)local_500._0_4_ * fVar175;
            fStack_77c = (float)local_7e0._4_4_ * (float)local_160._4_4_ +
                         fVar215 * (float)local_2e0._4_4_ +
                         (float)local_c0._4_4_ * fVar255 + (float)local_500._4_4_ * fVar358;
            fStack_778 = (float)auStack_7d8._0_4_ * fStack_158 +
                         fVar320 * fStack_2d8 + fStack_b8 * fVar346 + fStack_4f8 * fVar359;
            fStack_774 = (float)auStack_7d8._4_4_ * fStack_154 +
                         fVar294 * fStack_2d4 + fStack_b4 * fVar331 + fStack_4f4 * fVar360;
            fStack_770 = fStack_7d0 * fStack_150 +
                         fVar295 * fStack_2d0 + fStack_b0 * fVar213 + fStack_4f0 * fVar155;
            fStack_76c = fStack_7cc * fStack_14c +
                         fVar218 * fStack_2cc + fStack_ac * fVar332 + fStack_4ec * fVar156;
            fStack_768 = fStack_7c8 * fStack_148 +
                         fVar321 * fStack_2c8 + fStack_a8 * fVar347 + fStack_4e8 * fVar157;
            fStack_764 = local_7a0._28_4_ + auVar172._28_4_ + fStack_844 + 0.0;
            local_640._0_4_ = auVar123._0_4_;
            local_640._4_4_ = auVar123._4_4_;
            uStack_638._0_4_ = auVar123._8_4_;
            uStack_638._4_4_ = auVar123._12_4_;
            auStack_630._0_4_ = auVar123._16_4_;
            auStack_630._4_4_ = auVar123._20_4_;
            fStack_628 = auVar123._24_4_;
            local_760._0_4_ = auVar121._0_4_;
            local_760._4_4_ = auVar121._4_4_;
            uStack_758._0_4_ = auVar121._8_4_;
            uStack_758._4_4_ = auVar121._12_4_;
            fStack_750 = auVar121._16_4_;
            fStack_74c = auVar121._20_4_;
            fStack_748 = auVar121._24_4_;
            fVar260 = (float)local_500._0_4_ * (float)local_760._0_4_;
            fVar270 = (float)local_500._4_4_ * (float)local_760._4_4_;
            fVar272 = fStack_4f8 * (float)uStack_758;
            fVar274 = fStack_4f4 * uStack_758._4_4_;
            fVar276 = fStack_4f0 * fStack_750;
            fVar277 = fStack_4ec * fStack_74c;
            fVar278 = fStack_4e8 * fStack_748;
            pfVar2 = (float *)(lVar19 + 0x2231e84 + lVar134 * 4);
            fVar195 = *pfVar2;
            fVar209 = pfVar2[1];
            fVar211 = pfVar2[2];
            fVar253 = pfVar2[3];
            fVar255 = pfVar2[4];
            fVar346 = pfVar2[5];
            fVar331 = pfVar2[6];
            pfVar3 = (float *)(lVar19 + 0x2232308 + lVar134 * 4);
            fVar213 = *pfVar3;
            fVar332 = pfVar3[1];
            fVar347 = pfVar3[2];
            fVar275 = pfVar3[3];
            fVar215 = pfVar3[4];
            fVar320 = pfVar3[5];
            fVar294 = pfVar3[6];
            fVar279 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar19 + 0x2231a00 + lVar134 * 4);
            fVar295 = *pfVar4;
            fVar218 = pfVar4[1];
            fVar321 = pfVar4[2];
            fVar175 = pfVar4[3];
            fVar358 = pfVar4[4];
            fVar359 = pfVar4[5];
            fVar360 = pfVar4[6];
            fVar158 = pfVar2[7] + pfVar3[7];
            fVar176 = pfVar3[7] + fVar279;
            fVar279 = pfVar1[7] + fStack_e4 + fVar279;
            pfVar1 = (float *)(lVar19 + 0x223157c + lVar134 * 4);
            fVar155 = *pfVar1;
            fVar156 = pfVar1[1];
            fVar157 = pfVar1[2];
            fVar194 = pfVar1[3];
            fVar196 = pfVar1[4];
            fVar240 = pfVar1[5];
            fVar212 = pfVar1[6];
            local_760._4_4_ =
                 fVar156 * (float)local_440._4_4_ +
                 fVar219 * fVar218 +
                 (float)local_600._4_4_ * fVar209 + (float)local_520._4_4_ * fVar332;
            local_760._0_4_ =
                 fVar155 * (float)local_440._0_4_ +
                 fVar217 * fVar295 +
                 (float)local_600._0_4_ * fVar195 + (float)local_520._0_4_ * fVar213;
            uStack_758._0_4_ =
                 fVar157 * fStack_438 +
                 fVar221 * fVar321 + fStack_5f8 * fVar211 + fStack_518 * fVar347;
            uStack_758._4_4_ =
                 fVar194 * fStack_434 +
                 fVar258 * fVar175 + fStack_5f4 * fVar253 + fStack_514 * fVar275;
            fStack_750 = fVar196 * fStack_430 +
                         fVar149 * fVar358 + fStack_5f0 * fVar255 + fStack_510 * fVar215;
            fStack_74c = fVar240 * fStack_42c +
                         fVar151 * fVar359 + fStack_5ec * fVar346 + fStack_50c * fVar320;
            fStack_748 = fVar212 * fStack_428 +
                         fVar153 * fVar360 + fStack_5e8 * fVar331 + fStack_508 * fVar294;
            fStack_744 = fVar158 + fVar176;
            auVar169._0_4_ =
                 (float)local_100._0_4_ * fVar155 +
                 (float)local_620._0_4_ * fVar195 + fVar323 * fVar213 +
                 (float)local_6e0._0_4_ * fVar295;
            auVar169._4_4_ =
                 (float)local_100._4_4_ * fVar156 +
                 (float)local_620._4_4_ * fVar209 + fVar327 * fVar332 +
                 (float)local_6e0._4_4_ * fVar218;
            auVar169._8_4_ =
                 fStack_f8 * fVar157 +
                 fStack_618 * fVar211 + fVar329 * fVar347 + fStack_6d8 * fVar321;
            auVar169._12_4_ =
                 fStack_f4 * fVar194 +
                 fStack_614 * fVar253 + fVar330 * fVar275 + fStack_6d4 * fVar175;
            auVar169._16_4_ =
                 fStack_f0 * fVar196 +
                 fStack_610 * fVar255 + fVar324 * fVar215 + fStack_6d0 * fVar358;
            auVar169._20_4_ =
                 fStack_ec * fVar240 +
                 fStack_60c * fVar346 + fVar210 * fVar320 + fStack_6cc * fVar359;
            auVar169._24_4_ =
                 fStack_e8 * fVar212 +
                 fStack_608 * fVar331 + fVar328 * fVar294 + fStack_6c8 * fVar360;
            auVar169._28_4_ = fVar176 + fVar279;
            auVar341._0_4_ =
                 fVar295 * (float)local_2e0._0_4_ +
                 (float)local_c0._0_4_ * fVar195 + (float)local_500._0_4_ * fVar213 +
                 fVar155 * (float)local_160._0_4_;
            auVar341._4_4_ =
                 fVar218 * (float)local_2e0._4_4_ +
                 (float)local_c0._4_4_ * fVar209 + (float)local_500._4_4_ * fVar332 +
                 fVar156 * (float)local_160._4_4_;
            auVar341._8_4_ =
                 fVar321 * fStack_2d8 + fStack_b8 * fVar211 + fStack_4f8 * fVar347 +
                 fVar157 * fStack_158;
            auVar341._12_4_ =
                 fVar175 * fStack_2d4 + fStack_b4 * fVar253 + fStack_4f4 * fVar275 +
                 fVar194 * fStack_154;
            auVar341._16_4_ =
                 fVar358 * fStack_2d0 + fStack_b0 * fVar255 + fStack_4f0 * fVar215 +
                 fVar196 * fStack_150;
            auVar341._20_4_ =
                 fVar359 * fStack_2cc + fStack_ac * fVar346 + fStack_4ec * fVar320 +
                 fVar240 * fStack_14c;
            auVar341._24_4_ =
                 fVar360 * fStack_2c8 + fStack_a8 * fVar331 + fStack_4e8 * fVar294 +
                 fVar212 * fStack_148;
            auVar341._28_4_ = pfVar4[7] + fVar158 + fVar279;
            pfVar1 = (float *)(lVar19 + 0x22342a4 + lVar134 * 4);
            fVar195 = *pfVar1;
            fVar209 = pfVar1[1];
            fVar211 = pfVar1[2];
            fVar253 = pfVar1[3];
            fVar255 = pfVar1[4];
            fVar346 = pfVar1[5];
            fVar331 = pfVar1[6];
            pfVar2 = (float *)(lVar19 + 0x2234728 + lVar134 * 4);
            fVar213 = *pfVar2;
            fVar332 = pfVar2[1];
            fVar347 = pfVar2[2];
            fVar275 = pfVar2[3];
            fVar215 = pfVar2[4];
            fVar320 = pfVar2[5];
            fVar294 = pfVar2[6];
            pfVar3 = (float *)(lVar19 + 0x2233e20 + lVar134 * 4);
            fVar295 = *pfVar3;
            fVar218 = pfVar3[1];
            fVar321 = pfVar3[2];
            fVar175 = pfVar3[3];
            fVar358 = pfVar3[4];
            fVar359 = pfVar3[5];
            fVar360 = pfVar3[6];
            pfVar4 = (float *)(lVar19 + 0x223399c + lVar134 * 4);
            fVar155 = *pfVar4;
            fVar156 = pfVar4[1];
            fVar157 = pfVar4[2];
            fVar194 = pfVar4[3];
            fVar196 = pfVar4[4];
            fVar240 = pfVar4[5];
            fVar212 = pfVar4[6];
            auVar302._0_4_ =
                 fVar155 * (float)local_440._0_4_ +
                 fVar295 * (float)local_660._0_4_ +
                 (float)local_600._0_4_ * fVar195 + (float)local_520._0_4_ * fVar213;
            auVar302._4_4_ =
                 fVar156 * (float)local_440._4_4_ +
                 fVar218 * (float)local_660._4_4_ +
                 (float)local_600._4_4_ * fVar209 + (float)local_520._4_4_ * fVar332;
            auVar302._8_4_ =
                 fVar157 * fStack_438 +
                 fVar321 * fStack_658 + fStack_5f8 * fVar211 + fStack_518 * fVar347;
            auVar302._12_4_ =
                 fVar194 * fStack_434 +
                 fVar175 * fStack_654 + fStack_5f4 * fVar253 + fStack_514 * fVar275;
            auVar302._16_4_ =
                 fVar196 * fStack_430 +
                 fVar358 * fStack_650 + fStack_5f0 * fVar255 + fStack_510 * fVar215;
            auVar302._20_4_ =
                 fVar240 * fStack_42c +
                 fVar359 * fStack_64c + fStack_5ec * fVar346 + fStack_50c * fVar320;
            auVar302._24_4_ =
                 fVar212 * fStack_428 +
                 fVar360 * fStack_648 + fStack_5e8 * fVar331 + fStack_508 * fVar294;
            auVar302._28_4_ = fStack_504 + fStack_504 + fStack_e4 + fStack_504;
            auVar337._0_4_ =
                 fVar155 * (float)local_100._0_4_ +
                 (float)local_6e0._0_4_ * fVar295 +
                 (float)local_620._0_4_ * fVar195 + fVar323 * fVar213;
            auVar337._4_4_ =
                 fVar156 * (float)local_100._4_4_ +
                 (float)local_6e0._4_4_ * fVar218 +
                 (float)local_620._4_4_ * fVar209 + fVar327 * fVar332;
            auVar337._8_4_ =
                 fVar157 * fStack_f8 +
                 fStack_6d8 * fVar321 + fStack_618 * fVar211 + fVar329 * fVar347;
            auVar337._12_4_ =
                 fVar194 * fStack_f4 +
                 fStack_6d4 * fVar175 + fStack_614 * fVar253 + fVar330 * fVar275;
            auVar337._16_4_ =
                 fVar196 * fStack_f0 +
                 fStack_6d0 * fVar358 + fStack_610 * fVar255 + fVar324 * fVar215;
            auVar337._20_4_ =
                 fVar240 * fStack_ec +
                 fStack_6cc * fVar359 + fStack_60c * fVar346 + fVar210 * fVar320;
            auVar337._24_4_ =
                 fVar212 * fStack_e8 +
                 fStack_6c8 * fVar360 + fStack_608 * fVar331 + fVar328 * fVar294;
            auVar337._28_4_ = fStack_504 + fStack_504 + fVar216 + fStack_504;
            auVar250._8_4_ = 0x7fffffff;
            auVar250._0_8_ = 0x7fffffff7fffffff;
            auVar250._12_4_ = 0x7fffffff;
            auVar250._16_4_ = 0x7fffffff;
            auVar250._20_4_ = 0x7fffffff;
            auVar250._24_4_ = 0x7fffffff;
            auVar250._28_4_ = 0x7fffffff;
            auVar172 = vandps_avx(_local_760,auVar250);
            auVar31 = vandps_avx(auVar169,auVar250);
            auVar31 = vmaxps_avx(auVar172,auVar31);
            auVar172 = vandps_avx(auVar341,auVar250);
            auVar31 = vmaxps_avx(auVar31,auVar172);
            auVar31 = vcmpps_avx(auVar31,_local_320,1);
            auVar141 = vblendvps_avx(_local_760,auVar29,auVar31);
            auVar145._0_4_ =
                 fVar155 * (float)local_160._0_4_ +
                 fVar295 * (float)local_2e0._0_4_ +
                 (float)local_500._0_4_ * fVar213 + (float)local_c0._0_4_ * fVar195;
            auVar145._4_4_ =
                 fVar156 * (float)local_160._4_4_ +
                 fVar218 * (float)local_2e0._4_4_ +
                 (float)local_500._4_4_ * fVar332 + (float)local_c0._4_4_ * fVar209;
            auVar145._8_4_ =
                 fVar157 * fStack_158 +
                 fVar321 * fStack_2d8 + fStack_4f8 * fVar347 + fStack_b8 * fVar211;
            auVar145._12_4_ =
                 fVar194 * fStack_154 +
                 fVar175 * fStack_2d4 + fStack_4f4 * fVar275 + fStack_b4 * fVar253;
            auVar145._16_4_ =
                 fVar196 * fStack_150 +
                 fVar358 * fStack_2d0 + fStack_4f0 * fVar215 + fStack_b0 * fVar255;
            auVar145._20_4_ =
                 fVar240 * fStack_14c +
                 fVar359 * fStack_2cc + fStack_4ec * fVar320 + fStack_ac * fVar346;
            auVar145._24_4_ =
                 fVar212 * fStack_148 +
                 fVar360 * fStack_2c8 + fStack_4e8 * fVar294 + fStack_a8 * fVar331;
            auVar145._28_4_ = auVar172._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar203 = vblendvps_avx(auVar169,auVar248,auVar31);
            auVar172 = vandps_avx(auVar302,auVar250);
            auVar31 = vandps_avx(auVar337,auVar250);
            auVar204 = vmaxps_avx(auVar172,auVar31);
            auVar172 = vandps_avx(auVar145,auVar250);
            auVar172 = vmaxps_avx(auVar204,auVar172);
            local_740._0_4_ = auVar124._0_4_;
            local_740._4_4_ = auVar124._4_4_;
            uStack_738._0_4_ = auVar124._8_4_;
            uStack_738._4_4_ = auVar124._12_4_;
            auStack_730._0_4_ = auVar124._16_4_;
            auStack_730._4_4_ = auVar124._20_4_;
            fStack_728 = auVar124._24_4_;
            auVar31 = vcmpps_avx(auVar172,_local_320,1);
            auVar172 = vblendvps_avx(auVar302,auVar29,auVar31);
            auVar146._0_4_ =
                 (float)local_160._0_4_ * (float)local_740._0_4_ +
                 (float)local_2e0._0_4_ * (float)local_640._0_4_ +
                 (float)local_c0._0_4_ * fVar296 + fVar260;
            auVar146._4_4_ =
                 (float)local_160._4_4_ * (float)local_740._4_4_ +
                 (float)local_2e0._4_4_ * (float)local_640._4_4_ +
                 (float)local_c0._4_4_ * fVar297 + fVar270;
            auVar146._8_4_ =
                 fStack_158 * (float)uStack_738 +
                 fStack_2d8 * (float)uStack_638 + fStack_b8 * fVar220 + fVar272;
            auVar146._12_4_ =
                 fStack_154 * uStack_738._4_4_ +
                 fStack_2d4 * uStack_638._4_4_ + fStack_b4 * fVar322 + fVar274;
            auVar146._16_4_ =
                 fStack_150 * (float)auStack_730._0_4_ +
                 fStack_2d0 * (float)auStack_630._0_4_ + fStack_b0 * fVar298 + fVar276;
            auVar146._20_4_ =
                 fStack_14c * (float)auStack_730._4_4_ +
                 fStack_2cc * (float)auStack_630._4_4_ + fStack_ac * fVar299 + fVar277;
            auVar146._24_4_ =
                 fStack_148 * fStack_728 + fStack_2c8 * fStack_628 + fStack_a8 * fVar222 + fVar278;
            auVar146._28_4_ = auVar204._28_4_ + fStack_764 + fStack_844 + 0.0;
            auVar31 = vblendvps_avx(auVar337,auVar248,auVar31);
            fVar196 = auVar141._0_4_;
            fVar240 = auVar141._4_4_;
            fVar212 = auVar141._8_4_;
            fVar158 = auVar141._12_4_;
            fVar217 = auVar141._16_4_;
            fVar219 = auVar141._20_4_;
            fVar221 = auVar141._24_4_;
            fVar323 = auVar141._28_4_;
            fVar215 = auVar172._0_4_;
            fVar294 = auVar172._4_4_;
            fVar218 = auVar172._8_4_;
            fVar296 = auVar172._12_4_;
            fVar220 = auVar172._16_4_;
            fVar298 = auVar172._20_4_;
            fVar222 = auVar172._24_4_;
            fVar324 = auVar203._0_4_;
            fVar328 = auVar203._4_4_;
            fVar195 = auVar203._8_4_;
            fVar211 = auVar203._12_4_;
            fVar255 = auVar203._16_4_;
            fVar331 = auVar203._20_4_;
            fVar332 = auVar203._24_4_;
            auVar312._0_4_ = fVar324 * fVar324 + fVar196 * fVar196;
            auVar312._4_4_ = fVar328 * fVar328 + fVar240 * fVar240;
            auVar312._8_4_ = fVar195 * fVar195 + fVar212 * fVar212;
            auVar312._12_4_ = fVar211 * fVar211 + fVar158 * fVar158;
            auVar312._16_4_ = fVar255 * fVar255 + fVar217 * fVar217;
            auVar312._20_4_ = fVar331 * fVar331 + fVar219 * fVar219;
            auVar312._24_4_ = fVar332 * fVar332 + fVar221 * fVar221;
            auVar312._28_4_ = auVar29._28_4_ + fStack_4e4;
            auVar29 = vrsqrtps_avx(auVar312);
            fVar210 = auVar29._0_4_;
            fVar216 = auVar29._4_4_;
            auVar70._4_4_ = fVar216 * 1.5;
            auVar70._0_4_ = fVar210 * 1.5;
            fVar209 = auVar29._8_4_;
            auVar70._8_4_ = fVar209 * 1.5;
            fVar253 = auVar29._12_4_;
            auVar70._12_4_ = fVar253 * 1.5;
            fVar346 = auVar29._16_4_;
            auVar70._16_4_ = fVar346 * 1.5;
            fVar213 = auVar29._20_4_;
            auVar70._20_4_ = fVar213 * 1.5;
            fVar347 = auVar29._24_4_;
            auVar70._24_4_ = fVar347 * 1.5;
            auVar70._28_4_ = auVar337._28_4_;
            auVar71._4_4_ = fVar216 * fVar216 * fVar216 * auVar312._4_4_ * 0.5;
            auVar71._0_4_ = fVar210 * fVar210 * fVar210 * auVar312._0_4_ * 0.5;
            auVar71._8_4_ = fVar209 * fVar209 * fVar209 * auVar312._8_4_ * 0.5;
            auVar71._12_4_ = fVar253 * fVar253 * fVar253 * auVar312._12_4_ * 0.5;
            auVar71._16_4_ = fVar346 * fVar346 * fVar346 * auVar312._16_4_ * 0.5;
            auVar71._20_4_ = fVar213 * fVar213 * fVar213 * auVar312._20_4_ * 0.5;
            auVar71._24_4_ = fVar347 * fVar347 * fVar347 * auVar312._24_4_ * 0.5;
            auVar71._28_4_ = auVar312._28_4_;
            auVar141 = vsubps_avx(auVar70,auVar71);
            fVar358 = auVar141._0_4_;
            fVar359 = auVar141._4_4_;
            fVar360 = auVar141._8_4_;
            fVar155 = auVar141._12_4_;
            fVar156 = auVar141._16_4_;
            fVar157 = auVar141._20_4_;
            fVar194 = auVar141._24_4_;
            fVar210 = auVar31._0_4_;
            fVar216 = auVar31._4_4_;
            fVar209 = auVar31._8_4_;
            fVar253 = auVar31._12_4_;
            fVar346 = auVar31._16_4_;
            fVar213 = auVar31._20_4_;
            fVar347 = auVar31._24_4_;
            auVar293._0_4_ = fVar210 * fVar210 + fVar215 * fVar215;
            auVar293._4_4_ = fVar216 * fVar216 + fVar294 * fVar294;
            auVar293._8_4_ = fVar209 * fVar209 + fVar218 * fVar218;
            auVar293._12_4_ = fVar253 * fVar253 + fVar296 * fVar296;
            auVar293._16_4_ = fVar346 * fVar346 + fVar220 * fVar220;
            auVar293._20_4_ = fVar213 * fVar213 + fVar298 * fVar298;
            auVar293._24_4_ = fVar347 * fVar347 + fVar222 * fVar222;
            auVar293._28_4_ = auVar29._28_4_ + auVar172._28_4_;
            auVar172 = vrsqrtps_avx(auVar293);
            fVar275 = auVar172._0_4_;
            fVar320 = auVar172._4_4_;
            auVar72._4_4_ = fVar320 * 1.5;
            auVar72._0_4_ = fVar275 * 1.5;
            fVar295 = auVar172._8_4_;
            auVar72._8_4_ = fVar295 * 1.5;
            fVar321 = auVar172._12_4_;
            auVar72._12_4_ = fVar321 * 1.5;
            fVar297 = auVar172._16_4_;
            auVar72._16_4_ = fVar297 * 1.5;
            fVar322 = auVar172._20_4_;
            auVar72._20_4_ = fVar322 * 1.5;
            fVar299 = auVar172._24_4_;
            auVar72._24_4_ = fVar299 * 1.5;
            auVar72._28_4_ = auVar337._28_4_;
            auVar73._4_4_ = fVar320 * fVar320 * fVar320 * auVar293._4_4_ * 0.5;
            auVar73._0_4_ = fVar275 * fVar275 * fVar275 * auVar293._0_4_ * 0.5;
            auVar73._8_4_ = fVar295 * fVar295 * fVar295 * auVar293._8_4_ * 0.5;
            auVar73._12_4_ = fVar321 * fVar321 * fVar321 * auVar293._12_4_ * 0.5;
            auVar73._16_4_ = fVar297 * fVar297 * fVar297 * auVar293._16_4_ * 0.5;
            auVar73._20_4_ = fVar322 * fVar322 * fVar322 * auVar293._20_4_ * 0.5;
            auVar73._24_4_ = fVar299 * fVar299 * fVar299 * auVar293._24_4_ * 0.5;
            auVar73._28_4_ = auVar293._28_4_;
            auVar29 = vsubps_avx(auVar72,auVar73);
            fVar320 = auVar29._0_4_;
            fVar295 = auVar29._4_4_;
            fVar321 = auVar29._8_4_;
            fVar297 = auVar29._12_4_;
            fVar322 = auVar29._16_4_;
            fVar299 = auVar29._20_4_;
            fVar175 = auVar29._24_4_;
            fVar324 = (float)local_860._0_4_ * fVar358 * fVar324;
            fVar328 = (float)local_860._4_4_ * fVar359 * fVar328;
            auVar74._4_4_ = fVar328;
            auVar74._0_4_ = fVar324;
            fVar195 = fStack_858 * fVar360 * fVar195;
            auVar74._8_4_ = fVar195;
            fVar211 = fStack_854 * fVar155 * fVar211;
            auVar74._12_4_ = fVar211;
            fVar255 = fStack_850 * fVar156 * fVar255;
            auVar74._16_4_ = fVar255;
            fVar331 = fStack_84c * fVar157 * fVar331;
            auVar74._20_4_ = fVar331;
            fVar332 = fStack_848 * fVar194 * fVar332;
            auVar74._24_4_ = fVar332;
            auVar74._28_4_ = auVar172._28_4_;
            local_740._4_4_ = fVar328 + local_7a0._4_4_;
            local_740._0_4_ = fVar324 + (float)local_7a0._0_4_;
            uStack_738._0_4_ = fVar195 + local_7a0._8_4_;
            uStack_738._4_4_ = fVar211 + local_7a0._12_4_;
            auStack_730._0_4_ = fVar255 + local_7a0._16_4_;
            auStack_730._4_4_ = fVar331 + local_7a0._20_4_;
            fStack_728 = fVar332 + local_7a0._24_4_;
            fStack_724 = auVar172._28_4_ + local_7a0._28_4_;
            fVar255 = (float)local_860._0_4_ * fVar358 * -fVar196;
            fVar331 = (float)local_860._4_4_ * fVar359 * -fVar240;
            auVar75._4_4_ = fVar331;
            auVar75._0_4_ = fVar255;
            fVar332 = fStack_858 * fVar360 * -fVar212;
            auVar75._8_4_ = fVar332;
            fVar275 = fStack_854 * fVar155 * -fVar158;
            auVar75._12_4_ = fVar275;
            fStack_810 = fStack_850 * fVar156 * -fVar217;
            auVar75._16_4_ = fStack_810;
            fStack_80c = fStack_84c * fVar157 * -fVar219;
            auVar75._20_4_ = fStack_80c;
            fStack_808 = fStack_848 * fVar194 * -fVar221;
            auVar75._24_4_ = fStack_808;
            auVar75._28_4_ = -fVar323;
            fStack_810 = local_800._16_4_ + fStack_810;
            fStack_80c = local_800._20_4_ + fStack_80c;
            fStack_808 = local_800._24_4_ + fStack_808;
            fStack_804 = local_800._28_4_ + -fVar323;
            fVar324 = fVar358 * 0.0 * (float)local_860._0_4_;
            fVar328 = fVar359 * 0.0 * (float)local_860._4_4_;
            auVar76._4_4_ = fVar328;
            auVar76._0_4_ = fVar324;
            fVar195 = fVar360 * 0.0 * fStack_858;
            auVar76._8_4_ = fVar195;
            fVar211 = fVar155 * 0.0 * fStack_854;
            auVar76._12_4_ = fVar211;
            fVar358 = fVar156 * 0.0 * fStack_850;
            auVar76._16_4_ = fVar358;
            fVar359 = fVar157 * 0.0 * fStack_84c;
            auVar76._20_4_ = fVar359;
            fVar360 = fVar194 * 0.0 * fStack_848;
            auVar76._24_4_ = fVar360;
            auVar76._28_4_ = fVar323;
            auVar228 = vsubps_avx(local_7a0,auVar74);
            auVar363._0_4_ = fVar324 + auVar146._0_4_;
            auVar363._4_4_ = fVar328 + auVar146._4_4_;
            auVar363._8_4_ = fVar195 + auVar146._8_4_;
            auVar363._12_4_ = fVar211 + auVar146._12_4_;
            auVar363._16_4_ = fVar358 + auVar146._16_4_;
            auVar363._20_4_ = fVar359 + auVar146._20_4_;
            auVar363._24_4_ = fVar360 + auVar146._24_4_;
            auVar363._28_4_ = fVar323 + auVar146._28_4_;
            fVar324 = auVar288._0_4_ * fVar320 * fVar210;
            fVar210 = auVar288._4_4_ * fVar295 * fVar216;
            auVar77._4_4_ = fVar210;
            auVar77._0_4_ = fVar324;
            fVar328 = auVar288._8_4_ * fVar321 * fVar209;
            auVar77._8_4_ = fVar328;
            fVar216 = auVar288._12_4_ * fVar297 * fVar253;
            auVar77._12_4_ = fVar216;
            fVar195 = auVar288._16_4_ * fVar322 * fVar346;
            auVar77._16_4_ = fVar195;
            fVar209 = auVar288._20_4_ * fVar299 * fVar213;
            auVar77._20_4_ = fVar209;
            fVar211 = auVar288._24_4_ * fVar175 * fVar347;
            auVar77._24_4_ = fVar211;
            auVar77._28_4_ = fStack_844;
            auVar32 = vsubps_avx(local_800,auVar75);
            auVar342._0_4_ = auVar267._0_4_ + fVar324;
            auVar342._4_4_ = auVar267._4_4_ + fVar210;
            auVar342._8_4_ = auVar267._8_4_ + fVar328;
            auVar342._12_4_ = auVar267._12_4_ + fVar216;
            auVar342._16_4_ = auVar267._16_4_ + fVar195;
            auVar342._20_4_ = auVar267._20_4_ + fVar209;
            auVar342._24_4_ = auVar267._24_4_ + fVar211;
            auVar342._28_4_ = auVar267._28_4_ + fStack_844;
            fVar324 = fVar320 * -fVar215 * auVar288._0_4_;
            fVar210 = fVar295 * -fVar294 * auVar288._4_4_;
            auVar78._4_4_ = fVar210;
            auVar78._0_4_ = fVar324;
            fVar328 = fVar321 * -fVar218 * auVar288._8_4_;
            auVar78._8_4_ = fVar328;
            fVar216 = fVar297 * -fVar296 * auVar288._12_4_;
            auVar78._12_4_ = fVar216;
            fVar195 = fVar322 * -fVar220 * auVar288._16_4_;
            auVar78._16_4_ = fVar195;
            fVar209 = fVar299 * -fVar298 * auVar288._20_4_;
            auVar78._20_4_ = fVar209;
            fVar211 = fVar175 * -fVar222 * auVar288._24_4_;
            auVar78._24_4_ = fVar211;
            auVar78._28_4_ = local_7a0._28_4_;
            auVar33 = vsubps_avx(auVar146,auVar76);
            auVar232._0_4_ = auVar249._0_4_ + fVar324;
            auVar232._4_4_ = auVar249._4_4_ + fVar210;
            auVar232._8_4_ = auVar249._8_4_ + fVar328;
            auVar232._12_4_ = auVar249._12_4_ + fVar216;
            auVar232._16_4_ = auVar249._16_4_ + fVar195;
            auVar232._20_4_ = auVar249._20_4_ + fVar209;
            auVar232._24_4_ = auVar249._24_4_ + fVar211;
            auVar232._28_4_ = auVar249._28_4_ + local_7a0._28_4_;
            fVar324 = fVar320 * 0.0 * auVar288._0_4_;
            fVar210 = fVar295 * 0.0 * auVar288._4_4_;
            auVar79._4_4_ = fVar210;
            auVar79._0_4_ = fVar324;
            fVar328 = fVar321 * 0.0 * auVar288._8_4_;
            auVar79._8_4_ = fVar328;
            fVar216 = fVar297 * 0.0 * auVar288._12_4_;
            auVar79._12_4_ = fVar216;
            fVar195 = fVar322 * 0.0 * auVar288._16_4_;
            auVar79._16_4_ = fVar195;
            fVar209 = fVar299 * 0.0 * auVar288._20_4_;
            auVar79._20_4_ = fVar209;
            fVar211 = fVar175 * 0.0 * auVar288._24_4_;
            auVar79._24_4_ = fVar211;
            auVar79._28_4_ = auVar146._28_4_;
            auVar172 = vsubps_avx(auVar267,auVar77);
            auVar120._4_4_ = fStack_77c;
            auVar120._0_4_ = local_780;
            auVar120._8_4_ = fStack_778;
            auVar120._12_4_ = fStack_774;
            auVar120._16_4_ = fStack_770;
            auVar120._20_4_ = fStack_76c;
            auVar120._24_4_ = fStack_768;
            auVar120._28_4_ = fStack_764;
            auVar303._0_4_ = local_780 + fVar324;
            auVar303._4_4_ = fStack_77c + fVar210;
            auVar303._8_4_ = fStack_778 + fVar328;
            auVar303._12_4_ = fStack_774 + fVar216;
            auVar303._16_4_ = fStack_770 + fVar195;
            auVar303._20_4_ = fStack_76c + fVar209;
            auVar303._24_4_ = fStack_768 + fVar211;
            auVar303._28_4_ = fStack_764 + auVar146._28_4_;
            auVar31 = vsubps_avx(auVar249,auVar78);
            auVar141 = vsubps_avx(auVar120,auVar79);
            auVar203 = vsubps_avx(auVar232,auVar32);
            auVar204 = vsubps_avx(auVar303,auVar33);
            auVar80._4_4_ = auVar33._4_4_ * auVar203._4_4_;
            auVar80._0_4_ = auVar33._0_4_ * auVar203._0_4_;
            auVar80._8_4_ = auVar33._8_4_ * auVar203._8_4_;
            auVar80._12_4_ = auVar33._12_4_ * auVar203._12_4_;
            auVar80._16_4_ = auVar33._16_4_ * auVar203._16_4_;
            auVar80._20_4_ = auVar33._20_4_ * auVar203._20_4_;
            auVar80._24_4_ = auVar33._24_4_ * auVar203._24_4_;
            auVar80._28_4_ = auVar337._28_4_;
            auVar81._4_4_ = auVar32._4_4_ * auVar204._4_4_;
            auVar81._0_4_ = auVar32._0_4_ * auVar204._0_4_;
            auVar81._8_4_ = auVar32._8_4_ * auVar204._8_4_;
            auVar81._12_4_ = auVar32._12_4_ * auVar204._12_4_;
            auVar81._16_4_ = auVar32._16_4_ * auVar204._16_4_;
            auVar81._20_4_ = auVar32._20_4_ * auVar204._20_4_;
            auVar81._24_4_ = auVar32._24_4_ * auVar204._24_4_;
            auVar81._28_4_ = fStack_764;
            auVar286 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar228._4_4_ * auVar204._4_4_;
            auVar82._0_4_ = auVar228._0_4_ * auVar204._0_4_;
            auVar82._8_4_ = auVar228._8_4_ * auVar204._8_4_;
            auVar82._12_4_ = auVar228._12_4_ * auVar204._12_4_;
            auVar82._16_4_ = auVar228._16_4_ * auVar204._16_4_;
            auVar82._20_4_ = auVar228._20_4_ * auVar204._20_4_;
            auVar82._24_4_ = auVar228._24_4_ * auVar204._24_4_;
            auVar82._28_4_ = auVar204._28_4_;
            auVar204 = vsubps_avx(auVar342,auVar228);
            auVar83._4_4_ = auVar33._4_4_ * auVar204._4_4_;
            auVar83._0_4_ = auVar33._0_4_ * auVar204._0_4_;
            auVar83._8_4_ = auVar33._8_4_ * auVar204._8_4_;
            auVar83._12_4_ = auVar33._12_4_ * auVar204._12_4_;
            auVar83._16_4_ = auVar33._16_4_ * auVar204._16_4_;
            auVar83._20_4_ = auVar33._20_4_ * auVar204._20_4_;
            auVar83._24_4_ = auVar33._24_4_ * auVar204._24_4_;
            auVar83._28_4_ = auVar29._28_4_;
            auVar334 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar32._4_4_ * auVar204._4_4_;
            auVar84._0_4_ = auVar32._0_4_ * auVar204._0_4_;
            auVar84._8_4_ = auVar32._8_4_ * auVar204._8_4_;
            auVar84._12_4_ = auVar32._12_4_ * auVar204._12_4_;
            auVar84._16_4_ = auVar32._16_4_ * auVar204._16_4_;
            auVar84._20_4_ = auVar32._20_4_ * auVar204._20_4_;
            auVar84._24_4_ = auVar32._24_4_ * auVar204._24_4_;
            auVar84._28_4_ = auVar29._28_4_;
            auVar85._4_4_ = auVar228._4_4_ * auVar203._4_4_;
            auVar85._0_4_ = auVar228._0_4_ * auVar203._0_4_;
            auVar85._8_4_ = auVar228._8_4_ * auVar203._8_4_;
            auVar85._12_4_ = auVar228._12_4_ * auVar203._12_4_;
            auVar85._16_4_ = auVar228._16_4_ * auVar203._16_4_;
            auVar85._20_4_ = auVar228._20_4_ * auVar203._20_4_;
            auVar85._24_4_ = auVar228._24_4_ * auVar203._24_4_;
            auVar85._28_4_ = auVar203._28_4_;
            auVar29 = vsubps_avx(auVar85,auVar84);
            auVar170._0_4_ = auVar286._0_4_ * 0.0 + auVar29._0_4_ + auVar334._0_4_ * 0.0;
            auVar170._4_4_ = auVar286._4_4_ * 0.0 + auVar29._4_4_ + auVar334._4_4_ * 0.0;
            auVar170._8_4_ = auVar286._8_4_ * 0.0 + auVar29._8_4_ + auVar334._8_4_ * 0.0;
            auVar170._12_4_ = auVar286._12_4_ * 0.0 + auVar29._12_4_ + auVar334._12_4_ * 0.0;
            auVar170._16_4_ = auVar286._16_4_ * 0.0 + auVar29._16_4_ + auVar334._16_4_ * 0.0;
            auVar170._20_4_ = auVar286._20_4_ * 0.0 + auVar29._20_4_ + auVar334._20_4_ * 0.0;
            auVar170._24_4_ = auVar286._24_4_ * 0.0 + auVar29._24_4_ + auVar334._24_4_ * 0.0;
            auVar170._28_4_ = auVar286._28_4_ + auVar29._28_4_ + auVar334._28_4_;
            auVar20 = vcmpps_avx(auVar170,ZEXT832(0) << 0x20,2);
            auVar172 = vblendvps_avx(auVar172,_local_740,auVar20);
            auVar208 = ZEXT3264(auVar172);
            auVar117._4_4_ = local_800._4_4_ + fVar331;
            auVar117._0_4_ = local_800._0_4_ + fVar255;
            auVar117._8_4_ = local_800._8_4_ + fVar332;
            auVar117._12_4_ = local_800._12_4_ + fVar275;
            auVar117._16_4_ = fStack_810;
            auVar117._20_4_ = fStack_80c;
            auVar117._24_4_ = fStack_808;
            auVar117._28_4_ = fStack_804;
            auVar29 = vblendvps_avx(auVar31,auVar117,auVar20);
            auVar31 = vblendvps_avx(auVar141,auVar363,auVar20);
            auVar141 = vblendvps_avx(auVar228,auVar342,auVar20);
            auVar203 = vblendvps_avx(auVar32,auVar232,auVar20);
            auVar204 = vblendvps_avx(auVar33,auVar303,auVar20);
            auVar228 = vblendvps_avx(auVar342,auVar228,auVar20);
            auVar286 = vblendvps_avx(auVar232,auVar32,auVar20);
            auVar334 = vblendvps_avx(auVar303,auVar33,auVar20);
            local_800 = vandps_avx(auVar30,auVar231);
            auVar228 = vsubps_avx(auVar228,auVar172);
            auVar34 = vsubps_avx(auVar286,auVar29);
            auVar334 = vsubps_avx(auVar334,auVar31);
            auVar35 = vsubps_avx(auVar29,auVar203);
            fVar324 = auVar34._0_4_;
            fVar270 = auVar31._0_4_;
            fVar253 = auVar34._4_4_;
            fVar272 = auVar31._4_4_;
            auVar86._4_4_ = fVar272 * fVar253;
            auVar86._0_4_ = fVar270 * fVar324;
            fVar275 = auVar34._8_4_;
            fVar258 = auVar31._8_4_;
            auVar86._8_4_ = fVar258 * fVar275;
            fVar296 = auVar34._12_4_;
            fVar149 = auVar31._12_4_;
            auVar86._12_4_ = fVar149 * fVar296;
            fVar175 = auVar34._16_4_;
            fVar151 = auVar31._16_4_;
            auVar86._16_4_ = fVar151 * fVar175;
            fVar194 = auVar34._20_4_;
            fVar153 = auVar31._20_4_;
            auVar86._20_4_ = fVar153 * fVar194;
            fVar221 = auVar34._24_4_;
            fVar274 = auVar31._24_4_;
            auVar86._24_4_ = fVar274 * fVar221;
            auVar86._28_4_ = auVar286._28_4_;
            fVar210 = auVar29._0_4_;
            fVar276 = auVar334._0_4_;
            fVar255 = auVar29._4_4_;
            fVar277 = auVar334._4_4_;
            auVar87._4_4_ = fVar277 * fVar255;
            auVar87._0_4_ = fVar276 * fVar210;
            fVar215 = auVar29._8_4_;
            fVar278 = auVar334._8_4_;
            auVar87._8_4_ = fVar278 * fVar215;
            fVar297 = auVar29._12_4_;
            fVar279 = auVar334._12_4_;
            auVar87._12_4_ = fVar279 * fVar297;
            fVar358 = auVar29._16_4_;
            fVar177 = auVar334._16_4_;
            auVar87._16_4_ = fVar177 * fVar358;
            fVar196 = auVar29._20_4_;
            fVar188 = auVar334._20_4_;
            auVar87._20_4_ = fVar188 * fVar196;
            fVar323 = auVar29._24_4_;
            fVar189 = auVar334._24_4_;
            uVar289 = auVar32._28_4_;
            auVar87._24_4_ = fVar189 * fVar323;
            auVar87._28_4_ = uVar289;
            auVar286 = vsubps_avx(auVar87,auVar86);
            fVar328 = auVar172._0_4_;
            fVar346 = auVar172._4_4_;
            auVar88._4_4_ = fVar277 * fVar346;
            auVar88._0_4_ = fVar276 * fVar328;
            fVar320 = auVar172._8_4_;
            auVar88._8_4_ = fVar278 * fVar320;
            fVar220 = auVar172._12_4_;
            auVar88._12_4_ = fVar279 * fVar220;
            fVar359 = auVar172._16_4_;
            auVar88._16_4_ = fVar177 * fVar359;
            fVar240 = auVar172._20_4_;
            auVar88._20_4_ = fVar188 * fVar240;
            fVar327 = auVar172._24_4_;
            auVar88._24_4_ = fVar189 * fVar327;
            auVar88._28_4_ = uVar289;
            fVar216 = auVar228._0_4_;
            fVar331 = auVar228._4_4_;
            auVar89._4_4_ = fVar272 * fVar331;
            auVar89._0_4_ = fVar270 * fVar216;
            fVar294 = auVar228._8_4_;
            auVar89._8_4_ = fVar258 * fVar294;
            fVar322 = auVar228._12_4_;
            auVar89._12_4_ = fVar149 * fVar322;
            fVar360 = auVar228._16_4_;
            auVar89._16_4_ = fVar151 * fVar360;
            fVar212 = auVar228._20_4_;
            auVar89._20_4_ = fVar153 * fVar212;
            fVar329 = auVar228._24_4_;
            auVar89._24_4_ = fVar274 * fVar329;
            auVar89._28_4_ = auVar342._28_4_;
            auVar32 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar255 * fVar331;
            auVar90._0_4_ = fVar210 * fVar216;
            auVar90._8_4_ = fVar215 * fVar294;
            auVar90._12_4_ = fVar297 * fVar322;
            auVar90._16_4_ = fVar358 * fVar360;
            auVar90._20_4_ = fVar196 * fVar212;
            auVar90._24_4_ = fVar323 * fVar329;
            auVar90._28_4_ = uVar289;
            auVar91._4_4_ = fVar346 * fVar253;
            auVar91._0_4_ = fVar328 * fVar324;
            auVar91._8_4_ = fVar320 * fVar275;
            auVar91._12_4_ = fVar220 * fVar296;
            auVar91._16_4_ = fVar359 * fVar175;
            auVar91._20_4_ = fVar240 * fVar194;
            auVar91._24_4_ = fVar327 * fVar221;
            auVar91._28_4_ = auVar33._28_4_;
            auVar33 = vsubps_avx(auVar91,auVar90);
            auVar36 = vsubps_avx(auVar31,auVar204);
            fVar209 = auVar33._28_4_ + auVar32._28_4_;
            auVar313._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar286._0_4_ * 0.0;
            auVar313._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar286._4_4_ * 0.0;
            auVar313._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar286._8_4_ * 0.0;
            auVar313._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar286._12_4_ * 0.0;
            auVar313._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar286._16_4_ * 0.0;
            auVar313._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar286._20_4_ * 0.0;
            auVar313._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar286._24_4_ * 0.0;
            auVar313._28_4_ = fVar209 + auVar286._28_4_;
            fVar195 = auVar35._0_4_;
            fVar213 = auVar35._4_4_;
            auVar92._4_4_ = auVar204._4_4_ * fVar213;
            auVar92._0_4_ = auVar204._0_4_ * fVar195;
            fVar295 = auVar35._8_4_;
            auVar92._8_4_ = auVar204._8_4_ * fVar295;
            fVar298 = auVar35._12_4_;
            auVar92._12_4_ = auVar204._12_4_ * fVar298;
            fVar155 = auVar35._16_4_;
            auVar92._16_4_ = auVar204._16_4_ * fVar155;
            fVar158 = auVar35._20_4_;
            auVar92._20_4_ = auVar204._20_4_ * fVar158;
            fVar330 = auVar35._24_4_;
            auVar92._24_4_ = auVar204._24_4_ * fVar330;
            auVar92._28_4_ = fVar209;
            fVar209 = auVar36._0_4_;
            fVar332 = auVar36._4_4_;
            auVar93._4_4_ = auVar203._4_4_ * fVar332;
            auVar93._0_4_ = auVar203._0_4_ * fVar209;
            fVar218 = auVar36._8_4_;
            auVar93._8_4_ = auVar203._8_4_ * fVar218;
            fVar299 = auVar36._12_4_;
            auVar93._12_4_ = auVar203._12_4_ * fVar299;
            fVar156 = auVar36._16_4_;
            auVar93._16_4_ = auVar203._16_4_ * fVar156;
            fVar217 = auVar36._20_4_;
            auVar93._20_4_ = auVar203._20_4_ * fVar217;
            fVar176 = auVar36._24_4_;
            auVar93._24_4_ = auVar203._24_4_ * fVar176;
            auVar93._28_4_ = auVar33._28_4_;
            auVar32 = vsubps_avx(auVar93,auVar92);
            auVar33 = vsubps_avx(auVar172,auVar141);
            fVar211 = auVar33._0_4_;
            fVar347 = auVar33._4_4_;
            auVar94._4_4_ = auVar204._4_4_ * fVar347;
            auVar94._0_4_ = auVar204._0_4_ * fVar211;
            fVar321 = auVar33._8_4_;
            auVar94._8_4_ = auVar204._8_4_ * fVar321;
            fVar222 = auVar33._12_4_;
            auVar94._12_4_ = auVar204._12_4_ * fVar222;
            fVar157 = auVar33._16_4_;
            auVar94._16_4_ = auVar204._16_4_ * fVar157;
            fVar219 = auVar33._20_4_;
            auVar94._20_4_ = auVar204._20_4_ * fVar219;
            fVar260 = auVar33._24_4_;
            auVar94._24_4_ = auVar204._24_4_ * fVar260;
            auVar94._28_4_ = auVar204._28_4_;
            auVar95._4_4_ = fVar332 * auVar141._4_4_;
            auVar95._0_4_ = fVar209 * auVar141._0_4_;
            auVar95._8_4_ = fVar218 * auVar141._8_4_;
            auVar95._12_4_ = fVar299 * auVar141._12_4_;
            auVar95._16_4_ = fVar156 * auVar141._16_4_;
            auVar95._20_4_ = fVar217 * auVar141._20_4_;
            auVar95._24_4_ = fVar176 * auVar141._24_4_;
            auVar95._28_4_ = auVar286._28_4_;
            auVar204 = vsubps_avx(auVar94,auVar95);
            auVar96._4_4_ = auVar203._4_4_ * fVar347;
            auVar96._0_4_ = auVar203._0_4_ * fVar211;
            auVar96._8_4_ = auVar203._8_4_ * fVar321;
            auVar96._12_4_ = auVar203._12_4_ * fVar222;
            auVar96._16_4_ = auVar203._16_4_ * fVar157;
            auVar96._20_4_ = auVar203._20_4_ * fVar219;
            auVar96._24_4_ = auVar203._24_4_ * fVar260;
            auVar96._28_4_ = auVar203._28_4_;
            auVar97._4_4_ = fVar213 * auVar141._4_4_;
            auVar97._0_4_ = fVar195 * auVar141._0_4_;
            auVar97._8_4_ = fVar295 * auVar141._8_4_;
            auVar97._12_4_ = fVar298 * auVar141._12_4_;
            auVar97._16_4_ = fVar155 * auVar141._16_4_;
            auVar97._20_4_ = fVar158 * auVar141._20_4_;
            auVar97._24_4_ = fVar330 * auVar141._24_4_;
            auVar97._28_4_ = auVar141._28_4_;
            auVar141 = vsubps_avx(auVar97,auVar96);
            auVar147._0_4_ = auVar32._0_4_ * 0.0 + auVar141._0_4_ + auVar204._0_4_ * 0.0;
            auVar147._4_4_ = auVar32._4_4_ * 0.0 + auVar141._4_4_ + auVar204._4_4_ * 0.0;
            auVar147._8_4_ = auVar32._8_4_ * 0.0 + auVar141._8_4_ + auVar204._8_4_ * 0.0;
            auVar147._12_4_ = auVar32._12_4_ * 0.0 + auVar141._12_4_ + auVar204._12_4_ * 0.0;
            auVar147._16_4_ = auVar32._16_4_ * 0.0 + auVar141._16_4_ + auVar204._16_4_ * 0.0;
            auVar147._20_4_ = auVar32._20_4_ * 0.0 + auVar141._20_4_ + auVar204._20_4_ * 0.0;
            auVar147._24_4_ = auVar32._24_4_ * 0.0 + auVar141._24_4_ + auVar204._24_4_ * 0.0;
            auVar147._28_4_ = auVar204._28_4_ + auVar141._28_4_ + auVar204._28_4_;
            auVar148 = ZEXT3264(auVar147);
            auVar141 = vmaxps_avx(auVar313,auVar147);
            auVar141 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
            auVar203 = local_800 & auVar141;
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar203 >> 0x7f,0) == '\0') &&
                  (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar203 >> 0xbf,0) == '\0') &&
                (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar203[0x1f]) {
LAB_0108321a:
              auVar173 = ZEXT3264(CONCAT824(uStack_528,
                                            CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
            }
            else {
              auVar203 = vandps_avx(auVar141,local_800);
              auVar98._4_4_ = fVar332 * fVar253;
              auVar98._0_4_ = fVar209 * fVar324;
              auVar98._8_4_ = fVar218 * fVar275;
              auVar98._12_4_ = fVar299 * fVar296;
              auVar98._16_4_ = fVar156 * fVar175;
              auVar98._20_4_ = fVar217 * fVar194;
              auVar98._24_4_ = fVar176 * fVar221;
              auVar98._28_4_ = local_800._28_4_;
              auVar99._4_4_ = fVar213 * fVar277;
              auVar99._0_4_ = fVar195 * fVar276;
              auVar99._8_4_ = fVar295 * fVar278;
              auVar99._12_4_ = fVar298 * fVar279;
              auVar99._16_4_ = fVar155 * fVar177;
              auVar99._20_4_ = fVar158 * fVar188;
              auVar99._24_4_ = fVar330 * fVar189;
              auVar99._28_4_ = auVar141._28_4_;
              auVar204 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar347 * fVar277;
              auVar100._0_4_ = fVar211 * fVar276;
              auVar100._8_4_ = fVar321 * fVar278;
              auVar100._12_4_ = fVar222 * fVar279;
              auVar100._16_4_ = fVar157 * fVar177;
              auVar100._20_4_ = fVar219 * fVar188;
              auVar100._24_4_ = fVar260 * fVar189;
              auVar100._28_4_ = auVar334._28_4_;
              auVar101._4_4_ = fVar332 * fVar331;
              auVar101._0_4_ = fVar209 * fVar216;
              auVar101._8_4_ = fVar218 * fVar294;
              auVar101._12_4_ = fVar299 * fVar322;
              auVar101._16_4_ = fVar156 * fVar360;
              auVar101._20_4_ = fVar217 * fVar212;
              auVar101._24_4_ = fVar176 * fVar329;
              auVar101._28_4_ = auVar36._28_4_;
              auVar286 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar213 * fVar331;
              auVar102._0_4_ = fVar195 * fVar216;
              auVar102._8_4_ = fVar295 * fVar294;
              auVar102._12_4_ = fVar298 * fVar322;
              auVar102._16_4_ = fVar155 * fVar360;
              auVar102._20_4_ = fVar158 * fVar212;
              auVar102._24_4_ = fVar330 * fVar329;
              auVar102._28_4_ = auVar228._28_4_;
              auVar103._4_4_ = fVar347 * fVar253;
              auVar103._0_4_ = fVar211 * fVar324;
              auVar103._8_4_ = fVar321 * fVar275;
              auVar103._12_4_ = fVar222 * fVar296;
              auVar103._16_4_ = fVar157 * fVar175;
              auVar103._20_4_ = fVar219 * fVar194;
              auVar103._24_4_ = fVar260 * fVar221;
              auVar103._28_4_ = auVar34._28_4_;
              auVar334 = vsubps_avx(auVar103,auVar102);
              auVar171._0_4_ = auVar204._0_4_ * 0.0 + auVar334._0_4_ + auVar286._0_4_ * 0.0;
              auVar171._4_4_ = auVar204._4_4_ * 0.0 + auVar334._4_4_ + auVar286._4_4_ * 0.0;
              auVar171._8_4_ = auVar204._8_4_ * 0.0 + auVar334._8_4_ + auVar286._8_4_ * 0.0;
              auVar171._12_4_ = auVar204._12_4_ * 0.0 + auVar334._12_4_ + auVar286._12_4_ * 0.0;
              auVar171._16_4_ = auVar204._16_4_ * 0.0 + auVar334._16_4_ + auVar286._16_4_ * 0.0;
              auVar171._20_4_ = auVar204._20_4_ * 0.0 + auVar334._20_4_ + auVar286._20_4_ * 0.0;
              auVar171._24_4_ = auVar204._24_4_ * 0.0 + auVar334._24_4_ + auVar286._24_4_ * 0.0;
              auVar171._28_4_ = auVar34._28_4_ + auVar334._28_4_ + auVar228._28_4_;
              auVar141 = vrcpps_avx(auVar171);
              fVar324 = auVar141._0_4_;
              fVar216 = auVar141._4_4_;
              auVar104._4_4_ = auVar171._4_4_ * fVar216;
              auVar104._0_4_ = auVar171._0_4_ * fVar324;
              fVar195 = auVar141._8_4_;
              auVar104._8_4_ = auVar171._8_4_ * fVar195;
              fVar209 = auVar141._12_4_;
              auVar104._12_4_ = auVar171._12_4_ * fVar209;
              fVar211 = auVar141._16_4_;
              auVar104._16_4_ = auVar171._16_4_ * fVar211;
              fVar253 = auVar141._20_4_;
              auVar104._20_4_ = auVar171._20_4_ * fVar253;
              fVar331 = auVar141._24_4_;
              auVar104._24_4_ = auVar171._24_4_ * fVar331;
              auVar104._28_4_ = auVar36._28_4_;
              auVar338._8_4_ = 0x3f800000;
              auVar338._0_8_ = &DAT_3f8000003f800000;
              auVar338._12_4_ = 0x3f800000;
              auVar338._16_4_ = 0x3f800000;
              auVar338._20_4_ = 0x3f800000;
              auVar338._24_4_ = 0x3f800000;
              auVar338._28_4_ = 0x3f800000;
              auVar141 = vsubps_avx(auVar338,auVar104);
              fVar324 = auVar141._0_4_ * fVar324 + fVar324;
              fVar216 = auVar141._4_4_ * fVar216 + fVar216;
              fVar195 = auVar141._8_4_ * fVar195 + fVar195;
              fVar209 = auVar141._12_4_ * fVar209 + fVar209;
              fVar211 = auVar141._16_4_ * fVar211 + fVar211;
              fVar253 = auVar141._20_4_ * fVar253 + fVar253;
              fVar331 = auVar141._24_4_ * fVar331 + fVar331;
              auVar105._4_4_ =
                   (fVar346 * auVar204._4_4_ + auVar286._4_4_ * fVar255 + auVar334._4_4_ * fVar272)
                   * fVar216;
              auVar105._0_4_ =
                   (fVar328 * auVar204._0_4_ + auVar286._0_4_ * fVar210 + auVar334._0_4_ * fVar270)
                   * fVar324;
              auVar105._8_4_ =
                   (fVar320 * auVar204._8_4_ + auVar286._8_4_ * fVar215 + auVar334._8_4_ * fVar258)
                   * fVar195;
              auVar105._12_4_ =
                   (fVar220 * auVar204._12_4_ +
                   auVar286._12_4_ * fVar297 + auVar334._12_4_ * fVar149) * fVar209;
              auVar105._16_4_ =
                   (fVar359 * auVar204._16_4_ +
                   auVar286._16_4_ * fVar358 + auVar334._16_4_ * fVar151) * fVar211;
              auVar105._20_4_ =
                   (fVar240 * auVar204._20_4_ +
                   auVar286._20_4_ * fVar196 + auVar334._20_4_ * fVar153) * fVar253;
              auVar105._24_4_ =
                   (fVar327 * auVar204._24_4_ +
                   auVar286._24_4_ * fVar323 + auVar334._24_4_ * fVar274) * fVar331;
              auVar105._28_4_ = auVar172._28_4_ + auVar29._28_4_ + auVar31._28_4_;
              auVar208 = ZEXT3264(auVar105);
              uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar233._4_4_ = uVar289;
              auVar233._0_4_ = uVar289;
              auVar233._8_4_ = uVar289;
              auVar233._12_4_ = uVar289;
              auVar233._16_4_ = uVar289;
              auVar233._20_4_ = uVar289;
              auVar233._24_4_ = uVar289;
              auVar233._28_4_ = uVar289;
              auVar172 = vcmpps_avx(local_340,auVar105,2);
              auVar29 = vcmpps_avx(auVar105,auVar233,2);
              auVar172 = vandps_avx(auVar172,auVar29);
              auVar29 = auVar203 & auVar172;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar29 >> 0x7f,0) == '\0') &&
                    (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0xbf,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar29[0x1f]) goto LAB_0108321a;
              auVar172 = vandps_avx(auVar203,auVar172);
              auVar29 = vcmpps_avx(ZEXT432(0) << 0x20,auVar171,4);
              auVar31 = auVar172 & auVar29;
              auVar173 = ZEXT3264(CONCAT824(uStack_528,
                                            CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar172 = vandps_avx(auVar29,auVar172);
                auVar173 = ZEXT3264(auVar172);
                auVar106._4_4_ = auVar313._4_4_ * fVar216;
                auVar106._0_4_ = auVar313._0_4_ * fVar324;
                auVar106._8_4_ = auVar313._8_4_ * fVar195;
                auVar106._12_4_ = auVar313._12_4_ * fVar209;
                auVar106._16_4_ = auVar313._16_4_ * fVar211;
                auVar106._20_4_ = auVar313._20_4_ * fVar253;
                auVar106._24_4_ = auVar313._24_4_ * fVar331;
                auVar106._28_4_ = local_4a0._28_4_;
                auVar107._4_4_ = auVar147._4_4_ * fVar216;
                auVar107._0_4_ = auVar147._0_4_ * fVar324;
                auVar107._8_4_ = auVar147._8_4_ * fVar195;
                auVar107._12_4_ = auVar147._12_4_ * fVar209;
                auVar107._16_4_ = auVar147._16_4_ * fVar211;
                auVar107._20_4_ = auVar147._20_4_ * fVar253;
                auVar107._24_4_ = auVar147._24_4_ * fVar331;
                auVar107._28_4_ = auVar147._28_4_;
                auVar268._8_4_ = 0x3f800000;
                auVar268._0_8_ = &DAT_3f8000003f800000;
                auVar268._12_4_ = 0x3f800000;
                auVar268._16_4_ = 0x3f800000;
                auVar268._20_4_ = 0x3f800000;
                auVar268._24_4_ = 0x3f800000;
                auVar268._28_4_ = 0x3f800000;
                auVar172 = vsubps_avx(auVar268,auVar106);
                local_480 = vblendvps_avx(auVar172,auVar106,auVar20);
                auVar172 = vsubps_avx(auVar268,auVar107);
                _local_380 = vblendvps_avx(auVar172,auVar107,auVar20);
                auVar148 = ZEXT3264(_local_380);
                local_4a0 = auVar105;
              }
            }
            auVar172 = auVar173._0_32_;
            auVar351 = ZEXT3264(_local_660);
            fVar323 = (float)local_700._0_4_;
            fVar327 = (float)local_700._4_4_;
            fVar329 = fStack_6f8;
            fVar330 = fStack_6f4;
            fVar324 = fStack_6f0;
            fVar210 = fStack_6ec;
            fVar328 = fStack_6e8;
            fVar216 = fStack_6e4;
            _local_7e0 = auVar288;
            local_460 = auVar248;
            if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar172 >> 0x7f,0) != '\0') ||
                  (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar172 >> 0xbf,0) != '\0') ||
                (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar173[0x1f] < '\0') {
              auVar29 = vsubps_avx(auVar288,_local_860);
              local_860._0_4_ = (float)local_860._0_4_ + local_480._0_4_ * auVar29._0_4_;
              local_860._4_4_ = (float)local_860._4_4_ + local_480._4_4_ * auVar29._4_4_;
              fStack_858 = fStack_858 + local_480._8_4_ * auVar29._8_4_;
              fStack_854 = fStack_854 + local_480._12_4_ * auVar29._12_4_;
              fStack_850 = fStack_850 + local_480._16_4_ * auVar29._16_4_;
              fStack_84c = fStack_84c + local_480._20_4_ * auVar29._20_4_;
              fStack_848 = fStack_848 + local_480._24_4_ * auVar29._24_4_;
              fStack_844 = fStack_844 + auVar29._28_4_;
              fVar195 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
              auVar108._4_4_ = ((float)local_860._4_4_ + (float)local_860._4_4_) * fVar195;
              auVar108._0_4_ = ((float)local_860._0_4_ + (float)local_860._0_4_) * fVar195;
              auVar108._8_4_ = (fStack_858 + fStack_858) * fVar195;
              auVar108._12_4_ = (fStack_854 + fStack_854) * fVar195;
              auVar108._16_4_ = (fStack_850 + fStack_850) * fVar195;
              auVar108._20_4_ = (fStack_84c + fStack_84c) * fVar195;
              auVar108._24_4_ = (fStack_848 + fStack_848) * fVar195;
              auVar108._28_4_ = fStack_844 + fStack_844;
              auVar29 = vcmpps_avx(local_4a0,auVar108,6);
              auVar148 = ZEXT3264(auVar29);
              auVar248 = auVar172 & auVar29;
              if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar248 >> 0x7f,0) != '\0') ||
                    (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar248 >> 0xbf,0) != '\0') ||
                  (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar248[0x1f] < '\0') {
                local_1e0 = vandps_avx(auVar29,auVar172);
                auVar148 = ZEXT3264(local_1e0);
                auVar163._0_8_ =
                     CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                              (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
                auVar163._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
                auVar163._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
                auVar166._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
                auVar166._0_16_ = auVar163;
                auVar166._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
                fStack_268 = (float)uStack_368 + (float)uStack_368 + -1.0;
                _local_280 = auVar166;
                fStack_264 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
                auVar173 = ZEXT3264(_local_280);
                local_230 = local_6b0;
                uStack_228 = uStack_6a8;
                local_220 = local_4b0._0_8_;
                uStack_218 = local_4b0._8_8_;
                local_210 = local_4c0._0_8_;
                uStack_208 = local_4c0._8_8_;
                local_200 = local_4d0._0_8_;
                uStack_1f8 = local_4d0._8_8_;
                local_7c0._0_8_ = (context->scene->geometries).items[local_828].ptr;
                _local_380 = _local_280;
                if ((((Geometry *)local_7c0._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar127 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar127 = context->args;
                  if ((pRVar127->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar127 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar127 >> 8),1),
                     ((Geometry *)local_7c0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_7c0._8_24_ = auVar267._8_24_;
                    auVar181 = vshufps_avx(ZEXT416((uint)(float)(int)local_240),
                                           ZEXT416((uint)(float)(int)local_240),0);
                    local_1c0[0] = (auVar181._0_4_ + local_480._0_4_ + 0.0) * (float)local_e0._0_4_;
                    local_1c0[1] = (auVar181._4_4_ + local_480._4_4_ + 1.0) * (float)local_e0._4_4_;
                    local_1c0[2] = (auVar181._8_4_ + local_480._8_4_ + 2.0) * fStack_d8;
                    local_1c0[3] = (auVar181._12_4_ + local_480._12_4_ + 3.0) * fStack_d4;
                    fStack_1b0 = (auVar181._0_4_ + local_480._16_4_ + 4.0) * fStack_d0;
                    fStack_1ac = (auVar181._4_4_ + local_480._20_4_ + 5.0) * fStack_cc;
                    fStack_1a8 = (auVar181._8_4_ + local_480._24_4_ + 6.0) * fStack_c8;
                    fStack_1a4 = auVar181._12_4_ + (float)local_480._28_4_ + 7.0;
                    uStack_378 = auVar163._8_8_;
                    uStack_370 = auVar166._16_8_;
                    uStack_368 = local_280._24_8_;
                    local_1a0 = auVar163._0_8_;
                    uStack_198 = uStack_378;
                    uStack_190 = uStack_370;
                    uStack_188 = uStack_368;
                    auVar173 = ZEXT3264(local_4a0);
                    local_180 = local_4a0;
                    iVar126 = vmovmskps_avx(local_1e0);
                    uVar128 = CONCAT44((int)((ulong)pRVar127 >> 0x20),iVar126);
                    local_7e0 = (undefined1  [8])0x0;
                    if (uVar128 != 0) {
                      for (; (uVar128 >> (long)local_7e0 & 1) == 0;
                          local_7e0 = (undefined1  [8])((long)local_7e0 + 1)) {
                      }
                    }
                    _auStack_7d8 = auVar288._8_24_;
                    local_800._0_8_ = uVar128;
                    local_720._4_28_ = auVar249._4_28_;
                    local_720._0_4_ = (int)CONCAT71((int7)(uVar128 >> 8),iVar126 != 0);
                    if (iVar126 != 0) {
                      _local_740 = local_4b0;
                      auStack_5b0 = auVar30._16_16_;
                      _local_5c0 = local_4c0;
                      _auStack_630 = auVar200;
                      _local_640 = local_4d0;
                      local_820 = (float)*local_6a0;
                      fStack_81c = (float)((ulong)*local_6a0 >> 0x20);
                      fStack_818 = (float)local_6a0[1];
                      fStack_814 = (float)((ulong)local_6a0[1] >> 0x20);
                      local_2a0 = local_480;
                      local_260 = local_4a0;
                      local_23c = uVar14;
                      do {
                        local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_3e0 = local_1c0[(long)local_7e0];
                        local_3d0 = *(undefined4 *)((long)&local_1a0 + (long)local_7e0 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + (long)local_7e0 * 4);
                        fVar210 = 1.0 - local_3e0;
                        fVar324 = local_3e0 * 3.0;
                        auVar181 = ZEXT416((uint)((fVar210 * -2.0 * local_3e0 +
                                                  local_3e0 * local_3e0) * 0.5));
                        auVar181 = vshufps_avx(auVar181,auVar181,0);
                        auVar200 = ZEXT416((uint)(((fVar210 + fVar210) * (fVar324 + 2.0) +
                                                  fVar210 * fVar210 * -3.0) * 0.5));
                        auVar200 = vshufps_avx(auVar200,auVar200,0);
                        auVar201 = ZEXT416((uint)(((local_3e0 + local_3e0) * (fVar324 + -5.0) +
                                                  local_3e0 * fVar324) * 0.5));
                        auVar201 = vshufps_avx(auVar201,auVar201,0);
                        local_690.context = context->user;
                        auVar202 = ZEXT416((uint)((local_3e0 * (fVar210 + fVar210) -
                                                  fVar210 * fVar210) * 0.5));
                        auVar202 = vshufps_avx(auVar202,auVar202,0);
                        auVar182._0_4_ =
                             auVar202._0_4_ * (float)local_6b0._0_4_ +
                             auVar201._0_4_ * (float)local_740._0_4_ +
                             auVar181._0_4_ * (float)local_640._0_4_ +
                             auVar200._0_4_ * (float)local_5c0._0_4_;
                        auVar182._4_4_ =
                             auVar202._4_4_ * (float)local_6b0._4_4_ +
                             auVar201._4_4_ * (float)local_740._4_4_ +
                             auVar181._4_4_ * (float)local_640._4_4_ +
                             auVar200._4_4_ * (float)local_5c0._4_4_;
                        auVar182._8_4_ =
                             auVar202._8_4_ * (float)uStack_6a8 +
                             auVar201._8_4_ * (float)uStack_738 +
                             auVar181._8_4_ * (float)uStack_638 + auVar200._8_4_ * (float)uStack_5b8
                        ;
                        auVar182._12_4_ =
                             auVar202._12_4_ * uStack_6a8._4_4_ +
                             auVar201._12_4_ * uStack_738._4_4_ +
                             auVar181._12_4_ * uStack_638._4_4_ + auVar200._12_4_ * uStack_5b8._4_4_
                        ;
                        local_410 = (RTCHitN  [16])vshufps_avx(auVar182,auVar182,0);
                        local_400 = vshufps_avx(auVar182,auVar182,0x55);
                        auVar208 = ZEXT1664(local_400);
                        local_3f0 = vshufps_avx(auVar182,auVar182,0xaa);
                        local_3c0 = local_5d0._0_8_;
                        uStack_3b8 = local_5d0._8_8_;
                        local_3b0 = local_2c0._0_8_;
                        uStack_3a8 = local_2c0._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_39c = (local_690.context)->instID[0];
                        local_3a0 = uStack_39c;
                        uStack_398 = uStack_39c;
                        uStack_394 = uStack_39c;
                        uStack_390 = (local_690.context)->instPrimID[0];
                        uStack_38c = uStack_390;
                        uStack_388 = uStack_390;
                        uStack_384 = uStack_390;
                        local_840 = CONCAT44(fStack_81c,local_820);
                        uStack_838 = CONCAT44(fStack_814,fStack_818);
                        local_690.valid = (int *)&local_840;
                        local_690.geometryUserPtr = *(void **)(local_7c0._0_8_ + 0x18);
                        local_690.hit = local_410;
                        local_690.N = 4;
                        local_690.ray = (RTCRayN *)ray;
                        fStack_3dc = local_3e0;
                        fStack_3d8 = local_3e0;
                        fStack_3d4 = local_3e0;
                        uStack_3cc = local_3d0;
                        uStack_3c8 = local_3d0;
                        uStack_3c4 = local_3d0;
                        if (*(code **)(local_7c0._0_8_ + 0x48) != (code *)0x0) {
                          auVar208 = ZEXT1664(local_400);
                          (**(code **)(local_7c0._0_8_ + 0x48))(&local_690);
                        }
                        auVar112._8_8_ = uStack_838;
                        auVar112._0_8_ = local_840;
                        if (auVar112 == (undefined1  [16])0x0) {
                          auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar181 = auVar181 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_7c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar208 = ZEXT1664(auVar208._0_16_);
                            (*p_Var18)(&local_690);
                          }
                          auVar113._8_8_ = uStack_838;
                          auVar113._0_8_ = local_840;
                          auVar200 = vpcmpeqd_avx((undefined1  [16])0x0,auVar113);
                          auVar181 = auVar200 ^ _DAT_01febe20;
                          auVar183._8_4_ = 0xff800000;
                          auVar183._0_8_ = 0xff800000ff800000;
                          auVar183._12_4_ = 0xff800000;
                          auVar200 = vblendvps_avx(auVar183,*(undefined1 (*) [16])
                                                             (local_690.ray + 0x80),auVar200);
                          *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar200;
                        }
                        auVar148 = ZEXT1664(auVar181);
                        auVar164._8_8_ = 0x100000001;
                        auVar164._0_8_ = 0x100000001;
                        auVar173 = ZEXT1664(auVar164);
                        if ((auVar164 & auVar181) != (undefined1  [16])0x0) break;
                        auVar148 = ZEXT464((uint)local_7a0._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                        uVar128 = local_800._0_8_ ^ 1L << ((ulong)local_7e0 & 0x3f);
                        lVar17 = 0;
                        if (uVar128 != 0) {
                          for (; (uVar128 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                          }
                        }
                        local_7e0 = (undefined1  [8])lVar17;
                        local_800._0_8_ = uVar128;
                        local_720._0_4_ = (int)CONCAT71((int7)(uVar128 >> 8),uVar128 != 0);
                      } while (uVar128 != 0);
                    }
                    pRVar127 = (RTCIntersectArguments *)(ulong)(local_720[0] & 1);
                    auVar351 = ZEXT3264(_local_660);
                    fVar214 = (float)local_620._0_4_;
                    fVar223 = (float)local_620._4_4_;
                    fVar234 = fStack_618;
                    fVar236 = fStack_614;
                    fVar238 = fStack_610;
                    fVar241 = fStack_60c;
                    fVar251 = fStack_608;
                    fVar323 = (float)local_700._0_4_;
                    fVar327 = (float)local_700._4_4_;
                    fVar329 = fStack_6f8;
                    fVar330 = fStack_6f4;
                    fVar324 = fStack_6f0;
                    fVar210 = fStack_6ec;
                    fVar328 = fStack_6e8;
                    fVar216 = fStack_6e4;
                  }
                }
                bVar131 = (bool)(bVar131 | (byte)pRVar127);
              }
            }
          }
          lVar134 = lVar134 + 8;
          fVar176 = (float)local_6e0._0_4_;
          fVar260 = (float)local_6e0._4_4_;
          fVar270 = fStack_6d8;
          fVar272 = fStack_6d4;
          fVar195 = fStack_6d0;
          fVar209 = fStack_6cc;
          fVar211 = fStack_6c8;
        } while ((int)lVar134 < (int)uVar14);
      }
      if (bVar131 != false) {
        return local_86d;
      }
      uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = uVar289;
      auVar139._0_4_ = uVar289;
      auVar139._8_4_ = uVar289;
      auVar139._12_4_ = uVar289;
      auVar181 = vcmpps_avx(local_2b0,auVar139,2);
      uVar129 = vmovmskps_avx(auVar181);
      uVar125 = uVar125 & uVar125 + 0xf & uVar129;
      local_86d = uVar125 != 0;
    } while (local_86d);
  }
  return local_86d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }